

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O1

void __thiscall
Tagliatelle<TTA>::PerformLabelingMem
          (Tagliatelle<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  char cVar1;
  int iVar2;
  Mat1b *pMVar3;
  pointer puVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  char cVar14;
  undefined4 uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long *plVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  char cVar23;
  long *plVar24;
  pointer piVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long *plVar31;
  long lVar32;
  long lVar33;
  long *plVar34;
  long *plVar35;
  int *piVar36;
  long lVar37;
  double dVar38;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_340 [80];
  long *local_2f0;
  Mat local_2d8 [16];
  long *local_2c8;
  long *local_290;
  pointer local_278;
  long *local_270;
  ulong local_268;
  long local_260;
  undefined1 local_258 [104];
  Mat local_1f0 [16];
  long local_1e0;
  long *local_1a8;
  long *local_190;
  long *local_188;
  long *local_180;
  long *local_178;
  long *local_170;
  long *local_168;
  long *local_160;
  long local_158;
  long *local_150;
  ulong local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar7 = *(int *)&pMVar3->field_0x8;
  local_268 = (ulong)iVar7;
  iVar2 = *(int *)&pMVar3->field_0xc;
  lVar21 = (long)iVar2;
  TTA::MemAlloc(((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) * ((iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1)
                + 1);
  *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  TTA::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_258,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar30 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar30 << 0x20 | uVar30 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_340,&local_110,0);
  local_180 = (long *)(lVar21 + -2);
  local_118 = accesses;
  if ((int)local_268 != 1) {
    if (iVar2 < 3) {
      uVar6 = 0;
      lVar32 = 1;
    }
    else {
      lVar32 = (long)(int)local_180;
      iVar7 = -2;
      uVar30 = 0;
      do {
        lVar33 = (long)(int)uVar30;
        piVar36 = (int *)(local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        lVar28 = (long)iVar7;
        if (*(char *)(local_258._24_8_ + lVar33) != '\0') {
          piVar36 = (int *)(local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(local_258._24_8_ + 3 + lVar28);
LAB_002e99b6:
          uVar6 = TTA::MemNewLabel();
          if (cVar23 == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar33 * 4) = uVar6;
            goto LAB_002e9bbd;
          }
LAB_002e99bf:
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar33 * 4) = uVar6;
LAB_002e9a0a:
          iVar7 = (int)uVar30;
          iVar9 = iVar7 + 2;
          if (iVar9 < (int)local_180) {
            lVar37 = (long)iVar7;
            lVar33 = lVar37 + 2;
            lVar26 = lVar37 << 0x20;
            lVar28 = lVar37 * 4;
            lVar29 = 0;
            do {
              lVar18 = local_1e0 + lVar28;
              piVar36 = (int *)(lVar18 + 8 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              lVar27 = local_258._24_8_ + lVar33;
              lVar22 = lVar26 >> 0x1e;
              if (*(char *)(lVar29 + lVar27) == '\0') {
                lVar11 = *local_1a8;
                piVar36 = (int *)(lVar11 + 8 + lVar18 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                lVar10 = local_258._24_8_ + *(long *)local_258._80_8_ + lVar33;
                cVar23 = *(char *)(lVar29 + lVar10);
                piVar36 = (int *)(lVar18 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                cVar14 = *(char *)(lVar29 + 1 + lVar27);
                if (cVar23 == '\0') {
                  if ((cVar14 == '\0') &&
                     (piVar36 = (int *)(local_1e0 + lVar11 + lVar28 + 0xc + lVar29 * 4),
                     *piVar36 = *piVar36 + 1, *(char *)(lVar29 + 1 + lVar10) == '\0')) {
                    lVar33 = lVar33 + lVar29;
                    iVar7 = (int)lVar33;
                    goto LAB_002e9e85;
                  }
                  uVar6 = TTA::MemNewLabel();
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 + 8);
                  *piVar36 = *piVar36 + 1;
                }
                else {
                  if (cVar14 == '\0') {
                    *(int *)((long)local_2c8 + lVar22) = *(int *)((long)local_2c8 + lVar22) + 1;
                    uVar15 = *(undefined4 *)(local_340._24_8_ + lVar22);
                    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar37 * 4 + 8);
                    *piVar36 = *piVar36 + 1;
                    *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar37 * 4 + 8) = uVar15;
                    uVar30 = (ulong)(uint)((int)lVar33 + (int)lVar29);
                    goto LAB_002e9bbd;
                  }
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28);
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 + 8);
                  *piVar36 = *piVar36 + 1;
                }
              }
              else {
                piVar36 = (int *)(lVar18 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 1 + lVar27) == '\0') goto LAB_002e9b58;
                piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28);
                piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 + 8);
                *piVar36 = *piVar36 + 1;
              }
              *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 + 8) = uVar6;
              lVar26 = lVar26 + 0x200000000;
              lVar18 = lVar33 + lVar29;
              lVar29 = lVar29 + 2;
              if ((long)local_180 <= lVar18 + 2) {
                iVar9 = iVar7 + (int)lVar29 + 2;
                iVar7 = iVar7 + (int)lVar29;
                break;
              }
            } while( true );
          }
          lVar32 = (long)iVar9;
          piVar36 = (int *)(local_1e0 + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          uVar30 = local_268;
          if ((int)local_180 < iVar9) {
            if ((*(char *)(local_258._24_8_ + lVar32) == '\0') &&
               (piVar36 = (int *)(local_1e0 + *local_1a8 + lVar32 * 4), *piVar36 = *piVar36 + 1,
               *(char *)(lVar32 + local_258._24_8_ + *(long *)local_258._80_8_) == '\0'))
            goto LAB_002ea37e;
          }
          else {
            if (*(char *)(local_258._24_8_ + lVar32) == '\0') {
              lVar33 = *local_1a8;
              piVar36 = (int *)(lVar33 + local_1e0 + lVar32 * 4);
              *piVar36 = *piVar36 + 1;
              lVar28 = *(long *)local_258._80_8_;
              cVar23 = *(char *)(lVar32 + lVar28 + local_258._24_8_);
              lVar29 = (long)iVar7;
              piVar36 = (int *)(local_1e0 + 0xc + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (cVar23 == '\0') {
                if ((*(char *)(local_258._24_8_ + 3 + lVar29) == '\0') &&
                   (piVar36 = (int *)(lVar33 + local_1e0 + 0xc + lVar29 * 4),
                   *piVar36 = *piVar36 + 1,
                   *(char *)(lVar28 + local_258._24_8_ + 3 + lVar29) == '\0')) {
                  piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = 0;
                }
                else {
                  uVar6 = TTA::MemNewLabel();
                  piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
                  *piVar36 = *piVar36 + 1;
                  *(uint *)(local_340._24_8_ + lVar32 * 4) = uVar6;
                  uVar30 = local_268;
                }
              }
              else {
                piVar36 = (int *)((long)local_2c8 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                uVar15 = *(undefined4 *)(local_340._24_8_ + lVar29 * 4);
                piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = uVar15;
              }
              goto LAB_002ea395;
            }
            piVar36 = (int *)(local_1e0 + 0xc + (long)iVar7 * 4);
            *piVar36 = *piVar36 + 1;
          }
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4);
          piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = uVar15;
          goto LAB_002ea395;
        }
        lVar29 = *local_1a8;
        piVar36 = (int *)(lVar29 + local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        lVar26 = *(long *)local_258._80_8_;
        cVar14 = *(char *)(lVar33 + lVar26 + local_258._24_8_);
        piVar36 = (int *)(local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(local_258._24_8_ + 3 + lVar28);
        if (cVar14 != '\0') goto LAB_002e99b6;
        if ((cVar23 != '\0') ||
           (piVar36 = (int *)(lVar29 + local_1e0 + 0xc + lVar28 * 4), *piVar36 = *piVar36 + 1,
           iVar7 = (int)uVar30, *(char *)(lVar26 + local_258._24_8_ + 3 + lVar28) != '\0')) {
          uVar6 = TTA::MemNewLabel();
          goto LAB_002e99bf;
        }
LAB_002e9e85:
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar33 * 4) = 0;
        uVar6 = iVar7 + 2;
        uVar30 = (ulong)uVar6;
      } while ((int)uVar6 < (int)local_180);
      lVar32 = (long)(iVar7 + 3);
    }
    if ((int)local_180 < (int)uVar6) {
      lVar32 = (long)(int)uVar6;
      piVar36 = (int *)(local_1e0 + lVar32 * 4);
      *piVar36 = *piVar36 + 1;
      if ((*(char *)(local_258._24_8_ + lVar32) != '\0') ||
         (piVar36 = (int *)(local_1e0 + *local_1a8 + lVar32 * 4), *piVar36 = *piVar36 + 1,
         *(char *)(lVar32 + local_258._24_8_ + *(long *)local_258._80_8_) != '\0'))
      goto LAB_002ea236;
LAB_002e9f66:
      lVar32 = (long)(int)uVar6;
LAB_002ea37e:
      piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = 0;
      uVar30 = local_268;
    }
    else {
      lVar33 = (long)(int)uVar6;
      piVar36 = (int *)(local_1e0 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(local_258._24_8_ + lVar33) == '\0') {
        piVar36 = (int *)(local_1e0 + *local_1a8 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar33 + local_258._24_8_ + *(long *)local_258._80_8_);
        piVar36 = (int *)(local_1e0 + lVar32 * 4);
        *piVar36 = *piVar36 + 1;
        if (((cVar23 == '\0') && (*(char *)(local_258._24_8_ + lVar32) == '\0')) &&
           (piVar36 = (int *)(local_1e0 + *local_1a8 + lVar32 * 4), *piVar36 = *piVar36 + 1,
           *(char *)(lVar32 + local_258._24_8_ + *(long *)local_258._80_8_) == '\0'))
        goto LAB_002e9f66;
      }
      else {
        piVar36 = (int *)(local_1e0 + lVar32 * 4);
        *piVar36 = *piVar36 + 1;
      }
LAB_002ea236:
      uVar8 = TTA::MemNewLabel();
      piVar36 = (int *)((long)local_2c8 + (long)(int)uVar6 * 4);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)(int)uVar6 * 4) = uVar8;
      uVar30 = local_268;
    }
LAB_002ea395:
    if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
      local_190 = (long *)(long)(int)local_180;
      uVar20 = 2;
      plVar34 = (long *)0x3;
      piVar25 = (pointer)0x1;
      lVar32 = 0;
      do {
        local_278 = piVar25;
        if (2 < iVar2) {
          piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20);
          *piVar36 = *piVar36 + 1;
          lVar33 = lVar32;
          local_270 = plVar34;
          local_260 = lVar32;
          if (*(char *)(local_258._24_8_ + *(long *)local_258._80_8_ * uVar20) == '\0') {
            uVar13 = uVar20 | 1;
            piVar36 = (int *)(local_1e0 + *local_1a8 * uVar13);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(local_258._24_8_ + *(long *)local_258._80_8_ * uVar13);
            piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * uVar20);
            *piVar36 = *piVar36 + 1;
            cVar14 = *(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * uVar20);
            if (cVar23 == '\0') {
              if (cVar14 == '\0') {
                piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * uVar13);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(local_258._24_8_ + 1 + uVar13 * *(long *)local_258._80_8_) == '\0') {
                  plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
                  *(int *)plVar12 = (int)*plVar12 + 1;
                  plVar31 = (long *)(*local_2f0 * uVar20 + local_340._24_8_);
                  plVar12 = (long *)0x0;
                  plVar35 = plVar34;
                  goto LAB_002ef206;
                }
                uVar6 = TTA::MemNewLabel();
                plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
                *(int *)plVar12 = (int)*plVar12 + 1;
                *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
                plVar12 = (long *)0x0;
                goto LAB_002f0539;
              }
            }
            else if (cVar14 == '\0') {
              uVar6 = TTA::MemNewLabel();
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
              plVar12 = (long *)0x0;
              piVar25 = local_278;
              goto LAB_002f37bd;
            }
            lVar28 = uVar20 - 1;
            piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * lVar28);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * lVar28) != '\0') {
              plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
              *(int *)plVar12 = (int)*plVar12 + 1;
              lVar33 = *(long *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(int *)(local_340._24_8_ + *local_2f0 * uVar20) = (int)lVar33;
              plVar12 = (long *)0x0;
              goto LAB_002eaece;
            }
            piVar36 = (int *)(local_1e0 + 8 + *local_1a8 * lVar28);
            *piVar36 = *piVar36 + 1;
LAB_002eb39b:
            lVar28 = uVar20 - 1;
            cVar23 = *(char *)(local_258._24_8_ + 2 + *(long *)local_258._80_8_ * lVar28);
            piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28);
            *piVar36 = *piVar36 + 1;
            cVar14 = *(char *)(local_258._24_8_ + lVar28 * *(long *)local_258._80_8_);
            if (cVar23 != '\0') {
              lVar32 = uVar20 - 2;
              if (cVar14 == '\0') {
                piVar36 = (int *)((long)local_2c8 + *local_290 * lVar32 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar32 * *local_2f0 + 8);
              }
              else {
                piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * lVar32);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * lVar32) == '\0') {
                  plVar12 = (long *)((long)local_2c8 + *local_290 * lVar32);
                  *(int *)plVar12 = (int)*plVar12 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + *local_2f0 * lVar32);
                  piVar36 = (int *)((long)local_2c8 + *local_290 * lVar32 + 8);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar32 * *local_2f0 + 8))
                  ;
                }
                else {
                  plVar12 = (long *)((long)local_2c8 + *local_290 * lVar32);
                  *(int *)plVar12 = (int)*plVar12 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar32 * *local_2f0);
                }
              }
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
              plVar12 = (long *)0x0;
              goto LAB_002eb76f;
            }
            if (cVar14 == '\0') {
              uVar6 = TTA::MemNewLabel();
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
              plVar12 = (long *)0x0;
              goto LAB_002f1a41;
            }
            plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
            *(int *)plVar12 = (int)*plVar12 + 1;
            lVar33 = *(long *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
            plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
            *(int *)plVar12 = (int)*plVar12 + 1;
            *(int *)(local_340._24_8_ + *local_2f0 * uVar20) = (int)lVar33;
            plVar12 = (long *)0x0;
            goto LAB_002f27a1;
          }
          lVar28 = uVar20 - 1;
          piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * lVar28);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * lVar28) == '\0') {
            piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * uVar20);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * uVar20) == '\0') {
              piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(local_258._24_8_ + lVar28 * *(long *)local_258._80_8_) == '\0') {
                uVar6 = TTA::MemNewLabel();
                plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
                *(int *)plVar12 = (int)*plVar12 + 1;
                *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
                piVar25 = local_278;
                plVar12 = (long *)0x0;
                goto LAB_002fa811;
              }
              plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
              *(int *)plVar12 = (int)*plVar12 + 1;
              lVar33 = *(long *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(int *)(local_340._24_8_ + *local_2f0 * uVar20) = (int)lVar33;
              plVar12 = (long *)0x0;
              goto LAB_002fb698;
            }
            piVar36 = (int *)(local_1e0 + 8 + *local_1a8 * lVar28);
            *piVar36 = *piVar36 + 1;
            goto LAB_002eb39b;
          }
          plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
          *(int *)plVar12 = (int)*plVar12 + 1;
          lVar32 = *(long *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
          plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
          *(int *)plVar12 = (int)*plVar12 + 1;
          *(int *)(local_340._24_8_ + *local_2f0 * uVar20) = (int)lVar32;
          plVar31 = (long *)0x0;
LAB_002ea5ba:
          uVar6 = (int)plVar31 + 2;
          plVar19 = (long *)(ulong)uVar6;
          plVar12 = plVar31;
          plVar35 = plVar34;
          if ((int)uVar6 < (int)local_180) {
            plVar24 = (long *)(uVar20 - 1);
            lVar28 = uVar20 - 2;
            uVar13 = uVar20 | 1;
            lVar29 = (long)(int)plVar31;
            plVar19 = (long *)(lVar29 + 2);
            local_188 = plVar24;
            while( true ) {
              plVar12 = plVar19;
              lVar32 = local_260;
              plVar34 = local_270;
              piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              iVar7 = (int)lVar29;
              lVar33 = lVar32;
              uVar17 = uVar30;
              if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_)
                  == '\0') break;
              piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 4 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) ==
                  '\0') {
                piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) ==
                    '\0') {
                  piVar36 = (int *)(local_1e0 + *local_1a8 * (long)plVar24 + 0xc + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar29 + 3 +
                               *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) == '\0'
                     ) {
                    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
                    *piVar36 = *piVar36 + 1;
                    lVar26 = *local_1a8 * (long)plVar24 + local_1e0;
                    if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_
                                 ) == '\0') {
                      piVar36 = (int *)(lVar26 + (long)plVar12 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)((long)plVar12 +
                                   (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                          '\0') {
                        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                        *piVar36 = *piVar36 + 1;
                        uVar15 = *(undefined4 *)
                                  (local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
                        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20)
                        ;
                        *piVar36 = *piVar36 + 1;
                        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20)
                             = uVar15;
                        goto LAB_002fa811;
                      }
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar15 = *(undefined4 *)
                                (local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                           uVar15;
                      goto LAB_002fb698;
                    }
                    lVar37 = (lVar29 << 0x20) + 0x400000000;
                    piVar36 = (int *)(lVar26 + (lVar37 >> 0x1e));
                    *piVar36 = *piVar36 + 1;
                    lVar37 = lVar37 >> 0x20;
                    cVar23 = *(char *)(lVar37 + *(long *)local_258._80_8_ * (long)plVar24 +
                                                local_258._24_8_);
                    piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                    *piVar36 = *piVar36 + 1;
                    cVar14 = *(char *)((long)plVar12 +
                                      (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_);
                    if (cVar23 != '\0') {
                      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar29 * 4);
                      *piVar36 = *piVar36 + 1;
                      cVar23 = *(char *)(lVar29 + 3 +
                                        *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
                      if (cVar14 != '\0') {
                        if (cVar23 != '\0') {
                          piVar36 = (int *)((long)local_2c8 +
                                           (long)plVar12 * 4 + *local_290 * lVar28);
                          *piVar36 = *piVar36 + 1;
                          uVar15 = *(undefined4 *)
                                    (local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                          piVar36 = (int *)((long)local_2c8 +
                                           (long)plVar12 * 4 + *local_290 * uVar20);
                          *piVar36 = *piVar36 + 1;
                          *(undefined4 *)
                           (local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
                          goto LAB_002eb76f;
                        }
                        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28)
                        ;
                        *piVar36 = *piVar36 + 1;
                        uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28
                                         );
                        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar28);
                        *piVar36 = *piVar36 + 1;
                        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                             lVar37 * 4 + lVar28 * *local_2f0));
                        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20)
                        ;
                        *piVar36 = *piVar36 + 1;
                        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                             uVar6;
                        goto LAB_002eb76f;
                      }
                      if (cVar23 == '\0') {
                        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                        *piVar36 = *piVar36 + 1;
                        uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar28);
                        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar28);
                        *piVar36 = *piVar36 + 1;
                        uVar8 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar28 * *local_2f0);
                      }
                      else {
                        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                        *piVar36 = *piVar36 + 1;
                        lVar32 = (long)iVar7;
                        if (*(char *)((long)plVar12 +
                                     *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0')
                        {
                          piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar28);
                          *piVar36 = *piVar36 + 1;
                          uVar15 = *(undefined4 *)
                                    (local_340._24_8_ + lVar32 * 4 + lVar28 * *local_2f0);
                          piVar36 = (int *)((long)local_2c8 +
                                           (long)plVar12 * 4 + *local_290 * uVar20);
                          *piVar36 = *piVar36 + 1;
                          *(undefined4 *)
                           (local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
                          goto LAB_002eb76f;
                        }
                        piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar28);
                        *piVar36 = *piVar36 + 1;
                        uVar6 = *(uint *)(local_340._24_8_ + lVar32 * 4 + *local_2f0 * lVar28);
                        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28)
                        ;
                        *piVar36 = *piVar36 + 1;
                        uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0
                                         );
                      }
                      uVar6 = TTA::MemMerge(uVar6,uVar8);
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
                      goto LAB_002eb76f;
                    }
                    if (cVar14 == '\0') {
                      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar15 = *(undefined4 *)
                                (local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                           uVar15;
                      goto LAB_002f1a41;
                    }
                    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                         uVar15;
                    goto LAB_002f27a1;
                  }
                  piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) != '\0'
                     ) goto LAB_002ea6e3;
                }
                else {
                  piVar36 = (int *)(local_1e0 + *local_1a8 * (long)plVar24 + 0xc + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar29 + 3 +
                               *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) == '\0'
                     ) {
                    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
                    *piVar36 = *piVar36 + 1;
                    if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_
                                 ) == '\0') {
                      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
                      goto LAB_002ede17;
                    }
                    lVar33 = (lVar29 << 0x20) + 0x400000000;
                    piVar36 = (int *)((lVar33 >> 0x1e) + *local_1a8 * (long)plVar24 + local_1e0);
                    *piVar36 = *piVar36 + 1;
                    lVar33 = lVar33 >> 0x20;
                    if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar24 +
                                           local_258._24_8_) == '\0') {
                      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
                      goto LAB_002ee16d;
                    }
                    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar29 * 4);
                    *piVar36 = *piVar36 + 1;
                    if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_
                                 ) == '\0') {
                      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar28);
                      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
                    }
                    else {
                      piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)((long)plVar12 +
                                   *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) !=
                          '\0') goto LAB_002ee07b;
                      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                      *piVar36 = *piVar36 + 1;
                      lVar32 = (long)iVar7;
                      if (*(char *)((long)plVar12 +
                                   *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
                        piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar28);
                        *piVar36 = *piVar36 + 1;
                        plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                        uVar15 = *(undefined4 *)
                                  (local_340._24_8_ + lVar32 * 4 + lVar28 * *local_2f0);
                        goto LAB_002fd916;
                      }
                      piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ + lVar32 * 4 + *local_2f0 * lVar28);
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                    }
                    goto LAB_002fde33;
                  }
                  piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) != '\0'
                     ) goto LAB_002ea922;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                    == '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar28);
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
LAB_002ea9b7:
                  uVar6 = TTA::MemMerge(uVar6,uVar8);
                  piVar25 = local_278;
                  plVar24 = local_188;
                }
                else {
LAB_002ea922:
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar28);
                }
              }
              else {
                piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) == '\0')
                {
                  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_)
                      == '\0') {
                    lVar32 = (lVar29 << 0x20) >> 0x1e;
                    piVar36 = (int *)((long)local_2c8 + lVar32 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    uVar6 = *(uint *)(local_340._24_8_ + lVar32 + *local_2f0 * uVar20);
LAB_002ede17:
                    plVar31 = (long *)((ulong)plVar12 & 0xffffffff);
                    goto LAB_002f50ec;
                  }
                  lVar33 = (lVar29 << 0x20) + 0x400000000;
                  piVar36 = (int *)((lVar33 >> 0x1e) + *local_1a8 * (long)plVar24 + local_1e0);
                  *piVar36 = *piVar36 + 1;
                  lVar33 = lVar33 >> 0x20;
                  if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar24 +
                                         local_258._24_8_) == '\0') {
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
LAB_002ee16d:
                    plVar35 = (long *)((ulong)plVar12 & 0xffffffff);
                    goto LAB_002f6327;
                  }
                  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                      == '\0') {
                    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
                    lVar32 = *local_290;
                    goto LAB_002ee8aa;
                  }
                  piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) != '\0'
                     ) {
                    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                    goto LAB_002fc780;
                  }
                  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
LAB_002ee07b:
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
                    goto LAB_002fc780;
                  }
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                  goto LAB_002ee8a7;
                }
                piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 +
                             *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_) == '\0')
                {
                  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0')
                  goto LAB_002ea922;
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
                  goto LAB_002ea9b7;
                }
LAB_002ea6e3:
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
              }
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
              plVar19 = (long *)((long)plVar12 + 2);
              lVar29 = lVar29 + 2;
              lVar33 = local_260;
              plVar35 = local_270;
              if ((long)local_190 <= (long)plVar19) goto LAB_002eaa31;
            }
            piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + (long)plVar12 * 4);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_
                              );
            lVar37 = lVar29 << 0x20;
            piVar36 = (int *)((lVar37 + 0x300000000 >> 0x1e) + *local_1a8 * uVar20 + local_1e0);
            *piVar36 = *piVar36 + 1;
            lVar26 = lVar37 + 0x300000000 >> 0x20;
            cVar14 = *(char *)(lVar26 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
            if (cVar23 == '\0') {
              if (cVar14 == '\0') {
                piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar26 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar26 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                    '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  plVar31 = (long *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20);
                  lVar33 = local_260;
                  plVar35 = local_270;
                  goto LAB_002ef206;
                }
                uVar6 = TTA::MemNewLabel();
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
                lVar32 = local_260;
                plVar34 = local_270;
                goto LAB_002f0539;
              }
              piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + lVar26 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar26 + *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_)
                  != '\0') {
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0)
                ;
                goto LAB_002fce01;
              }
              piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                               *local_1a8 * (long)plVar24 + local_1e0);
              *piVar36 = *piVar36 + 1;
              lVar33 = lVar37 + 0x400000000 >> 0x20;
              cVar14 = *(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar24 +
                                          local_258._24_8_);
              piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              cVar23 = *(char *)((long)plVar12 +
                                (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002edd56:
              if (cVar14 == '\0') {
                if (cVar23 == '\0') goto LAB_002f19fd;
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0)
                ;
                goto LAB_002fd342;
              }
              if (cVar23 != '\0') {
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar26 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) ==
                    '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
                  goto LAB_002fd3d3;
                }
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0)
                ;
                goto LAB_002fb60e;
              }
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
              *piVar36 = *piVar36 + 1;
              plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
              uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
              goto LAB_002fb60e;
            }
            lVar18 = lVar37 + 0x100000000 >> 0x20;
            if (cVar14 == '\0') {
              piVar36 = (int *)(local_1e0 + *local_1a8 * uVar13 + lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar18 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar18 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar18 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) !=
                    '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20)
                  ;
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                       uVar15;
                  goto LAB_002f37bd;
                }
                uVar6 = TTA::MemNewLabel();
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
                piVar25 = local_278;
                goto LAB_002f37bd;
              }
LAB_002fc8e6:
              piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              uVar15 = *(undefined4 *)
                        (local_340._24_8_ + (long)(int)lVar29 * 4 + *local_2f0 * uVar20);
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
              lVar32 = local_260;
              plVar34 = local_270;
              goto LAB_002f37bd;
            }
            piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + lVar18 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar18 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
              piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              cVar23 = *(char *)(lVar18 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
              piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + lVar26 * 4);
              *piVar36 = *piVar36 + 1;
              cVar14 = *(char *)(lVar26 + *(long *)local_258._80_8_ * (long)plVar24 +
                                          local_258._24_8_);
              if (cVar23 == '\0') {
                if (cVar14 != '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar15 = *(undefined4 *)
                            (local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                       uVar15;
                  goto LAB_002eaece;
                }
                piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                                 *local_1a8 * (long)plVar24 + local_1e0);
                *piVar36 = *piVar36 + 1;
                lVar33 = lVar37 + 0x400000000 >> 0x20;
                cVar14 = *(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar24 +
                                            local_258._24_8_);
                piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                cVar23 = *(char *)((long)plVar12 +
                                  (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_);
                goto joined_r0x002edd56;
              }
              lVar29 = *local_1a8 * (long)plVar24 + local_1e0;
              if (cVar14 == '\0') {
                piVar36 = (int *)(lVar29 + (lVar37 + 0x400000000 >> 0x1e));
                *piVar36 = *piVar36 + 1;
                lVar29 = lVar37 + 0x400000000 >> 0x20;
                if (*(char *)(lVar29 + *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_)
                    == '\0') {
                  piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0'
                     ) {
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
                    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                         uVar15;
                    goto LAB_002f1a41;
                  }
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0)
                  ;
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                       uVar15;
                  goto LAB_002f27a1;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar26 * 4);
                *piVar36 = *piVar36 + 1;
                cVar23 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
                piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                cVar14 = *(char *)((long)plVar12 +
                                  (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_);
                if (cVar23 == '\0') {
                  if (cVar14 == '\0') {
                    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 * *local_2f0);
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
                  }
                  else {
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar28);
                    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 * *local_2f0);
                  }
                  uVar6 = TTA::MemMerge(uVar6,uVar8);
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
                  goto LAB_002eb76f;
                }
                if (cVar14 != '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0)
                  ;
                  goto LAB_002fc780;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                lVar32 = (long)iVar7;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                    != '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar28 * *local_2f0);
                  goto LAB_002fd916;
                }
                piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + lVar32 * 4 + *local_2f0 * lVar28);
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                goto LAB_002fde33;
              }
              piVar36 = (int *)(lVar29 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)plVar12 +
                           (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                lVar33 = (long)iVar7;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                    != '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                       uVar15;
                  goto LAB_002eaece;
                }
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar28);
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                goto LAB_002eedae;
              }
            }
            else {
              piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + lVar26 * 4);
              *piVar36 = *piVar36 + 1;
              lVar33 = *local_1a8 * (long)plVar24 + local_1e0;
              if (*(char *)(lVar26 + *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)(lVar33 + (lVar37 + 0x400000000 >> 0x1e));
                *piVar36 = *piVar36 + 1;
                lVar33 = lVar37 + 0x400000000 >> 0x20;
                if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_)
                    == '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
                  plVar35 = (long *)((ulong)plVar12 & 0xffffffff);
                  goto LAB_002f6327;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar26 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) ==
                    '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
                }
                else {
                  piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0'
                     ) {
                    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                    goto LAB_002fc780;
                  }
                  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)((long)plVar12 +
                               *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
                    *piVar36 = *piVar36 + 1;
                    plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
                    goto LAB_002fc780;
                  }
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                }
LAB_002ee8a7:
                lVar32 = *local_290;
LAB_002ee8aa:
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + lVar32 * uVar20);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
LAB_002fde33:
                lVar33 = local_260;
                plVar34 = local_270;
                uVar6 = TTA::MemMerge(uVar8,uVar6);
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
LAB_002eb76f:
                iVar7 = (int)plVar12;
                uVar6 = iVar7 + 2;
                piVar25 = local_278;
                if ((int)uVar6 < (int)local_180) {
                  lVar26 = (long)iVar7;
                  local_188 = (long *)(lVar26 + 2);
                  lVar29 = lVar26 << 0x20;
                  lVar33 = lVar26 * 4;
                  lVar28 = 8;
                  lVar37 = 0;
                  do {
                    plVar34 = local_270;
                    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar33 + 8 + lVar37 * 4);
                    *piVar36 = *piVar36 + 1;
                    iVar16 = (int)lVar37;
                    lVar18 = lVar29 >> 0x1e;
                    iVar9 = (int)local_188;
                    uVar30 = local_268;
                    lVar32 = local_260;
                    if (*(char *)(lVar37 + 2 +
                                 *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ + lVar26) ==
                        '\0') {
                      piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar33 + 8 +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      cVar23 = *(char *)(lVar37 + 2 +
                                        *(long *)local_258._80_8_ * (long)local_270 +
                                        local_258._24_8_ + lVar26);
                      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar33 + 0xc + lVar37 * 4)
                      ;
                      *piVar36 = *piVar36 + 1;
                      cVar14 = *(char *)(lVar37 + 3 +
                                        *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ +
                                        lVar26);
                      if (cVar23 != '\0') {
                        if (cVar14 == '\0') {
                          piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * uVar20);
                          *piVar36 = *piVar36 + 1;
                          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar18 + *local_2f0 * uVar20);
                          piVar36 = (int *)((long)local_2c8 +
                                           lVar37 * 4 + lVar26 * 4 + *local_290 * uVar20 + 8);
                          *piVar36 = *piVar36 + 1;
                          uVar6 = iVar9 + iVar16;
                          lVar32 = local_340._24_8_ + lVar26 * 4 + *local_2f0 * uVar20;
LAB_002ed345:
                          plVar12 = (long *)(ulong)uVar6;
                          *(undefined4 *)(lVar32 + 8 + lVar37 * 4) = uVar15;
                          uVar30 = local_268;
                          lVar32 = local_260;
                          plVar34 = local_270;
                          goto LAB_002f37bd;
                        }
                        piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar33 + 0xc +
                                         lVar37 * 4);
                        *piVar36 = *piVar36 + 1;
                        if (*(char *)(lVar37 + 3 +
                                     *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ +
                                     lVar26) != '\0') goto LAB_002ece21;
                        goto LAB_002eb95e;
                      }
                      if (cVar14 == '\0') {
                        piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar26 * 4 +
                                          0xc + lVar37 * 4);
                        *piVar36 = *piVar36 + 1;
                        uVar6 = iVar9 + iVar16;
                        if (*(char *)(lVar37 + 3 +
                                     *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_
                                     + lVar26) == '\0') {
                          piVar36 = (int *)((long)local_2c8 +
                                           lVar37 * 4 + lVar26 * 4 + *local_290 * uVar20 + 8);
                          *piVar36 = *piVar36 + 1;
                          lVar32 = local_340._24_8_ + lVar26 * 4 + *local_2f0 * uVar20;
                          goto LAB_002f249b;
                        }
                        uVar8 = TTA::MemNewLabel();
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * uVar20 + 8);
                        *piVar36 = *piVar36 + 1;
                        *(uint *)(local_340._24_8_ +
                                 lVar37 * 4 + lVar26 * 4 + *local_2f0 * uVar20 + 8) = uVar8;
LAB_002f218b:
                        plVar12 = (long *)(ulong)uVar6;
                        uVar30 = local_268;
                        lVar32 = local_260;
                        goto LAB_002f0539;
                      }
                      piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar33 + 0xc +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 3 +
                                   *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ +
                                   lVar26) != '\0') {
LAB_002ece21:
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * local_260 + 8);
                        *piVar36 = *piVar36 + 1;
                        uVar15 = *(undefined4 *)
                                  (local_340._24_8_ +
                                  lVar37 * 4 + lVar26 * 4 + *local_2f0 * local_260 + 8);
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * uVar20 + 8);
                        *piVar36 = *piVar36 + 1;
                        uVar6 = iVar9 + iVar16;
                        *(undefined4 *)
                         (local_340._24_8_ + lVar37 * 4 + lVar26 * 4 + *local_2f0 * uVar20 + 8) =
                             uVar15;
                        goto LAB_002f222c;
                      }
                      piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar33 + 0x10 +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 4 +
                                   *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ +
                                   lVar26) == '\0') {
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * local_260 + 8);
                        *piVar36 = *piVar36 + 1;
                        uVar15 = *(undefined4 *)
                                  (local_340._24_8_ +
                                  lVar37 * 4 + lVar26 * 4 + *local_2f0 * local_260 + 8);
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * uVar20 + 8);
                        *piVar36 = *piVar36 + 1;
                        *(undefined4 *)
                         (local_340._24_8_ + lVar37 * 4 + lVar26 * 4 + *local_2f0 * uVar20 + 8) =
                             uVar15;
                        plVar12 = (long *)(ulong)(uint)(iVar9 + iVar16);
                        goto LAB_002f27a1;
                      }
                      piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar33 + 0xc +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 3 +
                                   *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar26
                                   ) != '\0') goto LAB_002eb9ec;
                      piVar36 = (int *)((long)local_2c8 +
                                       lVar37 * 4 + lVar33 + *local_290 * local_260 + 8);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ +
                                       lVar37 * 4 + lVar33 + *local_2f0 * local_260 + 8);
                      piVar36 = (int *)((long)local_2c8 +
                                       lVar37 * 4 + lVar33 + *local_290 * local_260 + 0x10);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ +
                                       lVar37 * 4 + lVar33 + *local_2f0 * local_260 + 0x10);
LAB_002eba97:
                      uVar6 = TTA::MemMerge(uVar6,uVar8);
                      piVar25 = local_278;
                    }
                    else {
                      piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar33 + 0xc +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 3 +
                                   *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ +
                                   lVar26) != '\0') {
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * local_260 + 8);
                        *piVar36 = *piVar36 + 1;
                        uVar15 = *(undefined4 *)
                                  (local_340._24_8_ +
                                  lVar37 * 4 + lVar26 * 4 + *local_2f0 * local_260 + 8);
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar26 * 4 + *local_290 * uVar20 + 8);
                        *piVar36 = *piVar36 + 1;
                        plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
                        *(undefined4 *)
                         (local_340._24_8_ + lVar37 * 4 + lVar26 * 4 + *local_2f0 * uVar20 + 8) =
                             uVar15;
                        lVar33 = local_260;
                        goto LAB_002ea5ba;
                      }
                      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar33 + 0xc + lVar37 * 4)
                      ;
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 3 +
                                   *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ + lVar26)
                          == '\0') {
                        piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * uVar20);
                        *piVar36 = *piVar36 + 1;
                        plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
                        uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * uVar20);
                        plVar12 = (long *)(lVar26 + lVar37 + 2);
                        goto LAB_002f50ec;
                      }
LAB_002eb95e:
                      piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar33 + 0x10 +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 4 +
                                   *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ +
                                   lVar26) == '\0') goto LAB_002ec603;
                      piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar33 + 0xc +
                                       lVar37 * 4);
                      *piVar36 = *piVar36 + 1;
                      if (*(char *)(lVar37 + 3 +
                                   *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar26
                                   ) == '\0') {
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar33 + *local_290 * local_260 + 0x10);
                        *piVar36 = *piVar36 + 1;
                        uVar6 = *(uint *)(local_340._24_8_ +
                                         lVar37 * 4 + lVar33 + *local_2f0 * local_260 + 0x10);
                        piVar36 = (int *)((long)local_2c8 +
                                         lVar37 * 4 + lVar33 + *local_290 * uVar20);
                        *piVar36 = *piVar36 + 1;
                        uVar8 = *(uint *)(local_340._24_8_ +
                                         lVar37 * 4 + lVar33 + *local_2f0 * uVar20);
                        goto LAB_002eba97;
                      }
LAB_002eb9ec:
                      piVar36 = (int *)((long)local_2c8 +
                                       lVar37 * 4 + lVar33 + *local_290 * local_260 + 8);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ +
                                       lVar37 * 4 + lVar33 + *local_2f0 * local_260 + 8);
                    }
                    piVar36 = (int *)((long)local_2c8 +
                                     lVar37 * 4 + lVar33 + *local_290 * uVar20 + 8);
                    *piVar36 = *piVar36 + 1;
                    *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar33 + *local_2f0 * uVar20 + 8) =
                         uVar6;
                    lVar29 = lVar29 + 0x200000000;
                    lVar28 = lVar28 + 8;
                    lVar32 = lVar26 + lVar37;
                    lVar37 = lVar37 + 2;
                    if ((long)local_190 <= lVar32 + 4) {
                      iVar7 = iVar7 + (int)lVar37;
                      uVar6 = (int)local_188 + (int)lVar37;
                      uVar30 = local_268;
                      lVar33 = local_260;
                      plVar34 = local_270;
                      break;
                    }
                  } while( true );
                }
                lVar32 = lVar33;
                if ((int)local_180 < (int)uVar6) {
LAB_002f1c9c:
                  plVar12 = (long *)(ulong)uVar6;
LAB_002f666b:
                  lVar33 = (long)(int)plVar12;
                  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar33 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar33 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) ==
                      '\0') {
                    piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar33 * 4);
                    *piVar36 = *piVar36 + 1;
                    if (*(char *)(lVar33 + (uVar20 | 1) * *(long *)local_258._80_8_ +
                                           local_258._24_8_) == '\0') {
                      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20) = 0;
                    }
                    else {
                      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20 + -8);
                      *piVar36 = *piVar36 + 1;
                      uVar15 = *(undefined4 *)
                                (local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20 + -8);
                      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20) = uVar15;
                    }
                  }
                  else {
                    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20 + -8);
                    *piVar36 = *piVar36 + 1;
                    uVar15 = *(undefined4 *)
                              (local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20 + -8);
                    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20) = uVar15;
                  }
                  goto LAB_002fc8b3;
                }
                lVar29 = (long)(int)uVar6;
                piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) ==
                    '\0') {
                  piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar23 = *(char *)(lVar29 + *(long *)local_258._80_8_ * (uVar20 | 1) +
                                              local_258._24_8_);
                  lVar28 = (long)iVar7;
                  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar14 = *(char *)(lVar28 + 3 +
                                    *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
                  if (cVar23 != '\0') {
                    if (cVar14 != '\0') {
                      lVar26 = *local_1a8 * (uVar20 - 1);
                      goto LAB_002ebce5;
                    }
                    goto LAB_002f6a07;
                  }
                  if (cVar14 != '\0') goto LAB_002ebd08;
LAB_002f6ab4:
                  piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + 0xc + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar28 + 3 +
                               (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
                  {
                    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20) = 0;
                    uVar30 = local_268;
                    goto LAB_002fc8b3;
                  }
LAB_002f6aee:
                  uVar6 = TTA::MemNewLabel();
                  lVar33 = lVar32;
LAB_002f1d88:
                  plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  piVar25 = local_278;
LAB_002f1db0:
                  piVar36 = (int *)((long)plVar12 + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  lVar32 = lVar33;
                }
                else {
                  lVar26 = *local_1a8 * (uVar20 - 1);
LAB_002ebce5:
                  lVar28 = (long)iVar7;
                  piVar36 = (int *)(lVar26 + local_1e0 + 0xc + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar28 + 3 +
                               (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) != '\0')
                  {
LAB_002ebd08:
                    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
                    *piVar36 = *piVar36 + 1;
                    plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                    uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + (uVar20 - 2) * *local_2f0);
                    goto LAB_002f1db0;
                  }
LAB_002f6a07:
                  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                }
                *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20) = uVar6;
                uVar30 = local_268;
                goto LAB_002fc8b3;
              }
              piVar36 = (int *)(lVar33 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)plVar12 +
                           (long)plVar24 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                lVar33 = *local_290;
                uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0)
                ;
                goto LAB_002ee01d;
              }
              piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
LAB_002eedae:
                uVar6 = TTA::MemMerge(uVar6,uVar8);
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
                piVar25 = local_278;
                goto LAB_002eaece;
              }
            }
            piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar28);
            *piVar36 = *piVar36 + 1;
            lVar33 = *local_290;
            uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + lVar28 * *local_2f0);
LAB_002ee01d:
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + lVar33 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
            goto LAB_002eaece;
          }
LAB_002eaa31:
          lVar28 = (long)(int)plVar19;
          piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
          lVar26 = *local_1a8;
          iVar7 = (int)plVar12;
          plVar34 = plVar35;
          lVar32 = lVar33;
          if ((int)local_180 < (int)plVar19) {
            if (cVar23 == '\0') {
              uVar13 = uVar20 | 1;
              piVar36 = (int *)(local_1e0 + lVar26 * uVar13 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0')
              {
LAB_002fbd54:
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = 0;
                goto LAB_002fc8b3;
              }
              lVar26 = *local_1a8 * uVar13;
LAB_002ed43e:
              lVar29 = (long)iVar7;
              piVar36 = (int *)(lVar26 + local_1e0 + 4 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar29 + 1 + (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_
                           ) == '\0') {
                piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 4 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                lVar33 = *(long *)local_258._80_8_ * uVar20;
LAB_002fbd06:
                cVar23 = *(char *)(lVar29 + 1 + lVar33 + local_258._24_8_);
                lVar33 = lVar32;
                plVar35 = plVar34;
joined_r0x002f49d8:
                if (cVar23 == '\0') goto LAB_002fc868;
              }
            }
            else {
              lVar29 = (long)iVar7;
              piVar36 = (int *)(local_1e0 + lVar26 * uVar20 + 4 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) ==
                  '\0') {
                piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + 4 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if ((*(char *)(lVar29 + 1 +
                              (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
                   && (piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4),
                      *piVar36 = *piVar36 + 1,
                      *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_
                               ) != '\0')) goto LAB_002ec4fb;
                goto LAB_002fbf07;
              }
            }
LAB_002fbd19:
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            plVar12 = (long *)(*local_2f0 * uVar20 + local_340._24_8_);
            lVar32 = *local_290;
LAB_002fbf3a:
            plVar34 = (long *)(lVar32 * uVar20 + (long)local_2c8);
            uVar6 = *(uint *)((long)plVar12 + lVar29 * 4);
            lVar32 = lVar33;
LAB_002fbf49:
            piVar36 = (int *)((long)plVar34 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
          }
          else {
            lVar29 = (long)iVar7;
            if (cVar23 == '\0') {
              uVar13 = uVar20 | 1;
              piVar36 = (int *)(local_1e0 + lVar26 * uVar13 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
              piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_)
              ;
              if (cVar23 == '\0') {
joined_r0x002fbf54:
                if (cVar14 == '\0') {
                  piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + 0xc + lVar29 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar23 = *(char *)(lVar29 + 3 +
                                    (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_);
                  lVar32 = lVar33;
                  plVar34 = plVar35;
joined_r0x002f4666:
                  lVar33 = lVar32;
                  plVar35 = plVar34;
                  if (cVar23 == '\0') goto LAB_002fbd54;
LAB_002fc868:
                  uVar6 = TTA::MemNewLabel();
                  goto LAB_002fc86d;
                }
LAB_002fbf5a:
                piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                cVar14 = *(char *)(lVar29 + 3 +
                                  *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_);
joined_r0x002f4dc4:
                if (cVar14 == '\0') {
                  piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar23 = *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ +
                                              local_258._24_8_);
joined_r0x002f0f16:
                  if (cVar23 == '\0') goto LAB_002fc868;
                }
              }
              else {
                if (cVar14 == '\0') {
                  lVar26 = *local_1a8 * uVar13;
                  goto LAB_002ed43e;
                }
                piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + 4 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) !=
                    '\0') goto LAB_002ec47c;
                piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                lVar32 = uVar20 - 1;
                cVar23 = *(char *)(lVar29 + 1 +
                                  uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
                piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                cVar14 = *(char *)(lVar29 + 3 +
                                  *(long *)local_258._80_8_ * lVar32 + local_258._24_8_);
                if (cVar23 != '\0') {
                  piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar23 = *(char *)(lVar28 + lVar32 * *(long *)local_258._80_8_ + local_258._24_8_)
                  ;
                  if (cVar14 != '\0') goto joined_r0x002fbbfb;
                  if (cVar23 != '\0') goto LAB_002fbf07;
                  goto LAB_002fbd19;
                }
joined_r0x002fccef:
                if (cVar14 == '\0') {
                  piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar23 = *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ +
                                              local_258._24_8_);
                  goto joined_r0x002f0f16;
                }
              }
LAB_002fc21e:
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
              *piVar36 = *piVar36 + 1;
              plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
            }
            else {
              piVar36 = (int *)(local_1e0 + lVar26 * uVar20 + 4 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) ==
                  '\0') {
                piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + 4 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                lVar26 = uVar20 - 1;
                cVar23 = *(char *)(lVar29 + 1 +
                                  (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_);
                piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                cVar14 = *(char *)(lVar29 + 3 +
                                  *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
                if (cVar23 == '\0') {
                  piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  cVar23 = *(char *)(lVar28 + lVar26 * *(long *)local_258._80_8_ + local_258._24_8_)
                  ;
                  if (cVar14 == '\0') {
                    if (cVar23 == '\0') goto LAB_002fbf07;
                  }
                  else if (cVar23 == '\0') goto LAB_002fbc01;
LAB_002ec4fb:
                  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
                  *piVar36 = *piVar36 + 1;
                  uVar15 = *(undefined4 *)
                            (local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
                  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = uVar15;
                  plVar34 = plVar35;
                  goto LAB_002fc8b3;
                }
                if (cVar14 != '\0') {
                  piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
                  *piVar36 = *piVar36 + 1;
                  lVar32 = lVar26 * *(long *)local_258._80_8_ + local_258._24_8_;
LAB_002fbbf6:
                  cVar23 = *(char *)(lVar28 + lVar32);
joined_r0x002fbbfb:
                  if (cVar23 == '\0') {
LAB_002fbc01:
                    piVar36 = (int *)(*local_1a8 * (uVar20 - 2) + local_1e0 + lVar28 * 4);
                    *piVar36 = *piVar36 + 1;
                    cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * (uVar20 - 2) +
                                                local_258._24_8_);
joined_r0x002fbf01:
                    if (cVar23 == '\0') {
LAB_002fbc3e:
                      lVar32 = uVar20 - 2;
                      piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar32);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar32);
                      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
                      goto LAB_002fbc99;
                    }
                  }
                }
LAB_002fbf07:
                piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
                *piVar36 = *piVar36 + 1;
                plVar12 = (long *)((uVar20 - 2) * *local_2f0 + local_340._24_8_);
                lVar32 = *local_290;
                goto LAB_002fbf3a;
              }
LAB_002ec47c:
              lVar32 = *local_1a8 * (uVar20 - 1) + local_1e0;
LAB_002ec497:
              lVar26 = uVar20 - 1;
              piVar36 = (int *)(lVar32 + 0xc + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) ==
                  '\0') goto LAB_002fbd19;
              piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              lVar32 = lVar33;
              if (*(char *)(lVar28 + lVar26 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0')
              goto LAB_002ec4fb;
              piVar36 = (int *)(*local_1a8 * (uVar20 - 2) + local_1e0 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (uVar20 - 2) + local_258._24_8_) !=
                  '\0') goto LAB_002fbf07;
LAB_002f4558:
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
              *piVar36 = *piVar36 + 1;
              plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
LAB_002f459c:
              piVar36 = (int *)((long)plVar34 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
LAB_002fbc99:
              uVar6 = TTA::MemMerge(uVar6,uVar8);
LAB_002fc86d:
              plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
              piVar25 = local_278;
            }
            piVar36 = (int *)((long)plVar34 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            lVar32 = lVar33;
          }
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = uVar6;
          plVar34 = plVar35;
          goto LAB_002fc8b3;
        }
        if (iVar2 == 2) {
          lVar33 = *local_1a8;
          piVar36 = (int *)(local_1e0 + lVar33 * uVar20);
          *piVar36 = *piVar36 + 1;
          lVar28 = *(long *)local_258._80_8_;
          if (*(char *)(local_258._24_8_ + lVar28 * uVar20) != '\0') {
            lVar33 = uVar20 - 1;
            piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * lVar33);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * lVar33) != '\0') {
              plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
              *(int *)plVar12 = (int)*plVar12 + 1;
              lVar33 = *(long *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(int *)(local_340._24_8_ + *local_2f0 * uVar20) = (int)lVar33;
              goto LAB_002fc8b3;
            }
            piVar36 = (int *)(local_1e0 + *local_1a8 * lVar33);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(local_258._24_8_ + lVar33 * *(long *)local_258._80_8_);
joined_r0x002eb2c0:
            if (cVar23 == '\0') goto LAB_002ec83b;
LAB_002eb2c6:
            plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
            *(int *)plVar12 = (int)*plVar12 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
            goto LAB_002ec851;
          }
          lVar26 = lVar33 * (uVar20 | 1);
          piVar36 = (int *)(local_1e0 + lVar26);
          *piVar36 = *piVar36 + 1;
          lVar29 = (uVar20 | 1) * lVar28;
          if (*(char *)(local_258._24_8_ + lVar29) != '\0') {
            piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * uVar20);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * uVar20) == '\0')
            goto LAB_002ec83b;
            lVar33 = uVar20 - 1;
            piVar36 = (int *)(local_1e0 + 4 + *local_1a8 * lVar33);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + 1 + *(long *)local_258._80_8_ * lVar33) != '\0')
            goto LAB_002eb2c6;
            piVar36 = (int *)(local_1e0 + *local_1a8 * lVar33);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(local_258._24_8_ + lVar33 * *(long *)local_258._80_8_);
            goto joined_r0x002eb2c0;
          }
          piVar36 = (int *)(local_1e0 + 4 + lVar33 * uVar20);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(local_258._24_8_ + 1 + lVar28 * uVar20) == '\0') {
            piVar36 = (int *)(local_1e0 + 4 + lVar26);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + 1 + lVar29) != '\0') {
              uVar6 = TTA::MemNewLabel();
              goto LAB_002ebfbe;
            }
            plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
            *(int *)plVar12 = (int)*plVar12 + 1;
            *(undefined4 *)(local_340._24_8_ + *local_2f0 * uVar20) = 0;
          }
          else {
            lVar33 = lVar33 * (uVar20 - 1);
            piVar36 = (int *)(local_1e0 + 4 + lVar33);
            *piVar36 = *piVar36 + 1;
            lVar28 = lVar28 * (uVar20 - 1);
            if (*(char *)(local_258._24_8_ + 1 + lVar28) == '\0') {
              piVar36 = (int *)(local_1e0 + lVar33);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(local_258._24_8_ + lVar28) == '\0') goto LAB_002ec83b;
              lVar33 = *local_290;
              plVar12 = (long *)((long)local_2c8 + lVar33 * (uVar20 - 2));
              *(int *)plVar12 = (int)*plVar12 + 1;
              lVar28 = *local_2f0;
              lVar29 = *(long *)(local_340._24_8_ + (uVar20 - 2) * lVar28);
              plVar12 = (long *)((long)local_2c8 + lVar33 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(int *)(local_340._24_8_ + lVar28 * uVar20) = (int)lVar29;
            }
            else {
              plVar12 = (long *)((long)local_2c8 + *local_290 * (uVar20 - 2));
              *(int *)plVar12 = (int)*plVar12 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + (uVar20 - 2) * *local_2f0);
LAB_002ebfbe:
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
              piVar25 = local_278;
            }
          }
        }
        else {
          piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(local_258._24_8_ + *(long *)local_258._80_8_ * uVar20) == '\0') {
            piVar36 = (int *)(local_1e0 + *local_1a8 * (uVar20 | 1));
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + (uVar20 | 1) * *(long *)local_258._80_8_) == '\0') {
              plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
              *(int *)plVar12 = (int)*plVar12 + 1;
              *(undefined4 *)(local_340._24_8_ + *local_2f0 * uVar20) = 0;
              goto LAB_002fc8b3;
            }
          }
          else {
            piVar36 = (int *)(local_1e0 + *local_1a8 * (uVar20 - 1));
            *piVar36 = *piVar36 + 1;
            if (*(char *)(local_258._24_8_ + (uVar20 - 1) * *(long *)local_258._80_8_) != '\0')
            goto LAB_002eb2c6;
          }
LAB_002ec83b:
          uVar6 = TTA::MemNewLabel();
LAB_002ec851:
          plVar12 = (long *)((long)local_2c8 + *local_290 * uVar20);
          *(int *)plVar12 = (int)*plVar12 + 1;
          *(uint *)(local_340._24_8_ + *local_2f0 * uVar20) = uVar6;
          piVar25 = local_278;
        }
LAB_002fc8b3:
        uVar20 = uVar20 + 2;
        plVar34 = (long *)((long)plVar34 + 2);
        piVar25 = (pointer)((long)piVar25 + 2);
        lVar32 = lVar32 + 2;
      } while ((long)uVar20 <
               (long)*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
    }
    if (this->o_rows == false) goto LAB_003037a6;
    iVar7 = (int)uVar30;
    lVar32 = (long)(iVar7 + -1);
    if (iVar2 < 3) {
      uVar6 = 0;
      lVar33 = 1;
    }
    else {
      plVar34 = (long *)(uVar30 - 2);
      plVar12 = (long *)(uVar30 - 3);
      local_168 = (long *)(long)(iVar7 + -2);
      local_260 = (long)(iVar7 + -2);
      local_120 = (long)(iVar7 + -3);
      local_150 = (long *)(long)(iVar7 + -3);
      local_170 = (long *)(long)(iVar7 + -3);
      local_128 = (long)(iVar7 + -3);
      local_130 = (long)(iVar7 + -3);
      local_138 = (long)(iVar7 + -3);
      local_140 = (long)(iVar7 + -3);
      local_278 = (pointer)(long)(int)local_180;
      local_148 = (ulong)(iVar7 + -3);
      local_158 = (long)(iVar7 + -3);
      plVar35 = (long *)0xfffffffe;
      plVar31 = (long *)0x0;
      local_270 = plVar12;
      local_190 = plVar34;
      do {
        plVar19 = (long *)(long)(int)plVar31;
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + (long)plVar19 * 4);
        *piVar36 = *piVar36 + 1;
        lVar33 = (long)(int)plVar35;
        if (*(char *)((long)plVar19 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0'
           ) {
          piVar36 = (int *)(local_1e0 + *local_1a8 * lVar32 + 0xc + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0')
          goto LAB_002fea62;
          piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0xc + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_)
              != '\0') goto LAB_0030086f;
LAB_002fe82f:
          piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0x10 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar33 + 4 +
                            *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + (long)plVar19 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)((long)plVar19 +
                            *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_);
          if (cVar23 == '\0') {
            if (cVar14 != '\0') goto LAB_003001cf;
LAB_002fe993:
            uVar6 = TTA::MemNewLabel();
            plVar34 = local_190;
            goto LAB_002ff6e9;
          }
          plVar24 = plVar12;
          if (cVar14 == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)plVar12 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)plVar12 + 0x10);
          }
          else {
            piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + 0xc + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_)
                == '\0') {
              piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * (long)plVar12);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * (long)plVar12);
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)plVar12 + 0x10);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)plVar12 + 0x10);
              goto LAB_003010e2;
            }
            piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * (long)plVar12);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * (long)plVar12);
          }
LAB_002ffc5b:
          piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar6;
          iVar7 = (int)plVar31;
          uVar6 = iVar7 + 2;
          if ((int)uVar6 < (int)local_180) {
            lVar33 = (long)iVar7;
            local_178 = (long *)(lVar33 + 2);
            lVar26 = lVar33 << 0x20;
            lVar28 = lVar33 * 4;
            lVar29 = 0;
            do {
              piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 + 8 + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              iVar16 = (int)lVar29;
              iVar9 = (int)local_178;
              plVar12 = plVar24;
              if (*(char *)(lVar29 + 2 +
                           *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar33) == '\0')
              {
                piVar36 = (int *)(local_1e0 + lVar28 + *local_1a8 * lVar32 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar33) == '\0'
                   ) {
                  plVar19 = (long *)(lVar33 + lVar29 + 2);
                  plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
                  goto LAB_002fea62;
                }
                piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 + 0xc + lVar29 * 4
                                 );
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar33)
                    != '\0') {
                  lVar33 = lVar33 + lVar29;
                  uVar6 = iVar9 + iVar16;
                  goto LAB_003001b8;
                }
                piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 + 0x10 +
                                 lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 4 +
                             *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar33)
                    == '\0') goto LAB_003001bd;
                piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + lVar28 + 0xc + lVar29 * 4
                                 );
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_ + lVar33)
                    != '\0') goto LAB_002fff8a;
                piVar36 = (int *)((long)local_2c8 +
                                 lVar29 * 4 + lVar28 + *local_290 * (long)plVar24 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar29 * 4 + lVar28 + *local_2f0 * (long)plVar24 + 8);
                piVar36 = (int *)((long)local_2c8 +
                                 lVar29 * 4 + lVar28 + *local_290 * (long)plVar24 + 0x10);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ +
                                 lVar29 * 4 + lVar28 + *local_2f0 * (long)plVar24 + 0x10);
LAB_00300037:
                uVar6 = TTA::MemMerge(uVar6,uVar8);
                plVar24 = local_270;
                plVar34 = local_190;
              }
              else {
                piVar36 = (int *)(local_1e0 + lVar28 + *local_1a8 * (long)plVar34 + 0xc + lVar29 * 4
                                 );
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar33)
                    != '\0') {
                  plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
                  piVar36 = (int *)((long)local_2c8 +
                                   lVar29 * 4 + lVar33 * 4 + *local_290 * (long)plVar24 + 8);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ +
                                   lVar29 * 4 + lVar33 * 4 + *local_2f0 * (long)plVar24 + 8);
                  plVar19 = (long *)(lVar33 + lVar29 + 2);
                  goto LAB_00301a98;
                }
                piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 + 0xc + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                lVar37 = lVar26 >> 0x1e;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar33) == '\0'
                   ) {
                  piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * lVar32);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * lVar32);
                  plVar19 = (long *)(lVar33 + lVar29 + 2);
                  plVar35 = (long *)(ulong)(uint)(iVar9 + iVar16);
                  goto LAB_00302806;
                }
                piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 + 0x10 +
                                 lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 4 +
                             *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar33)
                    == '\0') {
                  plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
                  lVar26 = lVar26 >> 0x20;
                  piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * lVar32);
                  plVar19 = (long *)(lVar33 + lVar29 + 2);
                  goto LAB_003011c1;
                }
                piVar36 = (int *)(*local_1a8 * (long)plVar24 + local_1e0 + lVar28 + 0xc + lVar29 * 4
                                 );
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar29 + 3 +
                             *(long *)local_258._80_8_ * (long)plVar24 + local_258._24_8_ + lVar33)
                    == '\0') {
                  piVar36 = (int *)((long)local_2c8 +
                                   lVar29 * 4 + lVar28 + *local_290 * (long)plVar24 + 0x10);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ +
                                   lVar29 * 4 + lVar28 + *local_2f0 * (long)plVar24 + 0x10);
                  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 + *local_290 * lVar32);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 + *local_2f0 * lVar32);
                  goto LAB_00300037;
                }
LAB_002fff8a:
                piVar36 = (int *)((long)local_2c8 +
                                 lVar29 * 4 + lVar28 + *local_290 * (long)plVar24 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar29 * 4 + lVar28 + *local_2f0 * (long)plVar24 + 8);
              }
              piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 + *local_290 * lVar32 + 8);
              *piVar36 = *piVar36 + 1;
              *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 + *local_2f0 * lVar32 + 8) = uVar6;
              lVar26 = lVar26 + 0x200000000;
              lVar37 = lVar29 + lVar33;
              lVar29 = lVar29 + 2;
              if ((long)local_278 <= lVar37 + 4) {
                uVar6 = (int)lVar29 + iVar7 + 2;
                iVar7 = iVar7 + (int)lVar29;
                break;
              }
            } while( true );
          }
          plVar19 = (long *)(ulong)uVar6;
          if ((int)local_180 < (int)uVar6) {
LAB_0030313e:
            lVar33 = (long)(int)plVar19;
            piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = 0;
            }
            else {
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32 + -8);
              *piVar36 = *piVar36 + 1;
              uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar32 + -8);
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = uVar15;
            }
            goto LAB_003037a6;
          }
          lVar33 = (long)(int)uVar6;
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
            piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + (long)iVar7 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)iVar7 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_)
                == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = 0;
              goto LAB_003037a6;
            }
LAB_00303d87:
            lVar28 = (long)((int)uVar30 + -3);
            piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
            piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
          }
          else {
            lVar29 = (long)((int)uVar30 + -2);
            lVar28 = (long)iVar7;
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 3 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) !=
                '\0') goto LAB_00303d87;
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
            piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
          }
          *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = uVar15;
          goto LAB_003037a6;
        }
        piVar36 = (int *)(local_1e0 + *local_1a8 * (long)plVar34 + 0xc + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) !=
            '\0') {
          piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * (long)plVar12);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * (long)plVar12);
          goto LAB_00301a98;
        }
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0')
        goto LAB_002fe82f;
        piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + (long)plVar19 * 4);
        *piVar36 = *piVar36 + 1;
        plVar35 = plVar31;
        if (*(char *)((long)plVar19 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_)
            == '\0') {
          uVar6 = TTA::MemNewLabel();
          plVar12 = local_270;
          plVar34 = local_190;
        }
        else {
          piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * (long)plVar12);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * (long)plVar12);
        }
LAB_00302806:
        piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar6;
        uVar6 = (int)plVar35 + 2;
        plVar31 = (long *)(ulong)uVar6;
      } while ((int)uVar6 < (int)local_180);
      lVar33 = (long)((int)plVar35 + 3);
    }
    lVar28 = (long)(int)uVar6;
    piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_);
    if ((int)local_180 < (int)uVar6) {
      if (cVar23 == '\0') {
LAB_00303772:
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0) = 0;
        goto LAB_003037a6;
      }
      lVar33 = (long)((int)uVar30 + -2);
      piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar28 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x00302c3d:
      if (cVar23 == '\0') {
LAB_00302c43:
        uVar6 = TTA::MemNewLabel();
LAB_00302c4b:
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0) = uVar6;
        goto LAB_003037a6;
      }
    }
    else {
      if ((cVar23 == '\0') &&
         (piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4), *piVar36 = *piVar36 + 1,
         *(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0'))
      goto LAB_00303772;
      lVar29 = (long)((int)uVar30 + -2);
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
        goto joined_r0x00302c3d;
      }
    }
LAB_00303711:
    lVar33 = (long)((int)uVar30 + -3);
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
    *piVar36 = *piVar36 + 1;
    uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
    *piVar36 = *piVar36 + 1;
LAB_0030375e:
    *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0) = uVar15;
    goto LAB_003037a6;
  }
  if (2 < iVar2) {
    lVar32 = (long)(int)local_180;
    iVar9 = -2;
    iVar7 = 0;
LAB_002e9781:
    lVar33 = (long)iVar7;
    piVar36 = (int *)(local_1e0 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(local_258._24_8_ + lVar33);
    piVar36 = (int *)(local_1e0 + 0xc + (long)iVar9 * 4);
    *piVar36 = *piVar36 + 1;
    cVar14 = *(char *)(local_258._24_8_ + 3 + (long)iVar9);
    iVar9 = iVar7;
    if (cVar23 != '\0') {
      uVar6 = TTA::MemNewLabel();
      if (cVar14 == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar33 * 4) = uVar6;
        goto LAB_002e9924;
      }
LAB_002e97de:
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar33 * 4) = uVar6;
      uVar20 = lVar33 + 2;
      if ((int)uVar20 < (int)local_180) {
        lVar33 = uVar20 * 4;
        lVar28 = 0;
        do {
          iVar16 = (int)lVar28;
          iVar9 = iVar16 + iVar7;
          piVar36 = (int *)(local_1e0 + lVar33 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + local_258._24_8_ + uVar20);
          piVar36 = (int *)(local_1e0 + (long)(iVar9 + 3) * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(local_258._24_8_ + (long)(iVar9 + 3));
          if (cVar23 == '\0') {
            if (cVar14 == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar33) = 0;
              goto LAB_002e991f;
            }
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33);
            *piVar36 = *piVar36 + 1;
          }
          else {
            if (cVar14 == '\0') goto LAB_002e98ab;
            piVar36 = (int *)((long)local_2c8 + (long)iVar9 * 4);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + (long)iVar9 * 4);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33);
            *piVar36 = *piVar36 + 1;
          }
          *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33) = uVar6;
          lVar29 = uVar20 + lVar28;
          lVar28 = lVar28 + 2;
          if (lVar32 <= lVar29 + 2) {
            uVar20 = (ulong)(iVar7 + (int)lVar28 + 2);
            iVar7 = iVar7 + (int)lVar28;
            break;
          }
        } while( true );
      }
      uVar30 = local_268;
      lVar32 = (long)(int)uVar20;
      piVar36 = (int *)(local_1e0 + lVar32 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(local_258._24_8_ + lVar32);
      if ((int)local_180 < (int)uVar20) {
        if (cVar23 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = 0;
        }
        else {
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4);
          piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = uVar15;
        }
      }
      else {
        lVar33 = (long)iVar7;
        piVar36 = (int *)(local_1e0 + 0xc + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        if (cVar23 == '\0') {
          if (*(char *)(local_258._24_8_ + 3 + lVar33) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = 0;
          }
          else {
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar32 * 4) = uVar6;
          }
        }
        else {
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4);
          piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = uVar15;
        }
      }
      goto LAB_003037a6;
    }
    if (cVar14 != '\0') {
      uVar6 = TTA::MemNewLabel();
      goto LAB_002e97de;
    }
    piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    *(undefined4 *)(local_340._24_8_ + lVar33 * 4) = 0;
    goto LAB_002e9924;
  }
  iVar7 = 0;
  lVar32 = 1;
  goto LAB_002e9ec8;
LAB_002e9b58:
  *(int *)((long)local_2c8 + lVar22) = *(int *)((long)local_2c8 + lVar22) + 1;
  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar22);
  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar37 * 4 + 8);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar37 * 4 + 8) = uVar15;
  uVar30 = (ulong)(uint)((int)lVar33 + (int)lVar29);
LAB_002e9bbd:
  iVar7 = (int)uVar30;
  iVar9 = iVar7 + 2;
  if (iVar9 < (int)local_180) {
    lVar28 = (long)iVar7;
    lVar26 = lVar28 << 0x20;
    lVar33 = lVar28 * 4;
    lVar29 = 0;
    do {
      lVar37 = local_1e0 + lVar33;
      piVar36 = (int *)(lVar37 + 8 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      lVar18 = local_258._24_8_ + lVar28;
      lVar27 = lVar26 >> 0x1e;
      if (*(char *)(lVar29 + 2 + lVar18) == '\0') {
        lVar22 = *local_1a8 + local_1e0;
        piVar36 = (int *)(lVar22 + lVar33 + 8 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        lVar11 = *(long *)local_258._80_8_ + local_258._24_8_;
        if (*(char *)(lVar29 + 2 + lVar11 + lVar28) == '\0') {
          piVar36 = (int *)(local_1e0 + (lVar26 + 0x300000000 >> 0x1e));
          *piVar36 = *piVar36 + 1;
          uVar30 = uVar30 + lVar29 + 2;
          lVar26 = lVar26 + 0x300000000 >> 0x20;
          if ((*(char *)(local_258._24_8_ + lVar26) != '\0') ||
             (piVar36 = (int *)(lVar22 + lVar26 * 4), *piVar36 = *piVar36 + 1,
             *(char *)(lVar11 + lVar26) != '\0')) {
LAB_002e9e34:
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33 + 8) = uVar6;
            goto LAB_002e9a0a;
          }
          lVar33 = lVar29 + lVar28 + 2;
          iVar7 = (int)uVar30;
          goto LAB_002e9e85;
        }
        piVar36 = (int *)(lVar37 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar29 + 3 + lVar18) != '\0') {
          piVar36 = (int *)(lVar22 + (lVar26 + 0x100000000 >> 0x1e));
          *piVar36 = *piVar36 + 1;
          uVar30 = uVar30 + lVar29 + 2;
          if (*(char *)(lVar11 + (lVar26 + 0x100000000 >> 0x20)) == '\0') {
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33 + 8) = uVar6;
          }
          else {
            *(int *)((long)local_2c8 + lVar27) = *(int *)((long)local_2c8 + lVar27) + 1;
            uVar15 = *(undefined4 *)(local_340._24_8_ + lVar27);
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 * 4 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar28 * 4 + 8) = uVar15;
          }
          goto LAB_002e9a0a;
        }
        piVar36 = (int *)(lVar22 + lVar33 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar29 + 1 + lVar11 + lVar28) == '\0') {
          uVar6 = TTA::MemNewLabel();
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33 + 8);
          *piVar36 = *piVar36 + 1;
        }
        else {
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33);
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33 + 8);
          *piVar36 = *piVar36 + 1;
        }
      }
      else {
        piVar36 = (int *)(*local_1a8 + 4 + lVar37 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(*(long *)local_258._80_8_ + 1 + lVar18 + lVar29);
        piVar36 = (int *)(lVar37 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar29 + 3 + lVar18);
        if (cVar23 == '\0') {
          if (cVar14 != '\0') {
            uVar30 = (ulong)((int)lVar29 + iVar7 + 2);
            goto LAB_002e9e34;
          }
          uVar6 = TTA::MemNewLabel();
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33 + 8);
          *piVar36 = *piVar36 + 1;
        }
        else {
          if (cVar14 != '\0') goto LAB_002e9d56;
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33);
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar33 + 8);
          *piVar36 = *piVar36 + 1;
        }
      }
      *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33 + 8) = uVar6;
      lVar26 = lVar26 + 0x200000000;
      lVar37 = lVar28 + lVar29;
      lVar29 = lVar29 + 2;
      if (lVar32 <= lVar37 + 4) {
        iVar9 = (int)lVar29 + iVar7 + 2;
        iVar7 = iVar7 + (int)lVar29;
        break;
      }
    } while( true );
  }
  uVar30 = local_268;
  lVar32 = (long)iVar9;
  piVar36 = (int *)(local_1e0 + lVar32 * 4);
  *piVar36 = *piVar36 + 1;
  if ((int)local_180 < iVar9) {
    if (*(char *)(local_258._24_8_ + lVar32) != '\0') {
      lVar33 = (long)iVar7;
      piVar36 = (int *)(local_1e0 + *local_1a8 + 4 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar33 + 1 + local_258._24_8_ + *(long *)local_258._80_8_) != '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4);
        goto LAB_002ea33a;
      }
      goto LAB_002ea2cb;
    }
    lVar33 = *local_1a8;
    piVar36 = (int *)(local_1e0 + lVar33 + lVar32 * 4);
    *piVar36 = *piVar36 + 1;
    lVar28 = *(long *)local_258._80_8_;
    if (*(char *)(lVar32 + local_258._24_8_ + lVar28) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = 0;
      goto LAB_002ea395;
    }
    piVar36 = (int *)(local_1e0 + lVar33 + 4 + (long)iVar7 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(local_258._24_8_ + lVar28 + 1 + (long)iVar7);
  }
  else {
    if (*(char *)(local_258._24_8_ + lVar32) != '\0') {
      lVar33 = (long)iVar7;
      piVar36 = (int *)(*local_1a8 + local_1e0 + 4 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar33 + 1 + local_258._24_8_ + *(long *)local_258._80_8_);
      piVar36 = (int *)(local_1e0 + 0xc + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      if (cVar23 == '\0') goto LAB_002ea2cb;
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4);
      goto LAB_002ea33a;
    }
    lVar28 = *local_1a8 + local_1e0;
    piVar36 = (int *)(lVar28 + lVar32 * 4);
    *piVar36 = *piVar36 + 1;
    lVar29 = *(long *)local_258._80_8_ + local_258._24_8_;
    cVar23 = *(char *)(lVar32 + lVar29);
    lVar33 = (long)iVar7;
    piVar36 = (int *)(local_1e0 + 0xc + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    if (cVar23 == '\0') {
      if ((*(char *)(local_258._24_8_ + 3 + lVar33) == '\0') &&
         (piVar36 = (int *)(lVar28 + 0xc + lVar33 * 4), *piVar36 = *piVar36 + 1,
         *(char *)(lVar29 + 3 + lVar33) == '\0')) {
        piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = 0;
      }
      else {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar32 * 4) = uVar6;
      }
      goto LAB_002ea395;
    }
    piVar36 = (int *)(lVar28 + 4 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar29 + 1 + lVar33);
  }
  if (cVar23 == '\0') {
LAB_002ea2cb:
    uVar6 = TTA::MemNewLabel();
    piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar32 * 4) = uVar6;
    goto LAB_002ea395;
  }
  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4);
  *piVar36 = *piVar36 + 1;
  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4);
LAB_002ea33a:
  piVar36 = (int *)((long)local_2c8 + lVar32 * 4);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + lVar32 * 4) = uVar15;
  goto LAB_002ea395;
LAB_002e9d56:
  *(int *)((long)local_2c8 + lVar27) = *(int *)((long)local_2c8 + lVar27) + 1;
  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar27);
  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 * 4 + 8);
  *piVar36 = *piVar36 + 1;
  uVar30 = (ulong)((int)lVar29 + iVar7 + 2);
  *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar28 * 4 + 8) = uVar15;
  goto LAB_002e9a0a;
LAB_002ec603:
  piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  plVar35 = (long *)(ulong)(uint)(iVar9 + iVar16);
  uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * uVar20);
  plVar12 = (long *)(lVar26 + lVar37 + 2);
  uVar17 = local_268;
LAB_002f6327:
  lVar33 = local_260;
  uVar30 = local_268;
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  iVar7 = (int)plVar35;
  uVar6 = iVar7 + 2;
  if ((int)uVar6 < (int)local_180) {
    local_158 = uVar20 - 1;
    local_150 = local_2c8;
    local_160 = (long *)local_340._24_8_;
    local_148 = uVar20 | 1;
    plVar19 = (long *)(long)iVar7;
    plVar31 = (long *)((long)plVar19 + 2);
    lVar37 = (long)plVar19 << 0x20;
    lVar28 = local_1e0 + (long)plVar19 * 4;
    local_178 = (long *)(local_1e0 + *local_1a8 * uVar20 + (long)plVar19 * 4 + 8);
    lVar26 = *(long *)local_258._80_8_;
    lVar29 = (long)plVar19 * 4;
    lVar18 = 8;
    lVar27 = 0;
    do {
      piVar36 = (int *)((long)local_178 + lVar27 * 4);
      *piVar36 = *piVar36 + 1;
      lVar22 = lVar37 >> 0x1e;
      lVar11 = lVar37 >> 0x20;
      iVar9 = (int)plVar31;
      plVar34 = local_270;
      lVar32 = local_260;
      piVar25 = local_278;
      local_188 = plVar35;
      local_170 = plVar31;
      local_168 = plVar19;
      if (*(char *)((long)plVar19 + lVar27 + local_258._24_8_ + lVar26 * uVar20 + 2) == '\0') {
        piVar36 = (int *)(*local_1a8 * (long)local_270 + lVar28 + 8 + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 2 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_) ==
            '\0') {
          plVar12 = (long *)((long)plVar31 + lVar27);
          piVar36 = (int *)((lVar37 + 0x300000000 >> 0x1e) + *local_1a8 * uVar20 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar28 = lVar37 + 0x300000000 >> 0x20;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
            piVar36 = (int *)(*local_1a8 * local_148 + local_1e0 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + local_148 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0'
               ) {
              piVar36 = (int *)((long)local_2c8 +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
              *piVar36 = *piVar36 + 1;
              plVar31 = (long *)(local_340._24_8_ + lVar18 + (long)plVar19 * 4 + *local_2f0 * uVar20
                                );
              plVar35 = local_270;
              goto LAB_002ef206;
            }
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) =
                 uVar6;
            plVar34 = local_270;
            goto LAB_002f0539;
          }
          piVar36 = (int *)(*local_1a8 * local_158 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * local_158 + local_258._24_8_) != '\0')
          {
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
            goto LAB_002f9bc0;
          }
          piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) + *local_1a8 * local_158 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar28 = lVar37 + 0x400000000 >> 0x20;
          if (*(char *)(lVar28 + local_158 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
          {
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) =
                 uVar6;
            plVar34 = local_270;
            goto LAB_002f1a41;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
          piVar36 = (int *)((long)local_2c8 +
                           lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)
           (local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002eb76f;
        }
        piVar36 = (int *)(*local_1a8 * uVar20 + lVar28 + 0xc + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar22 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 +
                           lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          plVar12 = (long *)(ulong)(uint)(iVar9 + (int)lVar27);
          *(undefined4 *)
           (local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002f37bd;
        }
        piVar36 = (int *)(*local_1a8 * (long)local_278 + lVar28 + 0xc + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 3 + *(long *)local_258._80_8_ * (long)local_278 + local_258._24_8_) !=
            '\0') goto LAB_002f7075;
        piVar36 = (int *)(*local_1a8 * (long)local_278 + lVar28 + 0x10 + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 4 + *(long *)local_258._80_8_ * (long)local_278 + local_258._24_8_) !=
            '\0') {
          piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + (long)plVar19 * 4 + 0xc +
                           lVar27 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)plVar19 +
                       lVar27 + 3 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) ==
              '\0') {
LAB_002f7362:
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 0x10);
            piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * uVar20));
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            lVar32 = local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * uVar20;
LAB_002f7adb:
            plVar12 = (long *)((long)plVar31 + lVar27);
            *(uint *)(lVar32 + 8 + lVar27 * 4) = uVar6;
            plVar34 = local_270;
          }
          else {
            piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + (long)plVar19 * 4 + 8 +
                             lVar27 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)plVar19 +
                         lVar27 + 2 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) ==
                '\0') goto LAB_002f7a28;
            piVar36 = (int *)(lVar22 + *local_1a8 * local_158 + local_1e0);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar11 + local_158 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0'
               ) goto LAB_002f72ed;
LAB_002f6de0:
            lVar32 = uVar20 - 2;
            piVar36 = (int *)((lVar37 + 0x100000000 >> 0x1e) + *local_1a8 * lVar32 + local_1e0);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((lVar37 + 0x100000000 >> 0x20) +
                         *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + lVar32 * *local_2f0);
              piVar36 = (int *)((long)local_2c8 +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
              goto LAB_002f920f;
            }
            piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)(local_340._24_8_ + lVar11 * 4 + lVar32 * *local_2f0);
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)
             (local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
LAB_002f9252:
            plVar12 = (long *)((long)plVar31 + lVar27);
            plVar34 = local_270;
          }
          goto LAB_002eb76f;
        }
      }
      else {
        piVar36 = (int *)(*local_1a8 * (long)local_278 + lVar28 + 0xc + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 3 + *(long *)local_258._80_8_ * (long)local_278 + local_258._24_8_) !=
            '\0') {
          piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + (long)plVar19 * 4 + 8 + lVar27 * 4)
          ;
          *piVar36 = *piVar36 + 1;
          plVar31 = (long *)((long)plVar31 + lVar27);
          if (*(char *)((long)plVar19 +
                       lVar27 + 2 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * uVar20));
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            lVar32 = *local_2f0;
          }
          else {
            piVar36 = (int *)(lVar22 + *local_1a8 * local_158 + local_1e0);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar11 + *(long *)local_258._80_8_ * local_158 + local_258._24_8_) == '\0'
               ) {
              piVar36 = (int *)((long)local_2c8 +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * uVar20);
            }
            else {
              lVar32 = uVar20 - 2;
              piVar36 = (int *)((lVar37 + 0x100000000 >> 0x1e) + *local_1a8 * lVar32 + local_1e0);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((lVar37 + 0x100000000 >> 0x20) +
                           *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar32);
                *piVar36 = *piVar36 + 1;
                uVar15 = *(undefined4 *)(local_340._24_8_ + lVar11 * 4 + lVar32 * *local_2f0);
                piVar36 = (int *)((long)local_2c8 +
                                 lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)
                 (local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) =
                     uVar15;
                goto LAB_002ea5ba;
              }
              piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + lVar32 * *local_2f0);
              piVar36 = (int *)((long)local_2c8 +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ +
                               lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
            }
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            lVar32 = *local_2f0;
          }
          *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + lVar32 * uVar20 + 8) = uVar6
          ;
          piVar25 = local_278;
          plVar34 = local_270;
          goto LAB_002ea5ba;
        }
        piVar36 = (int *)(*local_1a8 * uVar20 + lVar28 + 0xc + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          plVar31 = (long *)(ulong)(uint)(iVar9 + (int)lVar27);
          uVar6 = *(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * uVar20);
          plVar12 = (long *)((long)plVar19 + lVar27 + 2);
          goto LAB_002f50ec;
        }
        piVar36 = (int *)(*local_1a8 * (long)local_278 + lVar28 + 0x10 + lVar27 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar19 +
                     lVar27 + 4 + *(long *)local_258._80_8_ * (long)local_278 + local_258._24_8_) !=
            '\0') {
          piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + (long)plVar19 * 4 + 0xc +
                           lVar27 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)plVar19 +
                       lVar27 + 3 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) ==
              '\0') goto LAB_002f7362;
          piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + (long)plVar19 * 4 + 8 + lVar27 * 4)
          ;
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)plVar19 +
                       lVar27 + 2 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) !=
              '\0') {
            piVar36 = (int *)(lVar22 + *local_1a8 * local_158 + local_1e0);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar11 + *(long *)local_258._80_8_ * local_158 + local_258._24_8_) != '\0'
               ) goto LAB_002f6de0;
LAB_002f72ed:
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * uVar20);
LAB_002f920f:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 +
                             lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) =
                 uVar6;
            goto LAB_002f9252;
          }
LAB_002f7a28:
          piVar36 = (int *)((long)local_2c8 +
                           lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ +
                           lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * uVar20));
          piVar36 = (int *)((long)local_2c8 +
                           lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          lVar32 = local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * uVar20;
          goto LAB_002f7adb;
        }
      }
      piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * uVar20 + lVar29);
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar27 * 4 + *local_2f0 * uVar20 + lVar29);
      piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * uVar20 + lVar29 + 8);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar27 * 4 + *local_2f0 * uVar20 + lVar29 + 8) = uVar15;
      lVar37 = lVar37 + 0x200000000;
      lVar18 = lVar18 + 8;
      lVar22 = lVar27 + 4;
      lVar27 = lVar27 + 2;
      if ((long)local_190 <= (long)plVar19 + lVar22) {
        plVar35 = (long *)(ulong)(uint)(iVar7 + (int)lVar27);
        uVar6 = iVar9 + (int)lVar27;
        uVar17 = local_268;
        break;
      }
    } while( true );
  }
  plVar12 = (long *)(ulong)uVar6;
  uVar30 = uVar17;
  if ((int)local_180 < (int)uVar6) goto LAB_002f666b;
  lVar29 = (long)(int)uVar6;
  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar29 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar29 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
    piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar29 + *(long *)local_258._80_8_ * (uVar20 | 1) + local_258._24_8_);
    lVar28 = (long)(int)plVar35;
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
    if (cVar23 == '\0') {
LAB_002f6a70:
      if (cVar14 == '\0') goto LAB_002f6ab4;
      piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      lVar33 = lVar32;
      if (*(char *)(lVar28 + 3 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) ==
          '\0') goto LAB_002f6aee;
      goto LAB_002ebd08;
    }
    if (cVar14 == '\0') goto LAB_002f6a07;
    lVar33 = *local_1a8 * (uVar20 - 1);
  }
  else {
    lVar33 = *local_1a8 * (uVar20 - 1);
  }
  lVar26 = uVar20 - 1;
  lVar28 = (long)(int)plVar35;
  piVar36 = (int *)(lVar33 + local_1e0 + 0xc + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0')
  goto LAB_002f6a07;
  lVar33 = uVar20 - 2;
  piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + lVar29 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar29 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
LAB_002f1d2a:
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + (uVar20 - 2) * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20));
    lVar33 = lVar32;
    goto LAB_002f1d88;
  }
  piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar28 + lVar26 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar33);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33 * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f7c9a:
    uVar6 = TTA::MemMerge(uVar6,uVar8);
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
  }
  else {
    piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
      piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar33);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar33 * *local_2f0);
      goto LAB_002f7c9a;
    }
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
  }
  *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20) = uVar6;
  uVar30 = local_268;
  piVar25 = local_278;
  goto LAB_002fc8b3;
LAB_002f7075:
  piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + (long)plVar19 * 4 + 8 + lVar27 * 4);
  *piVar36 = *piVar36 + 1;
  plVar12 = (long *)((long)plVar31 + lVar27);
  if (*(char *)((long)plVar19 +
               lVar27 + 2 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8)
    ;
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8
                     );
    piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * uVar20));
    piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + (long)local_168 * 4 + *local_290 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)local_168 * 4 + *local_2f0 * uVar20 + 8) = uVar6
    ;
    piVar25 = local_278;
    plVar34 = local_270;
    goto LAB_002eaece;
  }
  piVar36 = (int *)(lVar22 + *local_1a8 * local_158 + local_1e0);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar11 + local_158 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8)
    ;
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8
                     );
    piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * uVar20);
LAB_002f9ba9:
    uVar6 = TTA::MemMerge(uVar6,uVar8);
LAB_002f9bc0:
    piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
  }
  else {
    lVar33 = uVar20 - 2;
    piVar36 = (int *)((lVar37 + 0x100000000 >> 0x1e) + *local_1a8 * lVar33 + local_1e0);
    *piVar36 = *piVar36 + 1;
    if (*(char *)((lVar37 + 0x100000000 >> 0x20) +
                 *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar33);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + lVar33 * *local_2f0);
      piVar36 = (int *)((long)local_2c8 +
                       lVar27 * 4 + (long)plVar19 * 4 + *local_290 * local_260 + 8);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ +
                       lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * local_260 + 8);
      goto LAB_002f9ba9;
    }
    piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar33);
    *piVar36 = *piVar36 + 1;
    uVar15 = *(undefined4 *)(local_340._24_8_ + lVar11 * 4 + lVar33 * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + (long)plVar19 * 4 + *local_290 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    *(undefined4 *)(local_340._24_8_ + lVar27 * 4 + (long)plVar19 * 4 + *local_2f0 * uVar20 + 8) =
         uVar15;
  }
  plVar12 = (long *)((long)plVar31 + lVar27);
  piVar25 = local_278;
  plVar34 = local_270;
LAB_002eaece:
  iVar7 = (int)plVar12;
  uVar6 = iVar7 + 2;
  lVar33 = lVar32;
  plVar35 = plVar34;
  if ((int)uVar6 < (int)local_180) {
    plVar35 = (long *)(uVar20 - 1);
    lVar29 = (long)iVar7;
    local_188 = (long *)(lVar29 + 2);
    lVar18 = lVar29 << 0x20;
    lVar28 = lVar29 * 4;
    lVar26 = 8;
    lVar37 = 0;
    do {
      lVar33 = local_260;
      uVar30 = local_268;
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 + 8 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      lVar27 = lVar18 >> 0x1e;
      plVar34 = local_270;
      lVar32 = local_260;
      if (*(char *)(lVar37 + 2 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ + lVar29) !=
          '\0') {
        piVar36 = (int *)((lVar18 + 0x300000000 >> 0x1e) + *local_1a8 * (long)plVar35 + local_1e0);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)((long)local_188 + lVar37);
        lVar28 = lVar18 + 0x300000000 >> 0x20;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)plVar35 + local_258._24_8_) != '\0'
           ) {
          piVar36 = (int *)(local_1e0 + *local_1a8 * (long)piVar25 + lVar29 * 4 + 8 + lVar37 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar37 + 2 +
                       *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ + lVar29) ==
              '\0') {
            piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar29 * 4 + 8 + lVar37 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar37 + 2 +
                         *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar29) == '\0')
            {
              piVar36 = (int *)((long)local_2c8 +
                               lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              local_188 = plVar31;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20)
                                   );
              lVar32 = *local_290;
              piVar25 = local_278;
            }
            else {
              piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * (uVar20 - 2));
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar27 + (uVar20 - 2) * *local_2f0);
              lVar32 = *local_290;
              local_188 = plVar31;
            }
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + lVar32 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            plVar31 = local_188;
            plVar34 = local_270;
          }
          else {
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8
                             );
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)
                      (local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) =
                 uVar15;
            local_188 = plVar31;
          }
          goto LAB_002ea5ba;
        }
        piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        plVar12 = (long *)(lVar37 + lVar29 + 2);
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
          local_188 = plVar31;
          goto LAB_002f50ec;
        }
        piVar36 = (int *)((lVar18 + 0x400000000 >> 0x1e) + *local_1a8 * (long)plVar35 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar26 = lVar18 + 0x400000000 >> 0x20;
        if (*(char *)(lVar26 + (long)plVar35 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
LAB_002ede5b:
          local_188 = (long *)((long)local_188 + lVar37);
          plVar35 = local_188;
          uVar17 = local_268;
          goto LAB_002f6327;
        }
        lVar32 = uVar20 - 2;
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0') {
LAB_002ecca7:
          local_188 = (long *)((long)local_188 + lVar37);
          piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar29 * 4 + 8 + lVar37 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar37 + 2 +
                       *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ + lVar29) ==
              '\0') {
            piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar29 * 4 + 8 + lVar37 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar37 + 2 +
                         *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar29) == '\0')
            {
              piVar36 = (int *)((long)local_2c8 +
                               lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20)
                                   );
              lVar32 = *local_290;
            }
            else {
              piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * (uVar20 - 2));
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar27 + (uVar20 - 2) * *local_2f0);
              lVar32 = *local_290;
            }
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + lVar32 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            plVar12 = local_188;
            plVar34 = local_270;
          }
          else {
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8
                             );
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)
                      (local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) =
                 uVar15;
            plVar12 = local_188;
          }
          goto LAB_002eb76f;
        }
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0);
        lVar32 = *local_290;
LAB_002ee286:
        local_188 = (long *)((long)local_188 + lVar37);
        piVar36 = (int *)((long)local_2c8 + lVar27 + lVar32 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20));
        lVar32 = *local_290;
        goto LAB_002ee2c8;
      }
      piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar28 + 8 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar37 + 2 +
                        *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_ + lVar29);
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 + 0xc + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)(lVar37 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ + lVar29
                        );
      if (cVar23 == '\0') {
        if (cVar14 == '\0') {
          piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar29 * 4 + 0xc + lVar37 * 4
                           );
          *piVar36 = *piVar36 + 1;
          uVar13 = (long)local_188 + lVar37;
          if (*(char *)(lVar37 + 3 +
                       *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_ + lVar29) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            plVar31 = (long *)(local_340._24_8_ + lVar26 + lVar29 * 4 + *local_2f0 * uVar20);
            plVar12 = (long *)(uVar13 & 0xffffffff);
            plVar35 = local_270;
            goto LAB_002ef206;
          }
          uVar6 = TTA::MemNewLabel();
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          plVar12 = (long *)(uVar13 & 0xffffffff);
          uVar30 = local_268;
          lVar32 = local_260;
          plVar34 = local_270;
          goto LAB_002f0539;
        }
        piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar28 + 0xc + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 3 +
                     *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ + lVar29) == '\0')
        goto LAB_002ecebb;
LAB_002eb142:
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar28 + *local_290 * local_260 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar28 + *local_2f0 * local_260 + 8);
      }
      else {
        if (cVar14 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = (int)local_188 + (int)lVar37;
          lVar32 = local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20;
          goto LAB_002ed345;
        }
        piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar28 + 0xc + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 3 +
                     *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ + lVar29) == '\0')
        {
          piVar36 = (int *)((lVar18 + 0x400000000 >> 0x1e) + *local_1a8 * (long)plVar35 + local_1e0)
          ;
          *piVar36 = *piVar36 + 1;
          lVar28 = lVar18 + 0x400000000 >> 0x20;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)plVar35 + local_258._24_8_) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            plVar12 = (long *)(lVar37 + lVar29 + 2);
            uVar6 = *(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
            goto LAB_002ede5b;
          }
          piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar29 * 4 + 0xc + lVar37 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar37 + 3 +
                       *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar29) != '\0')
          goto LAB_002ecca7;
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
          lVar32 = *local_290;
          goto LAB_002ee286;
        }
        piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar28 + 8 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 2 +
                     *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ + lVar29) != '\0')
        goto LAB_002eb142;
        piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar28 + 8 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 2 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar29
                     ) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar28 + *local_290 * local_260 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar28 + *local_2f0 * local_260 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar28 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          local_178 = plVar35;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                               lVar37 * 4 + lVar28 + *local_2f0 * uVar20));
          plVar35 = local_178;
          piVar25 = local_278;
        }
        else {
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar28 + *local_290 * local_260);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar28 + *local_2f0 * local_260);
        }
      }
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar28 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar28 + *local_2f0 * uVar20 + 8) = uVar6;
      lVar18 = lVar18 + 0x200000000;
      lVar26 = lVar26 + 8;
      lVar32 = lVar37 + lVar29;
      lVar37 = lVar37 + 2;
      if ((long)local_190 <= lVar32 + 4) {
        iVar7 = iVar7 + (int)lVar37;
        uVar6 = (int)local_188 + (int)lVar37;
        uVar30 = local_268;
        lVar33 = local_260;
        plVar35 = local_270;
        break;
      }
    } while( true );
  }
  lVar32 = lVar33;
  plVar34 = plVar35;
  if ((int)local_180 < (int)uVar6) goto LAB_002f1c9c;
  lVar28 = (long)(int)uVar6;
  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
    lVar32 = *local_1a8 * (uVar20 - 1) + local_1e0;
    lVar29 = (long)iVar7;
    goto LAB_002ec497;
  }
  piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * (uVar20 | 1) + local_258._24_8_);
  lVar29 = (long)iVar7;
  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
  *piVar36 = *piVar36 + 1;
  cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
  if (cVar23 == '\0') goto joined_r0x002fbf54;
  if (cVar14 == '\0') goto LAB_002fbd19;
  goto LAB_002ec47c;
LAB_002ecebb:
  lVar28 = lVar18 + 0x400000000 >> 0x20;
  piVar36 = (int *)((lVar18 + 0x400000000 >> 0x1e) + *local_1a8 * (long)plVar35 + local_1e0);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(lVar28 + (long)plVar35 * *(long *)local_258._80_8_ + local_258._24_8_);
  piVar36 = (int *)(*local_1a8 * (long)piVar25 + local_1e0 + lVar29 * 4 + 8 + lVar37 * 4);
  *piVar36 = *piVar36 + 1;
  local_188 = (long *)((long)local_188 + lVar37);
  cVar14 = *(char *)(lVar37 + 2 +
                    *(long *)local_258._80_8_ * (long)piVar25 + local_258._24_8_ + lVar29);
  if (cVar23 == '\0') {
    if (cVar14 != '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8);
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)
                (local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar15
      ;
      plVar12 = local_188;
      goto LAB_002f27a1;
    }
    uVar6 = TTA::MemNewLabel();
    piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
    lVar32 = local_260;
    plVar12 = local_188;
    plVar34 = local_270;
LAB_002f1a41:
    iVar7 = (int)plVar12;
    uVar6 = iVar7 + 2;
    if ((int)uVar6 < (int)local_180) {
      lVar18 = (long)iVar7;
      local_188 = (long *)(lVar18 + 2);
      lVar26 = lVar18 << 0x20;
      lVar29 = lVar18 * 4;
      lVar28 = 8;
      lVar37 = 0;
LAB_002f1a7d:
      lVar33 = local_260;
      uVar30 = local_268;
      plVar34 = local_270;
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar29 + 8 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      lVar27 = lVar26 >> 0x1e;
      lVar32 = local_260;
      piVar25 = local_278;
      if (*(char *)(lVar37 + 2 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ + lVar18) !=
          '\0') {
        plVar31 = (long *)((long)local_188 + lVar37);
        lVar28 = uVar20 - 1;
        piVar36 = (int *)((lVar26 + 0x300000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar29 = lVar26 + 0x300000000 >> 0x20;
        if (*(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * local_260 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * local_260 + 8)
          ;
          piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20));
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          uVar30 = local_268;
          piVar25 = local_278;
          plVar31 = (long *)((ulong)plVar31 & 0xffffffff);
          plVar34 = local_270;
          goto LAB_002ea5ba;
        }
        piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        plVar12 = (long *)(lVar18 + lVar37 + 2);
        if (*(char *)(lVar29 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
          goto LAB_002f50ec;
        }
        piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar26 = lVar26 + 0x400000000 >> 0x20;
        if (*(char *)(lVar26 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
          lVar32 = uVar20 - 2;
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0);
LAB_002f2725:
            uVar13 = (long)local_188 + lVar37;
            piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20));
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            lVar33 = local_260;
            plVar12 = (long *)(uVar13 & 0xffffffff);
            plVar34 = local_270;
          }
          else {
LAB_002f2549:
            uVar13 = (long)local_188 + lVar37;
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * local_260 + 8
                             );
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar37 * 4 + lVar18 * 4 + *local_2f0 * local_260 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20));
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            plVar12 = (long *)(uVar13 & 0xffffffff);
            plVar34 = local_270;
          }
          goto LAB_002eb76f;
        }
        piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
LAB_002f26d5:
        plVar35 = (long *)((long)local_188 + lVar37);
        uVar17 = local_268;
        goto LAB_002f6327;
      }
      piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar29 + 8 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar37 + 2 +
                   *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_ + lVar18) != '\0')
      {
        uVar13 = (long)local_188 + lVar37;
        piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + (lVar26 + 0x300000000 >> 0x1e));
        *piVar36 = *piVar36 + 1;
        lVar28 = lVar26 + 0x300000000 >> 0x20;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) =
               uVar15;
          plVar12 = (long *)(uVar13 & 0xffffffff);
          goto LAB_002f37bd;
        }
        lVar29 = uVar20 - 1;
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) + *local_1a8 * lVar29 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar26 = lVar26 + 0x400000000 >> 0x20;
          if (*(char *)(lVar26 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            plVar12 = (long *)(lVar18 + lVar37 + 2);
            uVar6 = *(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20);
            goto LAB_002f26d5;
          }
          lVar32 = uVar20 - 2;
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0);
            goto LAB_002f2725;
          }
          goto LAB_002f2549;
        }
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * local_260 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * local_260 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar27 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar27 + *local_2f0 * uVar20));
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        plVar12 = (long *)(uVar13 & 0xffffffff);
        lVar32 = lVar33;
        piVar25 = local_278;
        plVar34 = local_270;
        goto LAB_002eaece;
      }
      piVar36 = (int *)(local_1e0 + lVar29 + *local_1a8 * uVar20 + 0xc + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      iVar16 = (int)lVar37;
      iVar9 = (int)local_188;
      if (*(char *)(lVar37 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_ + lVar18) ==
          '\0') goto LAB_002f20e7;
      piVar36 = (int *)(*local_1a8 * (long)local_278 + local_1e0 + lVar29 + 0xc + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar37 + 3 +
                   *(long *)local_258._80_8_ * (long)local_278 + local_258._24_8_ + lVar18) == '\0')
      {
        piVar36 = (int *)(*local_1a8 * (long)local_278 + local_1e0 + lVar29 + 0x10 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 4 +
                     *(long *)local_258._80_8_ * (long)local_278 + local_258._24_8_ + lVar18) !=
            '\0') {
          piVar36 = (int *)((long)local_2c8 +
                           lVar37 * 4 + lVar18 * 4 + *local_290 * local_260 + 0x10);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)
                    (local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * local_260 + 0x10);
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          plVar12 = (long *)(ulong)(uint)(iVar9 + iVar16);
          *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) =
               uVar15;
          goto LAB_002eb76f;
        }
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 + *local_2f0 * uVar20 + 8) = uVar6;
        lVar26 = lVar26 + 0x200000000;
        lVar28 = lVar28 + 8;
        lVar32 = lVar18 + lVar37;
        lVar37 = lVar37 + 2;
        if ((long)local_190 <= lVar32 + 4) {
          iVar7 = iVar7 + (int)lVar37;
          uVar6 = (int)local_188 + (int)lVar37;
          uVar30 = local_268;
          lVar32 = local_260;
          plVar34 = local_270;
          goto LAB_002f1c8b;
        }
        goto LAB_002f1a7d;
      }
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * local_260 + 8);
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)
                (local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * local_260 + 8);
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = iVar9 + iVar16;
      *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) = uVar15
      ;
LAB_002f222c:
      plVar12 = (long *)(ulong)uVar6;
      uVar30 = local_268;
      lVar32 = local_260;
      plVar34 = local_270;
      goto LAB_002eaece;
    }
LAB_002f1c8b:
    piVar25 = local_278;
    if ((int)local_180 < (int)uVar6) goto LAB_002f1c9c;
    lVar29 = (long)(int)uVar6;
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    lVar28 = (long)iVar7;
    if (*(char *)(lVar29 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar29 + *(long *)local_258._80_8_ * (uVar20 | 1) + local_258._24_8_);
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      if (cVar23 == '\0') goto LAB_002f6a70;
      if (cVar14 == '\0') goto LAB_002f6a07;
    }
    piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 3 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) != '\0')
    goto LAB_002f1d2a;
    goto LAB_002f6a07;
  }
  lVar32 = uVar20 - 2;
  if (cVar14 == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
    lVar32 = *local_290;
LAB_002ee2c8:
    piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + lVar32 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
    lVar33 = local_260;
    plVar12 = local_188;
    plVar34 = local_270;
  }
  else {
    piVar36 = (int *)(*local_1a8 * local_260 + local_1e0 + lVar29 * 4 + 0xc + lVar37 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar37 + 3 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_ + lVar29) ==
        '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0));
    }
    else {
      piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * local_260 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * local_260 + 8);
    }
    piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar29 * 4 + *local_290 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar29 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
    plVar12 = local_188;
    plVar34 = local_270;
  }
  goto LAB_002eb76f;
LAB_002f20e7:
  piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar18 * 4 + 0xc + lVar37 * 4);
  *piVar36 = *piVar36 + 1;
  uVar6 = iVar9 + iVar16;
  if (*(char *)(lVar37 + 3 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_ + lVar18
               ) == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
    *piVar36 = *piVar36 + 1;
    lVar32 = local_340._24_8_ + lVar18 * 4 + *local_2f0 * uVar20;
LAB_002f249b:
    plVar31 = (long *)(lVar32 + lVar28);
    plVar12 = (long *)(ulong)uVar6;
    uVar30 = local_268;
    lVar33 = local_260;
    plVar35 = local_270;
LAB_002ef206:
    lVar32 = local_260;
    plVar34 = local_270;
    *(undefined4 *)plVar31 = 0;
    uVar6 = (int)plVar12 + 2;
    plVar31 = (long *)(ulong)uVar6;
    if ((int)local_180 <= (int)uVar6) {
LAB_002ef369:
      lVar28 = (long)(int)plVar31;
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      iVar7 = (int)plVar12;
      lVar32 = lVar33;
      if ((int)local_180 < (int)plVar31) {
        if (cVar23 == '\0') {
          piVar36 = (int *)(local_1e0 + *local_1a8 * (uVar20 | 1) + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_);
          plVar34 = plVar35;
          goto joined_r0x002f4666;
        }
        lVar32 = uVar20 - 1;
        piVar36 = (int *)(local_1e0 + *local_1a8 * lVar32 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0')
        goto LAB_002fc21e;
        lVar29 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar29 + 1 + lVar32 * *(long *)local_258._80_8_ + local_258._24_8_);
      }
      else {
        if (cVar23 == '\0') {
          piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * (uVar20 | 1) + local_258._24_8_);
          lVar29 = (long)iVar7;
          piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
          if (cVar23 == '\0') goto joined_r0x002fbf54;
          if (cVar14 == '\0') goto LAB_002fc868;
          goto LAB_002fbf5a;
        }
        lVar26 = uVar20 - 1;
        lVar29 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
        if (cVar23 != '\0') {
          if (cVar14 != '\0') goto LAB_002fc21e;
          piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 1 + lVar26 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
          goto LAB_002ec4fb;
          goto LAB_002fbc01;
        }
joined_r0x002f41fe:
        if (cVar14 != '\0') goto LAB_002fc21e;
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar29 + 1 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_)
        ;
      }
      if (cVar23 == '\0') goto LAB_002fc868;
      goto LAB_002fbf07;
    }
    lVar28 = *local_1a8;
    lVar29 = *(long *)local_258._80_8_;
    uVar13 = uVar20 | 1;
    lVar26 = (long)(int)plVar12;
    plVar31 = (long *)(lVar26 + 2);
LAB_002ef27c:
    plVar12 = plVar31;
    piVar36 = (int *)(lVar28 * uVar20 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    uVar30 = local_268;
    lVar33 = lVar32;
    piVar25 = local_278;
    if (*(char *)(lVar29 * uVar20 + local_258._24_8_ + (long)plVar12) != '\0') goto LAB_002ef5d0;
    piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) != '\0') {
      lVar28 = (lVar26 << 0x20) + 0x300000000;
      piVar36 = (int *)((lVar28 >> 0x1e) + *local_1a8 * uVar20 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar28 = lVar28 >> 0x20;
      if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        uVar30 = local_268;
        lVar32 = local_260;
        piVar25 = local_278;
        plVar34 = local_270;
        goto LAB_002f37bd;
      }
      lVar29 = uVar20 - 1;
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0') {
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002eaece;
      }
      lVar26 = (lVar26 << 0x20) + 0x400000000;
      piVar36 = (int *)((lVar26 >> 0x1e) + *local_1a8 * lVar29 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar26 = lVar26 >> 0x20;
      cVar23 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)((long)plVar12 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
      if (cVar23 == '\0') {
        if (cVar14 != '\0') goto LAB_002fdc43;
LAB_002f00a7:
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        goto LAB_002f1a41;
      }
      lVar29 = uVar20 - 2;
      if (cVar14 == '\0') goto LAB_002f0499;
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0')
      goto LAB_002f4d78;
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar29);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar29);
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar29);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar29 * *local_2f0);
LAB_002efeeb:
      uVar6 = TTA::MemMerge(uVar6,uVar8);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      goto LAB_002eb76f;
    }
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) != '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        uVar30 = local_268;
        lVar32 = local_260;
        plVar34 = local_270;
        goto LAB_002f0539;
      }
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = 0;
      plVar31 = (long *)((long)plVar12 + 2);
      lVar26 = lVar26 + 2;
      lVar33 = local_260;
      plVar35 = local_270;
      if ((long)local_190 <= (long)plVar31) goto LAB_002ef369;
      goto LAB_002ef27c;
    }
    lVar28 = uVar20 - 1;
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
      goto LAB_002eaece;
    }
    lVar29 = (lVar26 << 0x20) + 0x400000000;
    piVar36 = (int *)((lVar29 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
    *piVar36 = *piVar36 + 1;
    lVar29 = lVar29 >> 0x20;
    cVar23 = *(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    cVar14 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
    if (cVar23 == '\0') {
      if (cVar14 != '\0') goto LAB_002f819b;
      goto LAB_002f00a7;
    }
    lVar28 = uVar20 - 2;
    if (cVar14 == '\0') goto LAB_002f4dcf;
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
      piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar28);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 * *local_2f0);
      goto LAB_002efeeb;
    }
LAB_002f04e0:
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
    uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
    uVar30 = local_268;
LAB_002fb60e:
    piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
    lVar33 = lVar32;
    goto LAB_002eb76f;
  }
  uVar8 = TTA::MemNewLabel();
  piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar18 * 4 + *local_290 * uVar20 + 8);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar18 * 4 + *local_2f0 * uVar20 + 8) = uVar8;
  goto LAB_002f218b;
LAB_002ef5d0:
  lVar28 = uVar20 - 1;
  lVar29 = lVar26 << 0x20;
  piVar36 = (int *)((lVar29 + 0x300000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
  *piVar36 = *piVar36 + 1;
  lVar37 = lVar29 + 0x300000000 >> 0x20;
  iVar7 = (int)lVar26;
  if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
    piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    plVar31 = plVar12;
    if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((lVar29 + 0x100000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar26 = uVar20 - 2;
      if (*(char *)((lVar29 + 0x100000000 >> 0x20) +
                   lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
LAB_002f4fdf:
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        uVar30 = local_268;
        lVar33 = lVar32;
        piVar25 = local_278;
        plVar31 = plVar12;
      }
      else {
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        lVar28 = (long)iVar7;
        if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                               (long)plVar12 * 4 + lVar26 * *local_2f0));
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          piVar25 = local_278;
        }
        else {
LAB_002f4f98:
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
          *piVar36 = *piVar36 + 1;
          plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
          uVar30 = local_268;
          piVar25 = local_278;
LAB_002fd001:
          piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          lVar33 = lVar32;
          plVar31 = plVar12;
        }
      }
    }
    else {
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
    }
    goto LAB_002ea5ba;
  }
  piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + lVar37 * 4);
  *piVar36 = *piVar36 + 1;
  lVar33 = *local_1a8 * lVar28 + local_1e0;
  if (*(char *)(lVar37 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
    piVar36 = (int *)(lVar33 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0')
    goto LAB_002f7636;
    piVar36 = (int *)((lVar29 + 0x100000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
    *piVar36 = *piVar36 + 1;
    if (*(char *)((lVar29 + 0x100000000 >> 0x20) +
                 lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
      goto LAB_002fa811;
    }
    uVar6 = TTA::MemNewLabel();
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
    piVar25 = local_278;
    goto LAB_002fa811;
  }
  piVar36 = (int *)(lVar33 + (lVar29 + 0x400000000 >> 0x1e));
  *piVar36 = *piVar36 + 1;
  lVar33 = lVar29 + 0x400000000 >> 0x20;
  cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  cVar14 = *(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
  if (cVar23 == '\0') {
    if (cVar14 == '\0') {
      piVar36 = (int *)((lVar29 + 0x100000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((lVar29 + 0x100000000 >> 0x20) +
                   lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      }
      else {
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + (uVar20 - 2) * *local_2f0);
LAB_002f8ecb:
        piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        uVar30 = local_268;
LAB_002f8ecf:
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      }
      goto LAB_002f1a41;
    }
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
LAB_002f27a1:
    lVar28 = (long)(int)plVar12;
    plVar12 = (long *)(lVar28 + 2);
    if ((int)local_180 <= (int)plVar12) {
      if ((int)local_180 < (int)plVar12) goto LAB_002f666b;
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
        uVar13 = uVar20 | 1;
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
        if (cVar23 != '\0') {
          if (cVar14 != '\0') goto LAB_002f294b;
          goto LAB_002f2cd5;
        }
        if (cVar14 == '\0') {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 3 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = 0;
            goto LAB_002fc8b3;
          }
        }
        else {
          piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 3 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) !=
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
            *piVar36 = *piVar36 + 1;
            plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
            goto LAB_002f2d1c;
          }
        }
        uVar6 = TTA::MemNewLabel();
        plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        piVar25 = local_278;
      }
      else {
LAB_002f294b:
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 3 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) !=
            '\0') {
          lVar33 = uVar20 - 2;
          piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f30fd:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          }
          else {
            piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) ==
                '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
              goto LAB_002f30fd;
            }
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
          }
          piVar36 = (int *)((long)plVar12 + lVar28 * 4 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          piVar25 = local_278;
          goto LAB_002fc8b3;
        }
LAB_002f2cd5:
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
      }
LAB_002f2d1c:
      piVar36 = (int *)((long)plVar12 + lVar28 * 4 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
      goto LAB_002fc8b3;
    }
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 8 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    lVar33 = lVar32;
    if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
      uVar13 = uVar20 | 1;
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      if (cVar23 != '\0') {
        if (cVar14 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002f37bd;
        }
        lVar29 = uVar20 - 1;
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
          lVar29 = *local_1a8 * lVar29;
          goto LAB_002f3144;
        }
        lVar33 = uVar20 - 2;
        piVar36 = (int *)(local_1e0 + *local_1a8 * lVar33 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f35ff:
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        }
        else {
          piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
            goto LAB_002f35ff;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
          *piVar36 = *piVar36 + 1;
          plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
        }
        piVar36 = (int *)((long)plVar31 + lVar28 * 4 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        piVar25 = local_278;
        goto LAB_002eaece;
      }
      if (cVar14 != '\0') {
        lVar29 = uVar20 - 1;
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002eaece;
        }
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0x10 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 4 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
          uVar6 = TTA::MemNewLabel();
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          goto LAB_002f1a41;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 0x10);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 0x10);
LAB_002f34ae:
        piVar36 = (int *)((long)plVar31 + lVar28 * 4 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        goto LAB_002eb76f;
      }
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 3 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        goto LAB_002f0539;
      }
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
LAB_002f366b:
      plVar31 = (long *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20);
      lVar33 = lVar32;
      plVar35 = plVar34;
      goto LAB_002ef206;
    }
    lVar29 = uVar20 - 1;
    piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0') {
      lVar32 = uVar20 - 2;
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f2eb4:
        uVar6 = TTA::MemMerge(uVar6,uVar8);
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      }
      else {
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
          goto LAB_002f2eb4;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
      }
      piVar36 = (int *)((long)plVar31 + lVar28 * 4 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
      piVar25 = local_278;
      plVar31 = plVar12;
      goto LAB_002ea5ba;
    }
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
      lVar29 = *local_1a8 * lVar29;
LAB_002f3144:
      piVar36 = (int *)(lVar29 + local_1e0 + 0x10 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 4 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) ==
          '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
        plVar35 = (long *)((ulong)plVar12 & 0xffffffff);
        uVar17 = uVar30;
        goto LAB_002f6327;
      }
      lVar32 = uVar20 - 2;
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20));
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        goto LAB_002f34ae;
      }
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f36e4:
        uVar6 = TTA::MemMerge(uVar6,uVar8);
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      }
      else {
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
          goto LAB_002f36e4;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
      }
      piVar36 = (int *)((long)plVar31 + lVar28 * 4 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
      goto LAB_002eb76f;
    }
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
    plVar31 = (long *)((ulong)plVar12 & 0xffffffff);
LAB_002f50ec:
    lVar32 = local_260;
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
    lVar28 = (long)(int)plVar31;
    plVar12 = (long *)(lVar28 + 2);
    if ((int)local_180 <= (int)plVar12) {
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      uVar13 = uVar20 | 1;
      cVar23 = *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      if ((int)local_180 < (int)plVar12) {
        if (cVar23 == '\0') {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0')
          {
LAB_002f8a15:
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = 0;
            goto LAB_002fc8b3;
          }
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002f5893:
          if (cVar23 != '\0') {
LAB_002f7ce6:
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            lVar29 = *local_2f0 * uVar20;
            lVar33 = *local_290;
LAB_002f7d1c:
            uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar29);
LAB_002f8971:
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
            goto LAB_002fc8b3;
          }
        }
        else {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + 2 +
                            *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_);
          if (cVar14 != '\0') {
joined_r0x002f60b1:
            if (cVar23 == '\0') goto LAB_002f7ce6;
            piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            lVar33 = uVar20 - 2;
            if (*(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) ==
                '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
            }
            else {
              piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) !=
                  '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
                *piVar36 = *piVar36 + 1;
                uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
                piVar25 = local_278;
                goto LAB_002fc8b3;
              }
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
            }
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            piVar25 = local_278;
            goto LAB_002fc8b3;
          }
joined_r0x002f5d4a:
          if (cVar23 != '\0') goto LAB_002f8929;
        }
LAB_002f89c5:
        uVar6 = TTA::MemNewLabel();
      }
      else {
        if (cVar23 != '\0') {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          lVar33 = uVar20 - 1;
          cVar23 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
          if (cVar23 == '\0') {
joined_r0x002f8923:
            if (cVar14 == '\0') {
              piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 8 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              cVar23 = *(char *)(lVar28 + 2 +
                                (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
              goto joined_r0x002f5d4a;
            }
            goto LAB_002f8929;
          }
          lVar29 = *local_1a8 * lVar33 + local_1e0;
          if (cVar14 == '\0') {
            piVar36 = (int *)(lVar29 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
LAB_002f6095:
            cVar23 = *(char *)(lVar28 + 2 +
                              *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_);
            goto joined_r0x002f60b1;
          }
          piVar36 = (int *)(lVar29 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          lVar29 = uVar20 - 2;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar29 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * *local_2f0 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          }
          else {
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 4 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) !=
                '\0') {
              piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 8 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + 2 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                  '\0') {
                piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
                *piVar36 = *piVar36 + 1;
                cVar23 = *(char *)(lVar28 + 2 +
                                  *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
joined_r0x002f5a82:
                if (cVar23 == '\0') {
LAB_002f5a88:
                  lVar33 = uVar20 - 2;
                  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
                  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
                  goto LAB_002f9cbf;
                }
LAB_002f94d8:
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
                *piVar36 = *piVar36 + 1;
                lVar29 = (uVar20 - 2) * *local_2f0;
                lVar33 = *local_290;
                goto LAB_002f7d1c;
              }
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar29);
              *piVar36 = *piVar36 + 1;
              uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar29 * *local_2f0);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
              goto LAB_002fc8b3;
            }
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar29);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar29);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar29 + 8);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * *local_2f0 + 8);
          }
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          piVar25 = local_278;
          goto LAB_002fc8b3;
        }
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
        if (cVar23 == '\0') {
          if (cVar14 == '\0') {
            piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 3 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                '\0') goto LAB_002f8a15;
            goto LAB_002f89c5;
          }
          lVar33 = uVar20 - 1;
          piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(lVar28 + 2 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_);
            goto joined_r0x002f5d4a;
          }
LAB_002f8929:
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
          *piVar36 = *piVar36 + 1;
          lVar33 = *local_290;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
          goto LAB_002f8971;
        }
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
        if (cVar14 == '\0') goto joined_r0x002f5893;
        lVar33 = uVar20 - 1;
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
        if (cVar23 == '\0') goto joined_r0x002f8923;
        lVar29 = *local_1a8 * lVar33 + local_1e0;
        if (cVar14 == '\0') {
          piVar36 = (int *)(lVar29 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          goto LAB_002f6095;
        }
        piVar36 = (int *)(lVar29 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar29 = uVar20 - 2;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) != '\0') {
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0')
          {
            piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 2 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                '\0') {
              piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              cVar23 = *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_)
              ;
              goto joined_r0x002f5a82;
            }
            goto LAB_002f94d8;
          }
          goto LAB_002f5a88;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar29 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * *local_2f0 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f9cbf:
        uVar6 = TTA::MemMerge(uVar6,uVar8);
      }
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
      piVar25 = local_278;
      goto LAB_002fc8b3;
    }
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 8 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    uVar13 = uVar20 | 1;
    lVar33 = lVar32;
    if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      if (cVar23 == '\0') {
        if (cVar14 == '\0') {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 3 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0')
          {
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            goto LAB_002f0539;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          goto LAB_002f366b;
        }
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_) ==
            '\0') goto LAB_002f5ec4;
LAB_002f77c4:
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
        *piVar36 = *piVar36 + 1;
        lVar33 = *local_290;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
LAB_002f780c:
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + 8 + lVar33 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
        goto LAB_002eaece;
      }
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
      if (cVar14 == '\0') {
        if (cVar23 != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002f37bd;
        }
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        piVar25 = local_278;
        goto LAB_002f37bd;
      }
      lVar29 = uVar20 - 1;
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
      if (cVar23 == '\0') {
        if (cVar14 == '\0') {
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0x10 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar28 + 4 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
          goto joined_r0x002f5f31;
        }
        goto LAB_002f77c4;
      }
      if (cVar14 != '\0') {
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar26 = uVar20 - 2;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
LAB_002f96cc:
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          piVar25 = local_278;
          goto LAB_002eaece;
        }
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26 + 8);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0 + 8);
          goto LAB_002f96cc;
        }
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          piVar25 = local_278;
          goto LAB_002eaece;
        }
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                               lVar28 * 4 + lVar26 * *local_2f0 + 8));
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
          piVar25 = local_278;
          goto LAB_002eaece;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        lVar33 = *local_290;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
        piVar25 = local_278;
        goto LAB_002f780c;
      }
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0x10 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 4 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0')
        goto LAB_002f9ae1;
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar33 = uVar20 - 2;
        if (*(char *)(lVar28 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
        }
        else {
          piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) != '\0')
          {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
            goto LAB_002f27a1;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
        }
        uVar6 = TTA::MemMerge(uVar6,uVar8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        piVar25 = local_278;
        goto LAB_002f27a1;
      }
      lVar32 = uVar20 - 2;
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      lVar26 = *local_1a8 * lVar29 + local_1e0;
      if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(lVar26 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
          *piVar36 = *piVar36 + 1;
          lVar29 = *local_290;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
LAB_002fa660:
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * uVar20);
          *piVar36 = *piVar36 + 1;
          goto LAB_002fa663;
        }
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
          goto LAB_002fa7d0;
        }
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
          goto LAB_002fa67a;
        }
        goto LAB_002eb76f;
      }
      piVar36 = (int *)(lVar26 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
        *piVar36 = *piVar36 + 1;
        lVar29 = *local_290;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
        goto LAB_002fa660;
      }
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if ((*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0') &&
         ((piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4),
          *piVar36 = *piVar36 + 1,
          *(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0' ||
          (piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar28 * 4),
          *piVar36 = *piVar36 + 1,
          *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0'))))
      {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
        goto LAB_002eb76f;
      }
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
LAB_002fa67a:
      uVar6 = TTA::MemMerge(uVar6,uVar8);
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
      goto LAB_002eb76f;
    }
    piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    lVar29 = uVar20 - 1;
    cVar23 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
    piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
    plVar31 = plVar12;
    if (cVar23 == '\0') {
      if (cVar14 != '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
        goto LAB_002ea5ba;
      }
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
LAB_002f5ec4:
        lVar29 = uVar20 - 1;
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0x10 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + 4 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002f5f31:
        if (cVar14 == '\0') {
          if (cVar23 == '\0') {
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            goto LAB_002f1a41;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002f27a1;
        }
        lVar32 = uVar20 - 2;
        if (cVar23 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
          *piVar36 = *piVar36 + 1;
          lVar29 = *local_290;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
        }
        else {
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
            goto LAB_002fa67a;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          lVar29 = *local_290;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
        goto LAB_002eb76f;
      }
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        piVar25 = local_278;
        goto LAB_002fa811;
      }
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2) + 8);
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0 + 8);
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
    }
    else {
      if (cVar14 != '\0') {
        piVar36 = (int *)(local_1e0 + *local_1a8 * lVar29 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar32 = uVar20 - 2;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
        }
        else {
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0')
          {
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                '\0') {
              piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) ==
                  '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     lVar28 * 4 + lVar32 * *local_2f0 + 8));
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
                piVar25 = local_278;
              }
              else {
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
                *piVar36 = *piVar36 + 1;
                uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
                piVar25 = local_278;
              }
            }
            else {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
              piVar25 = local_278;
            }
            goto LAB_002ea5ba;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
        }
        uVar6 = TTA::MemMerge(uVar6,uVar8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
        piVar25 = local_278;
        goto LAB_002ea5ba;
      }
      piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0x10 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 4 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0')
          {
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            lVar33 = uVar20 - 2;
            if (*(char *)(lVar28 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
            }
            else {
              piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) !=
                  '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
                *piVar36 = *piVar36 + 1;
                uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
                piVar25 = local_278;
                goto LAB_002f27a1;
              }
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
            }
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
            piVar25 = local_278;
            goto LAB_002f27a1;
          }
LAB_002f9ae1:
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          goto LAB_002f1a41;
        }
        lVar32 = uVar20 - 2;
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar26 = *local_1a8 * lVar29 + local_1e0;
        if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
          piVar36 = (int *)(lVar26 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
            *piVar36 = *piVar36 + 1;
            lVar29 = *local_290;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
            goto LAB_002fa11a;
          }
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
LAB_002fa7d0:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          }
          else {
            piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) ==
                '\0') goto LAB_002eb76f;
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 0x10);
          }
        }
        else {
          piVar36 = (int *)(lVar26 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
            *piVar36 = *piVar36 + 1;
            lVar29 = *local_290;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
LAB_002fa11a:
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * uVar20);
            *piVar36 = *piVar36 + 1;
LAB_002fa663:
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          }
          else {
            piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if ((*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) !=
                 '\0') &&
               ((piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4),
                *piVar36 = *piVar36 + 1,
                *(char *)(lVar28 + 2 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) !=
                '\0' || (piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar28 * 4),
                        *piVar36 = *piVar36 + 1,
                        *(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_
                                 ) != '\0')))) {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
              goto LAB_002eb76f;
            }
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32 + 8);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0 + 8);
          }
        }
        goto LAB_002fa67a;
      }
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 8 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
        goto LAB_002fa811;
      }
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      lVar33 = uVar20 - 2;
      if (*(char *)(lVar28 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
      }
      else {
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar15;
          piVar25 = local_278;
          goto LAB_002fb698;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33 + 8);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 * *local_2f0 + 8);
      }
      uVar6 = TTA::MemMerge(uVar6,uVar8);
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20 + 8);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20 + 8) = uVar6;
      piVar25 = local_278;
    }
LAB_002fb698:
    uVar6 = (int)plVar12 + 2;
    plVar31 = (long *)(ulong)uVar6;
    lVar33 = lVar32;
    plVar35 = plVar34;
    if ((int)local_180 <= (int)uVar6) {
LAB_002fba26:
      lVar28 = (long)(int)plVar31;
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      uVar13 = uVar20 | 1;
      cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      iVar7 = (int)plVar12;
      if ((int)local_180 < (int)plVar31) {
        lVar32 = lVar33;
        plVar34 = plVar35;
        if (cVar23 == '\0') {
LAB_002fbca3:
          uVar13 = uVar20 | 1;
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0')
          goto LAB_002fbd54;
          lVar29 = (long)iVar7;
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          lVar33 = uVar13 * *(long *)local_258._80_8_;
          goto LAB_002fbd06;
        }
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + (long)iVar7 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)((long)iVar7 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
        if (cVar14 == '\0') goto joined_r0x002f0f16;
      }
      else {
        if (cVar23 == '\0') {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
          lVar29 = (long)iVar7;
          piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
          if (cVar23 == '\0') goto joined_r0x002fbf54;
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar29 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
          if (cVar14 == '\0') goto joined_r0x002f49d8;
          piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar29 + 3 +
                            *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_);
        }
        else {
          lVar32 = (long)iVar7;
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar32 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar32 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)(lVar32 + 3 +
                            *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_);
        }
        if (cVar23 == '\0') goto joined_r0x002fccef;
        if (cVar14 != '\0') {
          lVar29 = (long)iVar7;
          piVar36 = (int *)(*local_1a8 * (uVar20 - 2) + local_1e0 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * (uVar20 - 2) + local_258._24_8_) ==
              '\0') goto LAB_002fbc3e;
          piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          lVar32 = (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_;
          goto LAB_002fbbf6;
        }
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
      }
      lVar29 = (long)iVar7;
      if (cVar23 == '\0') goto LAB_002fbd19;
      lVar29 = (long)iVar7;
      piVar36 = (int *)(*local_1a8 * (uVar20 - 2) + local_1e0 + 4 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * (uVar20 - 2) + local_258._24_8_);
      goto joined_r0x002fbf01;
    }
    uVar13 = uVar20 | 1;
    lVar28 = uVar20 - 1;
    lVar26 = uVar20 - 2;
    lVar29 = (long)(int)plVar12;
    plVar31 = (long *)(lVar29 + 2);
LAB_002fb6bf:
    plVar12 = plVar31;
    lVar32 = local_260;
    uVar30 = local_268;
    plVar34 = local_270;
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    iVar7 = (int)lVar29;
    lVar33 = local_260;
    if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
      lVar18 = lVar29 << 0x20;
      piVar36 = (int *)((lVar18 + 0x300000000 >> 0x1e) + *local_1a8 * uVar20 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar37 = lVar18 + 0x300000000 >> 0x20;
      cVar14 = *(char *)(lVar37 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      if (cVar23 != '\0') {
        piVar36 = (int *)((lVar18 + 0x100000000 >> 0x1e) + *local_1a8 * uVar13 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar27 = lVar18 + 0x100000000 >> 0x20;
        cVar23 = *(char *)(lVar27 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
        if (cVar14 == '\0') {
          if (cVar23 == '\0') {
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
            lVar32 = local_260;
            piVar25 = local_278;
            plVar34 = local_270;
            goto LAB_002f37bd;
          }
          goto LAB_002fc8e6;
        }
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
        if (cVar23 == '\0') {
          if (cVar14 != '\0') {
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
            uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
            goto LAB_002fce01;
          }
          piVar36 = (int *)((lVar18 + 0x400000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar29 = lVar18 + 0x400000000 >> 0x20;
          cVar23 = *(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          cVar14 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
          if (cVar23 == '\0') {
            if (cVar14 != '\0') {
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
              goto LAB_002f27a1;
            }
            uVar6 = TTA::MemNewLabel();
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
            plVar34 = local_270;
            goto LAB_002f1a41;
          }
          if (cVar14 != '\0') {
            piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar37 * 4);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(lVar37 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
            goto LAB_002fdbdb;
          }
          lVar32 = *local_290;
        }
        else {
          if (cVar14 != '\0') {
            piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar27 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar27 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
              piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar26);
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                   (long)plVar12 * 4 + lVar26 * *local_2f0));
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
              *piVar36 = *piVar36 + 1;
              *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
              lVar32 = local_260;
              piVar25 = local_278;
              plVar34 = local_270;
            }
            else {
              piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                lVar33 = (long)iVar7;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_)
                    == '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar26);
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
LAB_002f4087:
                  uVar30 = local_268;
                  uVar6 = TTA::MemMerge(uVar6,uVar8);
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
                  piVar25 = local_278;
                }
                else {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
                  *piVar36 = *piVar36 + 1;
                  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar26 * *local_2f0);
LAB_002f44fc:
                  piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                       uVar15;
                  uVar30 = local_268;
                }
              }
              else {
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
                *piVar36 = *piVar36 + 1;
                plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + lVar26 * *local_2f0);
LAB_002fce01:
                piVar36 = (int *)((long)plVar34 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15
                ;
                lVar32 = local_260;
                plVar34 = local_270;
              }
            }
            goto LAB_002eaece;
          }
          piVar36 = (int *)((lVar18 + 0x400000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar29 = lVar18 + 0x400000000 >> 0x20;
          if (*(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
            piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) !=
                '\0') {
              piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar27 * 4);
              *piVar36 = *piVar36 + 1;
              cVar23 = *(char *)(lVar27 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
              goto LAB_002fcb0c;
            }
            piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
            goto LAB_002f1a41;
          }
          piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar37 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
            piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + (long)plVar12 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) !=
                '\0') {
              piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar27 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar27 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0')
              goto LAB_002eb76f;
              piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar26);
              piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
              goto LAB_002fde33;
            }
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
            lVar32 = *local_290;
LAB_002fdeb6:
            piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + lVar32 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
LAB_002fdedc:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
            lVar33 = local_260;
            plVar34 = local_270;
            goto LAB_002eb76f;
          }
          piVar36 = (int *)(local_1e0 + *local_1a8 * lVar26 + lVar27 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar27 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0')
          goto LAB_002fd5d3;
          piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002fd51c:
          if (cVar23 == '\0') {
            piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + (long)plVar12 * 4);
            *piVar36 = *piVar36 + 1;
            lVar33 = (long)iVar7;
            if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) ==
                '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar26);
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
              goto LAB_002fd3d3;
            }
            piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
            uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar26 * *local_2f0);
            goto LAB_002fd5b5;
          }
          lVar32 = *local_290;
          lVar29 = (long)iVar7;
        }
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar32 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002eb76f;
      }
      if (cVar14 == '\0') {
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
          uVar6 = TTA::MemNewLabel();
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          uVar30 = local_268;
          lVar32 = local_260;
          plVar34 = local_270;
          goto LAB_002f0539;
        }
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20);
        plVar35 = local_270;
        goto LAB_002ef206;
      }
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002eaece;
      }
      piVar36 = (int *)((lVar18 + 0x400000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar29 = lVar18 + 0x400000000 >> 0x20;
      cVar23 = *(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      cVar14 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
      if (cVar23 != '\0') {
        if (cVar14 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
          goto LAB_002eb76f;
        }
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar37 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
LAB_002fdbdb:
        if (cVar23 == '\0') {
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
          goto LAB_002fd3d3;
        }
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
        goto LAB_002fb60e;
      }
LAB_002fd2e8:
      if (cVar14 == '\0') goto LAB_002f19fd;
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
LAB_002fd342:
      piVar36 = (int *)((long)plVar34 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
      lVar32 = local_260;
      plVar34 = local_270;
      goto LAB_002f27a1;
    }
    piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    plVar31 = plVar12;
    if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002ea5ba;
      }
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
        lVar37 = (lVar29 << 0x20) + 0x400000000;
        piVar36 = (int *)((lVar37 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar37 = lVar37 >> 0x20;
        cVar23 = *(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
        if (cVar23 == '\0') goto LAB_002fd2e8;
        if (cVar14 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + lVar26 * *local_2f0);
LAB_002fd916:
          piVar36 = (int *)((long)plVar34 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
          lVar33 = local_260;
          plVar34 = local_270;
        }
        else {
          piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar26);
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            goto LAB_002fde21;
          }
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
LAB_002fc780:
          piVar36 = (int *)((long)plVar34 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
          lVar33 = local_260;
          plVar34 = local_270;
        }
        goto LAB_002eb76f;
      }
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0')
      goto LAB_002fc79e;
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar26);
    }
    else {
      piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                               (long)plVar12 * 4 + lVar26 * *local_2f0));
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          uVar30 = local_268;
          lVar33 = local_260;
          piVar25 = local_278;
          plVar34 = local_270;
          goto LAB_002ea5ba;
        }
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + lVar26 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
          goto LAB_002ea5ba;
        }
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        lVar28 = (long)iVar7;
        if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) != '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
          goto LAB_002fd001;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar26);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                             (long)plVar12 * 4 + lVar26 * *local_2f0));
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        piVar25 = local_278;
        goto LAB_002ea5ba;
      }
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
        lVar37 = (lVar29 << 0x20) + 0x400000000;
        piVar36 = (int *)((lVar37 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar37 = lVar37 >> 0x20;
        if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
          piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) != '\0')
          {
            piVar36 = (int *)(local_1e0 + *local_1a8 * lVar26 + 4 + lVar29 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) ==
                '\0') {
LAB_002fd5d3:
              piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar26);
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
              goto LAB_002fdedc;
            }
            piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_
                              );
            goto joined_r0x002fd51c;
          }
          piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar26 * *local_2f0);
            lVar32 = *local_290;
            goto LAB_002fdeb6;
          }
          piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0')
          goto LAB_002eb76f;
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
LAB_002fde21:
          uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar26 * *local_2f0);
          goto LAB_002fde33;
        }
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
          goto LAB_002f1a41;
        }
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_);
LAB_002fcb0c:
        lVar33 = (long)iVar7;
        if (cVar23 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar26);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                               (long)plVar12 * 4 + lVar26 * *local_2f0));
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          piVar25 = local_278;
          goto LAB_002f27a1;
        }
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar26 * *local_2f0);
        goto LAB_002fdc8b;
      }
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0')
      {
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002fa811;
      }
      piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 4 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar26);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                             (long)plVar12 * 4 + *local_2f0 * lVar26));
        piVar25 = local_278;
      }
      else {
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar26);
      }
    }
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
    plVar31 = (long *)((long)plVar12 + 2);
    lVar29 = lVar29 + 2;
    uVar30 = local_268;
    lVar33 = local_260;
    plVar35 = local_270;
    if ((long)local_190 <= (long)plVar31) goto LAB_002fba26;
    goto LAB_002fb6bf;
  }
  if (cVar14 == '\0') {
    piVar36 = (int *)((lVar29 + 0x100000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
    *piVar36 = *piVar36 + 1;
    lVar26 = uVar20 - 2;
    if (*(char *)((lVar29 + 0x100000000 >> 0x20) +
                 lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar26 * *local_2f0);
      goto LAB_002f4e11;
    }
    piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar37 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar26);
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar26 * *local_2f0);
    }
    else {
      piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      lVar33 = (long)iVar7;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) != '\0')
      {
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar26 * *local_2f0);
        goto LAB_002f964e;
      }
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar26);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar26 * *local_2f0);
    }
  }
  else {
    lVar28 = uVar20 - 2;
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
      *piVar36 = *piVar36 + 1;
      plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
LAB_002f964e:
      piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      lVar33 = lVar32;
      goto LAB_002eb76f;
    }
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
  }
LAB_002f777b:
  uVar6 = TTA::MemMerge(uVar6,uVar8);
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  lVar33 = lVar32;
  goto LAB_002eb76f;
LAB_002fc79e:
  uVar6 = TTA::MemNewLabel();
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  uVar30 = local_268;
  lVar32 = local_260;
  piVar25 = local_278;
  plVar34 = local_270;
LAB_002fa811:
  uVar6 = (int)plVar12 + 2;
  plVar31 = (long *)(ulong)uVar6;
  if ((int)local_180 <= (int)uVar6) {
LAB_002faaca:
    lVar33 = (long)(int)plVar31;
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    uVar13 = uVar20 | 1;
    cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
    iVar7 = (int)plVar12;
    if ((int)local_180 < (int)plVar31) {
      if (cVar23 == '\0') {
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar33 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0') {
LAB_002fcd7e:
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20) = 0;
          goto LAB_002fc8b3;
        }
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + (long)iVar7 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)iVar7 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) ==
            '\0') goto LAB_002fcd30;
      }
      else {
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + (long)iVar7 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)((long)iVar7 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar33 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
        if (cVar14 == '\0') {
joined_r0x002fb0b8:
          if (cVar23 == '\0') goto LAB_002fcd30;
LAB_002fcca2:
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (uVar20 - 2));
          *piVar36 = *piVar36 + 1;
          plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
          uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + (uVar20 - 2) * *local_2f0);
          goto LAB_002fcd5d;
        }
        if (cVar23 != '\0') goto LAB_002fae23;
      }
LAB_002fc812:
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
    }
    else {
      if (cVar23 == '\0') {
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
        lVar28 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
        if (cVar23 == '\0') {
          if (cVar14 == '\0') {
            piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 3 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                '\0') goto LAB_002fcd7e;
          }
          else {
            piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            cVar14 = *(char *)(lVar28 + 3 +
                              *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_);
joined_r0x002fcc66:
            if ((cVar14 != '\0') ||
               (piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar33 * 4),
               *piVar36 = *piVar36 + 1,
               *(char *)(lVar33 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_) !=
               '\0')) goto LAB_002fcca2;
          }
        }
        else {
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
          if (cVar14 != '\0') {
            lVar29 = uVar20 - 1;
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            cVar14 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
            if (cVar23 != '\0') {
              if (cVar14 == '\0') {
                piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
                *piVar36 = *piVar36 + 1;
                cVar23 = *(char *)(lVar33 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
                goto joined_r0x002fae1d;
              }
              goto LAB_002fae23;
            }
            goto joined_r0x002fcc66;
          }
          if (cVar23 != '\0') goto LAB_002fc812;
        }
LAB_002fcd30:
        uVar6 = TTA::MemNewLabel();
      }
      else {
        lVar29 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        lVar28 = uVar20 - 1;
        cVar23 = *(char *)(lVar29 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
        if (cVar23 == '\0') {
          if (cVar14 == '\0') {
            piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(lVar33 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
            goto joined_r0x002fb0b8;
          }
          goto LAB_002fcca2;
        }
        if (cVar14 == '\0') {
          piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar33 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002fae1d:
          if (cVar23 == '\0') goto LAB_002fc812;
        }
LAB_002fae23:
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + (uVar20 - 2) * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                             (long)iVar7 * 4 + *local_2f0 * uVar20));
      }
      plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      piVar25 = local_278;
LAB_002fcd5d:
      piVar36 = (int *)((long)plVar12 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
    }
    *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20) = uVar6;
    goto LAB_002fc8b3;
  }
  uVar13 = uVar20 | 1;
  lVar28 = uVar20 - 1;
  lVar29 = (long)(int)plVar12;
  plVar31 = (long *)(lVar29 + 2);
  while( true ) {
    plVar12 = plVar31;
    uVar30 = local_268;
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    iVar7 = (int)lVar29;
    lVar33 = lVar32;
    if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0')
    break;
    piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    plVar31 = plVar12;
    if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
          lVar26 = (lVar29 << 0x20) + 0x400000000;
          piVar36 = (int *)((lVar26 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar26 = lVar26 >> 0x20;
          cVar14 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
          piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002f0db8:
          uVar30 = local_268;
          if (cVar14 == '\0') goto joined_r0x002f19f7;
          if (cVar23 == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (uVar20 - 2));
            *piVar36 = *piVar36 + 1;
            plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
            uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + (uVar20 - 2) * *local_2f0);
            goto LAB_002f0e0c;
          }
          lVar33 = uVar20 - 2;
          piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0')
          {
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar33);
            piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar33 * *local_2f0);
            goto LAB_002fd3d3;
          }
          goto LAB_002fb5ca;
        }
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0'
           ) {
          uVar6 = TTA::MemNewLabel();
          piVar25 = local_278;
          goto LAB_002faa6f;
        }
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002fb698;
      }
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
      goto LAB_002ea5ba;
    }
    piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + 0xc + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20
                                           ));
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      uVar30 = local_268;
      piVar25 = local_278;
      goto LAB_002ea5ba;
    }
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
      lVar26 = (lVar29 << 0x20) + 0x400000000;
      piVar36 = (int *)((lVar26 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar26 = lVar26 >> 0x20;
      if (*(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
        goto joined_r0x002fe123;
      }
      lVar37 = uVar20 - 2;
      piVar36 = (int *)(*local_1a8 * lVar37 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar37 + local_258._24_8_) != '\0')
      goto LAB_002fb214;
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0')
      {
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar37);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar37 * *local_2f0);
        lVar33 = *local_290;
        goto LAB_002fdf6b;
      }
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar37);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar37);
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar37);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar37 * *local_2f0);
      goto LAB_002fd29c;
    }
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20
                                           ));
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      uVar30 = local_268;
      piVar25 = local_278;
      goto LAB_002fb698;
    }
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
LAB_002faa6f:
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
    plVar31 = (long *)((long)plVar12 + 2);
    lVar29 = lVar29 + 2;
    uVar30 = local_268;
    if ((long)local_190 <= (long)plVar31) goto LAB_002faaca;
  }
  piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
  lVar37 = lVar29 << 0x20;
  piVar36 = (int *)((lVar37 + 0x300000000 >> 0x1e) + *local_1a8 * uVar20 + local_1e0);
  *piVar36 = *piVar36 + 1;
  lVar26 = lVar37 + 0x300000000 >> 0x20;
  cVar14 = *(char *)(lVar26 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
  if (cVar23 == '\0') {
    if (cVar14 == '\0') {
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar26 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        goto LAB_002f0539;
      }
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      plVar31 = (long *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20);
      plVar35 = plVar34;
      goto LAB_002ef206;
    }
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
  }
  else {
    piVar36 = (int *)((lVar37 + 0x100000000 >> 0x1e) + *local_1a8 * uVar13 + local_1e0);
    *piVar36 = *piVar36 + 1;
    cVar1 = *(char *)((lVar37 + 0x100000000 >> 0x20) +
                     uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
    if (cVar14 == '\0') {
      if (cVar1 == '\0') {
        uVar6 = TTA::MemNewLabel();
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        uVar30 = local_268;
        piVar25 = local_278;
        goto LAB_002f37bd;
      }
LAB_002fc958:
      piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar15 = *(undefined4 *)(local_340._24_8_ + (long)(int)lVar29 * 4 + *local_2f0 * uVar20);
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
      uVar30 = local_268;
LAB_002f37bd:
      uVar6 = (int)plVar12 + 2;
      plVar31 = (long *)(ulong)uVar6;
      lVar33 = lVar32;
      if ((int)uVar6 < (int)local_180) {
        uVar13 = uVar20 | 1;
        lVar29 = (long)(int)plVar12;
        plVar31 = (long *)(lVar29 + 2);
        do {
          plVar12 = plVar31;
          uVar30 = local_268;
          piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) !=
              '\0') {
            lVar27 = lVar29 << 0x20;
            piVar36 = (int *)((lVar27 + 0x100000000 >> 0x1e) + *local_1a8 * uVar13 + local_1e0);
            *piVar36 = *piVar36 + 1;
            lVar37 = lVar27 + 0x100000000 >> 0x20;
            cVar23 = *(char *)(lVar37 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
            lVar28 = uVar20 - 1;
            piVar36 = (int *)((lVar27 + 0x300000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
            *piVar36 = *piVar36 + 1;
            lVar18 = lVar27 + 0x300000000 >> 0x20;
            cVar14 = *(char *)(lVar18 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
            lVar26 = *local_1a8;
            iVar7 = (int)lVar29;
            local_170 = plVar12;
            if (cVar23 == '\0') {
              if (cVar14 != '\0') {
                piVar36 = (int *)(local_1e0 + lVar26 * lVar28 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                    != '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2))
                  ;
                  *piVar36 = *piVar36 + 1;
                  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0
                                   );
                  goto LAB_002f43c6;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
                *piVar36 = *piVar36 + 1;
                lVar33 = uVar20 - 2;
                if (*(char *)(lVar37 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                    '\0') goto LAB_002f4fdf;
                piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                lVar28 = (long)iVar7;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_)
                    != '\0') goto LAB_002f4f98;
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar33);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar33);
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     (long)plVar12 * 4 + lVar33 * *local_2f0));
                plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                piVar25 = local_278;
                plVar12 = local_170;
                goto LAB_002fd001;
              }
              piVar36 = (int *)(local_1e0 + lVar26 * uVar20 + lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              lVar33 = *local_1a8 * lVar28 + local_1e0;
              if (*(char *)(lVar18 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)(lVar33 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                    != '\0') goto LAB_002f7636;
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar37 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                    '\0') {
                  uVar6 = TTA::MemNewLabel();
                  plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                }
                else {
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * (uVar20 - 2));
                  *piVar36 = *piVar36 + 1;
                  plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + (uVar20 - 2) * *local_2f0);
                }
                piVar36 = (int *)((long)plVar12 + (long)local_170 * 4);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)local_170 * 4 + *local_2f0 * uVar20) = uVar6;
                piVar25 = local_278;
                plVar12 = local_170;
                goto LAB_002fa811;
              }
              piVar36 = (int *)(lVar33 + (lVar27 + 0x400000000 >> 0x1e));
              *piVar36 = *piVar36 + 1;
              lVar33 = lVar27 + 0x400000000 >> 0x20;
              cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
              piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              cVar14 = *(char *)((long)plVar12 +
                                *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
              if (cVar23 == '\0') {
                if (cVar14 != '\0') goto LAB_002f819b;
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar37 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) ==
                    '\0') {
                  uVar6 = TTA::MemNewLabel();
                  plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                }
                else {
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * (uVar20 - 2));
                  *piVar36 = *piVar36 + 1;
                  plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + (uVar20 - 2) * *local_2f0);
                }
                piVar36 = (int *)((long)plVar12 + (long)local_170 * 4);
                *piVar36 = *piVar36 + 1;
                plVar12 = local_170;
                goto LAB_002f8ecf;
              }
              if (cVar14 != '\0') {
                lVar28 = uVar20 - 2;
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar18 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar18 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) !=
                    '\0') goto LAB_002f4d78;
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     lVar33 * 4 + lVar28 * *local_2f0));
                plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                plVar12 = local_170;
                goto LAB_002fd5b5;
              }
              piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
              *piVar36 = *piVar36 + 1;
              lVar29 = uVar20 - 2;
              if (*(char *)(lVar37 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
                *piVar36 = *piVar36 + 1;
                plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar29 * *local_2f0);
                goto LAB_002f4e11;
              }
              piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar18 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar29);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar29);
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar29 * *local_2f0);
              }
              else {
                piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                lVar33 = (long)iVar7;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_)
                    != '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
                  *piVar36 = *piVar36 + 1;
                  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar29 * *local_2f0);
                  goto LAB_002f964e;
                }
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar29);
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar29);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar29 * *local_2f0);
              }
            }
            else {
              if (cVar14 != '\0') {
                piVar36 = (int *)(local_1e0 + lVar26 * lVar28 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                    == '\0') {
                  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
                  *piVar36 = *piVar36 + 1;
                  lVar32 = uVar20 - 2;
                  if (*(char *)(lVar37 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) !=
                      '\0') {
                    piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + (long)plVar12 * 4);
                    *piVar36 = *piVar36 + 1;
                    lVar28 = (long)iVar7;
                    if (*(char *)((long)plVar12 +
                                 *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
                      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar32);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                           (long)plVar12 * 4 + lVar32 * *local_2f0))
                      ;
                      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
                    }
                    else {
                      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
                      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
                    }
                    uVar6 = TTA::MemMerge(uVar6,uVar8);
                    piVar36 = (int *)((long)local_2c8 + (long)local_170 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    *(uint *)(local_340._24_8_ + (long)local_170 * 4 + *local_2f0 * uVar20) = uVar6;
                    uVar30 = local_268;
                    piVar25 = local_278;
                    plVar31 = local_170;
                    goto LAB_002ea5ba;
                  }
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar32);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar32 * *local_2f0);
                  lVar32 = *local_290;
                }
                else {
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2))
                  ;
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0
                                   );
                  lVar32 = *local_290;
                }
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + lVar32 * uVar20);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     (long)iVar7 * 4 + *local_2f0 * uVar20));
                plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
LAB_002f43c6:
                piVar36 = (int *)((long)plVar31 + (long)local_170 * 4);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)local_170 * 4 + *local_2f0 * uVar20) = uVar6;
                piVar25 = local_278;
                plVar31 = local_170;
                goto LAB_002ea5ba;
              }
              piVar36 = (int *)(local_1e0 + lVar26 * uVar20 + lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              lVar26 = *local_1a8 * lVar28 + local_1e0;
              if (*(char *)(lVar18 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)(lVar26 + lVar37 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) !=
                    '\0') {
                  lVar32 = (long)iVar7;
                  piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * (uVar20 - 2));
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar32 * 4 + (uVar20 - 2) * *local_2f0);
                  piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                       lVar32 * 4 + *local_2f0 * uVar20));
                  plVar12 = local_170;
                  goto LAB_002f50df;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_)
                    == '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20)
                  ;
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) =
                       uVar15;
                  piVar25 = local_278;
                  goto LAB_002fa811;
                }
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     (long)iVar7 * 4 + *local_2f0 * uVar20));
                plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
                plVar12 = local_170;
                goto LAB_002f767e;
              }
              lVar22 = lVar27 + 0x400000000 >> 0x20;
              piVar36 = (int *)(lVar26 + (lVar27 + 0x400000000 >> 0x1e));
              *piVar36 = *piVar36 + 1;
              lVar26 = *local_1a8 * lVar28 + local_1e0;
              if (*(char *)(lVar22 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)(lVar26 + lVar37 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) !=
                    '\0') {
                  lVar33 = (long)iVar7;
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (uVar20 - 2));
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + (uVar20 - 2) * *local_2f0);
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                       lVar33 * 4 + *local_2f0 * uVar20));
                  plVar12 = local_170;
                  goto LAB_002f630e;
                }
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_)
                    == '\0') goto LAB_002f8e83;
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
                piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     (long)iVar7 * 4 + *local_2f0 * uVar20));
                piVar36 = (int *)((long)local_2c8 + (long)local_170 * 4 + *local_290 * uVar20);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + (long)local_170 * 4 + *local_2f0 * uVar20) = uVar6;
                piVar25 = local_278;
                plVar12 = local_170;
                goto LAB_002f27a1;
              }
              piVar36 = (int *)(lVar26 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar37 * 4);
                *piVar36 = *piVar36 + 1;
                lVar29 = uVar20 - 2;
                if (*(char *)(lVar37 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) !=
                    '\0') {
                  piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar18 * 4);
                  *piVar36 = *piVar36 + 1;
                  if (*(char *)(lVar18 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) ==
                      '\0') {
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar29);
                    *piVar36 = *piVar36 + 1;
                    uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar29);
                    piVar36 = (int *)((long)local_2c8 + lVar22 * 4 + *local_290 * lVar29);
                    *piVar36 = *piVar36 + 1;
                    uVar8 = *(uint *)(local_340._24_8_ + lVar22 * 4 + lVar29 * *local_2f0);
LAB_002fa1d0:
                    uVar6 = TTA::MemMerge(uVar6,uVar8);
                    piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
                  }
                  else {
                    piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + (long)plVar12 * 4);
                    *piVar36 = *piVar36 + 1;
                    lVar32 = (long)iVar7;
                    if (*(char *)((long)plVar12 +
                                 *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') {
                      piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar29);
                      *piVar36 = *piVar36 + 1;
                      uVar6 = *(uint *)(local_340._24_8_ + lVar32 * 4 + *local_2f0 * lVar29);
                      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar29);
                      *piVar36 = *piVar36 + 1;
                      uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar29 * *local_2f0);
                      goto LAB_002fa1d0;
                    }
                    piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * lVar29);
                    *piVar36 = *piVar36 + 1;
                    uVar6 = *(uint *)(local_340._24_8_ + lVar32 * 4 + lVar29 * *local_2f0);
                    piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * uVar20);
                    *piVar36 = *piVar36 + 1;
                    uVar8 = *(uint *)(local_340._24_8_ + lVar32 * 4 + *local_2f0 * uVar20);
                  }
                  uVar6 = TTA::MemMerge(uVar6,uVar8);
                  piVar36 = (int *)((long)local_2c8 + (long)local_170 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  *(uint *)(local_340._24_8_ + (long)local_170 * 4 + *local_2f0 * uVar20) = uVar6;
                  uVar30 = local_268;
                  plVar12 = local_170;
                  goto LAB_002eb76f;
                }
                piVar36 = (int *)((long)local_2c8 + lVar22 * 4 + *local_290 * lVar29);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar22 * 4 + lVar29 * *local_2f0);
                lVar33 = *local_290;
              }
              else {
                lVar33 = uVar20 - 2;
                piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + lVar18 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar18 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) ==
                    '\0') {
                  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar33);
                  piVar36 = (int *)((long)local_2c8 + lVar22 * 4 + *local_290 * lVar33);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                       lVar22 * 4 + lVar33 * *local_2f0));
                  piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
                  *piVar36 = *piVar36 + 1;
                  uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
                  goto LAB_002f9626;
                }
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar33 * *local_2f0);
                lVar33 = *local_290;
              }
              piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + lVar33 * uVar20);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
            }
LAB_002f9626:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
            plVar12 = local_170;
            goto LAB_002f964e;
          }
          piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          lVar28 = *local_1a8 * uVar20 + local_1e0;
          if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) ==
              '\0') goto LAB_002f3dd7;
          piVar36 = (int *)(lVar28 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          lVar28 = *local_1a8 * uVar13 + local_1e0;
          if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0')
          {
            lVar26 = lVar29 << 0x20;
            piVar36 = (int *)(lVar28 + (lVar26 + 0x100000000 >> 0x1e));
            *piVar36 = *piVar36 + 1;
            lVar33 = uVar20 - 1;
            cVar23 = *(char *)((lVar26 + 0x100000000 >> 0x20) +
                              uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
            piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar29 * 4);
            *piVar36 = *piVar36 + 1;
            cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
            if (cVar23 != '\0') {
              if (cVar14 != '\0') goto LAB_002f4025;
              piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) + *local_1a8 * lVar33 + local_1e0);
              *piVar36 = *piVar36 + 1;
              lVar27 = lVar26 + 0x400000000 >> 0x20;
              if (*(char *)(lVar27 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0')
              goto LAB_002f4e2f;
              lVar28 = uVar20 - 2;
              piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar29 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) !=
                  '\0') {
                piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar28 * *local_2f0);
                goto LAB_002f49a8;
              }
              piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + (long)plVar12 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)plVar12 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_)
                  == '\0') goto LAB_002f7dd0;
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
              piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * lVar28);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar27 * 4 + lVar28 * *local_2f0);
              goto LAB_002f773e;
            }
            if (cVar14 != '\0') {
              piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
              *piVar36 = *piVar36 + 1;
              plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
              uVar15 = *(undefined4 *)
                        (local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
              goto LAB_002f44fc;
            }
            piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) + *local_1a8 * lVar33 + local_1e0);
            *piVar36 = *piVar36 + 1;
            lVar26 = lVar26 + 0x400000000 >> 0x20;
            cVar14 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
            piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + (long)plVar12 * 4);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)((long)plVar12 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_
                              );
            if (cVar14 == '\0') goto joined_r0x002f19f7;
            lVar33 = uVar20 - 2;
            if (cVar23 == '\0') goto LAB_002f0499;
            piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar29 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) !=
                '\0') goto LAB_002f4d78;
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar33);
            piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar33);
            *piVar36 = *piVar36 + 1;
            lVar33 = lVar33 * *local_2f0;
            goto LAB_002f49c9;
          }
          piVar36 = (int *)(lVar28 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0')
          {
            uVar6 = TTA::MemNewLabel();
            piVar25 = local_278;
          }
          else {
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
          }
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          plVar31 = (long *)((long)plVar12 + 2);
          lVar29 = lVar29 + 2;
          uVar30 = local_268;
          if ((long)local_190 <= (long)plVar31) break;
        } while( true );
      }
      lVar28 = (long)(int)plVar31;
      piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      uVar13 = uVar20 | 1;
      cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
      iVar7 = (int)plVar12;
      plVar35 = plVar34;
      if ((int)local_180 < (int)plVar31) {
        if (cVar23 == '\0') goto LAB_002fbca3;
        lVar29 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        lVar32 = uVar20 - 1;
        lVar26 = *local_1a8 * lVar32 + local_1e0;
        if (*(char *)(lVar29 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
          piVar36 = (int *)(lVar26 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0')
          goto LAB_002f3a4e;
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar28 + lVar32 * *(long *)local_258._80_8_ + local_258._24_8_);
          goto joined_r0x002f454e;
        }
        piVar36 = (int *)(lVar26 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_);
        goto joined_r0x002f41fe;
      }
      if (cVar23 == '\0') {
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
        lVar29 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
        if (cVar23 == '\0') goto joined_r0x002fbf54;
        piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar29 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
        if (cVar14 == '\0') goto joined_r0x002f49d8;
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_)
        ;
        if (cVar23 == '\0') goto joined_r0x002f4dc4;
        if (cVar14 == '\0') goto LAB_002f0756;
        goto LAB_002f4558;
      }
      lVar29 = (long)iVar7;
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 4 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      lVar33 = uVar20 - 1;
      cVar23 = *(char *)(lVar29 + 1 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_);
      piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      lVar26 = *local_1a8 * lVar33 + local_1e0;
      cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
      if (cVar23 != '\0') {
        if (cVar14 == '\0') {
          piVar36 = (int *)(lVar26 + 4 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0')
          goto LAB_002f4671;
          goto LAB_002f45de;
        }
        piVar36 = (int *)(lVar26 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) != '\0')
        goto LAB_002f46af;
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        lVar26 = uVar20 - 2;
        if (*(char *)(lVar29 + 1 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          goto LAB_002f46f6;
        }
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          goto LAB_002f3c20;
        }
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar26);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
        goto LAB_002f799e;
      }
      piVar36 = (int *)(lVar26 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
      if (cVar14 == '\0') {
        if (cVar23 != '\0') goto LAB_002f49eb;
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar29 + 1 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
        goto LAB_002f6087;
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        plVar12 = (long *)((uVar20 - 2) * *local_2f0 + local_340._24_8_);
        lVar33 = *local_290;
        goto LAB_002f4793;
      }
      if (cVar23 != '\0') goto LAB_002f49eb;
      piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      lVar26 = uVar20 - 2;
      if (*(char *)(lVar29 + 1 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
          *piVar36 = *piVar36 + 1;
          lVar33 = *local_290;
          uVar15 = *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
          goto LAB_002f7bbe;
        }
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar26);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
        goto LAB_002f470a;
      }
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
      *piVar36 = *piVar36 + 1;
      lVar33 = *local_290;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
LAB_002f7bbe:
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = uVar15;
      uVar30 = local_268;
      goto LAB_002fc8b3;
    }
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
    if (cVar1 != '\0') {
      if (cVar23 != '\0') {
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                             (long)iVar7 * 4 + *local_2f0 * uVar20));
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        uVar30 = local_268;
        piVar25 = local_278;
        goto LAB_002eaece;
      }
      piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar29 = lVar37 + 0x400000000 >> 0x20;
      if (*(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
        lVar37 = uVar20 - 2;
        piVar36 = (int *)(*local_1a8 * lVar37 + local_1e0 + lVar26 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar26 + *(long *)local_258._80_8_ * lVar37 + local_258._24_8_) == '\0') {
          piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar37);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar37 * *local_2f0);
            lVar33 = *local_290;
LAB_002fdf6b:
            piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + lVar33 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
          }
          else {
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar37);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar37);
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar37);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar37 * *local_2f0);
LAB_002fd29c:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
          }
LAB_002fdf94:
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          uVar30 = local_268;
          lVar33 = lVar32;
        }
        else {
LAB_002fb214:
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                               (long)iVar7 * 4 + *local_2f0 * uVar20));
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
          uVar30 = local_268;
        }
        goto LAB_002eb76f;
      }
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002fe123:
      if (cVar23 == '\0') {
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
        goto LAB_002f1a41;
      }
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20
                                           ));
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      uVar30 = local_268;
      piVar25 = local_278;
      goto LAB_002f27a1;
    }
  }
  if (cVar23 != '\0') {
LAB_002fb407:
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
    uVar30 = local_268;
    goto LAB_002eaece;
  }
  piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
  *piVar36 = *piVar36 + 1;
  lVar33 = lVar37 + 0x400000000 >> 0x20;
  cVar14 = *(char *)(lVar33 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
  if (cVar14 != '\0') goto code_r0x002fcebe;
joined_r0x002f19f7:
  local_268 = uVar30;
  if (cVar23 != '\0') goto LAB_002fdc43;
LAB_002f19fd:
  uVar6 = TTA::MemNewLabel();
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  goto LAB_002f1a41;
code_r0x002fcebe:
  lVar28 = uVar20 - 2;
  if (cVar23 == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
    *piVar36 = *piVar36 + 1;
    plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
    uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
    goto LAB_002fb60e;
  }
  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar26 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
LAB_002fb5ca:
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
    uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
    uVar30 = local_268;
    goto LAB_002fb60e;
  }
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
  *piVar36 = *piVar36 + 1;
  uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
  *piVar36 = *piVar36 + 1;
  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
LAB_002fd3d3:
  uVar6 = TTA::MemMerge(uVar8,uVar6);
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  lVar33 = lVar32;
  goto LAB_002eb76f;
LAB_002f3dd7:
  lVar33 = (lVar29 << 0x20) + 0x300000000;
  piVar36 = (int *)(lVar28 + (lVar33 >> 0x1e));
  *piVar36 = *piVar36 + 1;
  lVar33 = lVar33 >> 0x20;
  if (*(char *)(lVar33 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
    lVar28 = uVar20 - 1;
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0')
    goto LAB_002fb407;
    lVar29 = (lVar29 << 0x20) + 0x400000000;
    piVar36 = (int *)((lVar29 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
    *piVar36 = *piVar36 + 1;
    lVar29 = lVar29 >> 0x20;
    cVar14 = *(char *)(lVar29 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_);
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
    if (cVar14 == '\0') goto joined_r0x002f19f7;
    lVar28 = uVar20 - 2;
    if (cVar23 == '\0') goto LAB_002f4dcf;
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0')
    goto LAB_002f04e0;
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar28);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar28);
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar28);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 * *local_2f0);
    goto LAB_002fd3d3;
  }
  piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar33 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar33 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
LAB_002f4467:
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    plVar31 = (long *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20);
    uVar30 = local_268;
    lVar33 = lVar32;
    plVar35 = plVar34;
    goto LAB_002ef206;
  }
  uVar6 = TTA::MemNewLabel();
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  uVar30 = local_268;
LAB_002f0539:
  uVar6 = (int)plVar12 + 2;
  plVar31 = (long *)(ulong)uVar6;
  lVar33 = lVar32;
  if ((int)uVar6 < (int)local_180) {
    uVar13 = uVar20 | 1;
    lVar29 = (long)(int)plVar12;
    plVar31 = (long *)(lVar29 + 2);
    while (plVar12 = plVar31, uVar30 = local_268,
          piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + (long)plVar12 * 4),
          *piVar36 = *piVar36 + 1, piVar25 = local_278,
          *(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0')
    {
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      lVar28 = *local_1a8 * uVar20 + local_1e0;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) != '\0')
      goto LAB_002f0b8d;
      piVar36 = (int *)(lVar28 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) != '\0') {
        lVar33 = uVar20 - 1;
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) != '\0')
        goto LAB_002fb407;
        lVar26 = (lVar29 << 0x20) + 0x400000000;
        piVar36 = (int *)((lVar26 >> 0x1e) + *local_1a8 * lVar33 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar26 = lVar26 >> 0x20;
        cVar14 = *(char *)(lVar26 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)((long)plVar12 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_);
        goto joined_r0x002f0db8;
      }
      piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_) == '\0')
      goto LAB_002f4467;
      uVar6 = TTA::MemNewLabel();
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      plVar31 = (long *)((long)plVar12 + 2);
      lVar29 = lVar29 + 2;
      uVar30 = local_268;
      if ((long)local_190 <= (long)plVar31) goto LAB_002f06bb;
    }
    lVar28 = uVar20 - 1;
    lVar26 = lVar29 << 0x20;
    piVar36 = (int *)((lVar26 + 0x300000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
    *piVar36 = *piVar36 + 1;
    lVar37 = lVar26 + 0x300000000 >> 0x20;
    iVar7 = (int)lVar29;
    if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
      piVar36 = (int *)(local_1e0 + *local_1a8 * lVar28 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      plVar31 = plVar12;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0')
      {
        piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
        *piVar36 = *piVar36 + 1;
        lVar32 = uVar20 - 2;
        if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                     lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + (long)plVar12 * 4);
          *piVar36 = *piVar36 + 1;
          lVar28 = (long)iVar7;
          if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                 (long)plVar12 * 4 + lVar32 * *local_2f0));
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                 lVar28 * 4 + *local_2f0 * uVar20));
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
            uVar30 = local_268;
            piVar25 = local_278;
          }
          else {
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                 lVar28 * 4 + *local_2f0 * uVar20));
            piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
            uVar30 = local_268;
            piVar25 = local_278;
          }
          goto LAB_002ea5ba;
        }
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar32 * *local_2f0);
        lVar32 = *local_290;
      }
      else {
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
        lVar32 = *local_290;
      }
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + lVar32 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20
                                           ));
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      piVar25 = local_278;
      goto LAB_002ea5ba;
    }
    piVar36 = (int *)(local_1e0 + *local_1a8 * uVar20 + lVar37 * 4);
    *piVar36 = *piVar36 + 1;
    lVar18 = *local_1a8 * lVar28 + local_1e0;
    if (*(char *)(lVar37 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(lVar18 + (lVar26 + 0x100000000 >> 0x1e));
      *piVar36 = *piVar36 + 1;
      if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                   *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar15 = *(undefined4 *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
          goto LAB_002fa811;
        }
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                             (long)iVar7 * 4 + *local_2f0 * uVar20));
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
        piVar25 = local_278;
        goto LAB_002fb698;
      }
      lVar32 = (long)iVar7;
      piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar32 * 4 + (uVar20 - 2) * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar32 * 4 + *local_2f0 * uVar20));
LAB_002f50df:
      plVar31 = (long *)((ulong)plVar12 & 0xffffffff);
      piVar25 = local_278;
      goto LAB_002f50ec;
    }
    lVar27 = lVar26 + 0x400000000 >> 0x20;
    piVar36 = (int *)(lVar18 + (lVar26 + 0x400000000 >> 0x1e));
    *piVar36 = *piVar36 + 1;
    lVar18 = *local_1a8 * lVar28 + local_1e0;
    if (*(char *)(lVar27 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
      piVar36 = (int *)(lVar18 + (long)plVar12 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0')
      {
        lVar33 = uVar20 - 2;
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) != '\0') {
          piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar33 * *local_2f0);
          lVar33 = *local_290;
          goto LAB_002f7e06;
        }
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar33);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar33);
        piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * lVar33);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar27 * 4 + lVar33 * *local_2f0);
        goto LAB_002f773e;
      }
      piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
      *piVar36 = *piVar36 + 1;
      lVar18 = uVar20 - 2;
      if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                   lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
      goto LAB_002f7dd0;
      piVar36 = (int *)(*local_1a8 * lVar18 + local_1e0 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar37 + *(long *)local_258._80_8_ * lVar18 + local_258._24_8_) == '\0') {
        piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * lVar18);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * lVar18);
        piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * lVar18);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar27 * 4 + lVar18 * *local_2f0);
      }
      else {
        piVar36 = (int *)(*local_1a8 * lVar18 + local_1e0 + (long)plVar12 * 4);
        *piVar36 = *piVar36 + 1;
        lVar28 = (long)iVar7;
        if (*(char *)((long)plVar12 + *(long *)local_258._80_8_ * lVar18 + local_258._24_8_) != '\0'
           ) {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar18);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar18 * *local_2f0);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20);
          goto LAB_002fdf94;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar18);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar18);
        piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar18);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar18 * *local_2f0);
      }
      uVar6 = TTA::MemMerge(uVar6,uVar8);
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20
                                           ));
      piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
      uVar30 = local_268;
      goto LAB_002eb76f;
    }
    piVar36 = (int *)(lVar18 + (lVar26 + 0x100000000 >> 0x1e));
    *piVar36 = *piVar36 + 1;
    if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                 *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') goto LAB_002f4e2f;
    lVar33 = (long)iVar7;
    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + (uVar20 - 2) * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * uVar20));
LAB_002f630e:
    plVar35 = (long *)((ulong)plVar12 & 0xffffffff);
    uVar17 = uVar30;
    piVar25 = local_278;
    goto LAB_002f6327;
  }
LAB_002f06bb:
  lVar28 = (long)(int)plVar31;
  piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
  iVar7 = (int)plVar12;
  piVar25 = local_278;
  plVar35 = plVar34;
  if ((int)local_180 < (int)plVar31) {
    if (cVar23 == '\0') {
      piVar36 = (int *)(*local_1a8 * (uVar20 | 1) + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + (uVar20 | 1) * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
      goto LAB_002fbd54;
      piVar36 = (int *)((long)local_2c8 + (long)iVar7 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar6 = *(uint *)(local_340._24_8_ + (long)iVar7 * 4 + *local_2f0 * uVar20);
      goto LAB_002fbf49;
    }
    lVar29 = (long)iVar7;
    piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 4 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_) != '\0')
    {
LAB_002f3a4e:
      piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      plVar34 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + (uVar20 - 2) * *local_2f0);
      goto LAB_002f459c;
    }
LAB_002f0756:
    piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
    lVar33 = lVar32;
    plVar35 = plVar34;
joined_r0x002f454e:
    if (cVar23 != '\0') goto LAB_002f4558;
    goto LAB_002fbd19;
  }
  lVar29 = (long)iVar7;
  if (cVar23 == '\0') {
    uVar13 = uVar20 | 1;
    piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * uVar13 + local_258._24_8_);
    piVar36 = (int *)(*local_1a8 * uVar20 + local_1e0 + 0xc + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    cVar14 = *(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_);
    if (cVar23 != '\0') {
      if (cVar14 == '\0') {
LAB_002f475d:
        piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
        *piVar36 = *piVar36 + 1;
        plVar12 = (long *)(*local_2f0 * uVar20 + local_340._24_8_);
        lVar33 = *local_290;
LAB_002f4793:
        plVar31 = (long *)(lVar33 * uVar20 + (long)local_2c8);
        uVar6 = *(uint *)((long)plVar12 + lVar29 * 4);
        goto LAB_002f4737;
      }
      piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * (uVar20 - 1) + local_258._24_8_) ==
          '\0') {
LAB_002f4671:
        piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
        goto joined_r0x002f0e86;
      }
      goto LAB_002f46af;
    }
    uVar30 = local_268;
    if (cVar14 != '\0') {
      lVar26 = uVar20 - 1;
      piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + lVar26 * *(long *)local_258._80_8_ + local_258._24_8_);
        goto joined_r0x002f0f16;
      }
LAB_002f49eb:
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
      goto LAB_002f4737;
    }
    piVar36 = (int *)(*local_1a8 * uVar13 + local_1e0 + 0xc + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar29 + 3 + uVar13 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = 0;
      goto LAB_002fc8b3;
    }
LAB_002f6087:
    uVar6 = TTA::MemNewLabel();
  }
  else {
    lVar33 = uVar20 - 1;
    piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 0xc + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x002f0e86:
        if (cVar23 == '\0') goto LAB_002f475d;
        goto LAB_002f46af;
      }
LAB_002f45de:
      piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + (uVar20 - 2) * *local_2f0);
    }
    else {
      piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
        piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        lVar26 = uVar20 - 2;
        if (*(char *)(lVar29 + 1 + lVar33 * *(long *)local_258._80_8_ + local_258._24_8_) != '\0') {
          piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar26);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar26 * *local_2f0);
LAB_002f799e:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
          }
          else {
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar26);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar26 * *local_2f0);
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * uVar20);
            *piVar36 = *piVar36 + 1;
LAB_002f3c20:
            uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
          }
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * uVar20);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = uVar6;
          uVar30 = local_268;
          piVar25 = local_278;
          goto LAB_002fc8b3;
        }
      }
LAB_002f46af:
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (uVar20 - 2));
      *piVar36 = *piVar36 + 1;
      plVar12 = (long *)(*local_290 * uVar20 + (long)local_2c8);
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + (uVar20 - 2) * *local_2f0);
    }
    piVar36 = (int *)((long)plVar12 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
LAB_002f46f6:
    uVar8 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * uVar20);
LAB_002f470a:
    uVar6 = TTA::MemMerge(uVar6,uVar8);
  }
  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
  piVar25 = local_278;
LAB_002f4737:
  piVar36 = (int *)((long)plVar31 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * uVar20) = uVar6;
  uVar30 = local_268;
  goto LAB_002fc8b3;
LAB_002f4dcf:
  piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + (uVar20 - 2) * *local_2f0);
LAB_002f4e11:
  piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
  uVar30 = local_268;
  lVar33 = lVar32;
  goto LAB_002eb76f;
LAB_002f0b8d:
  lVar33 = (lVar29 << 0x20) + 0x300000000;
  piVar36 = (int *)(lVar28 + (lVar33 >> 0x1e));
  *piVar36 = *piVar36 + 1;
  lVar33 = lVar33 >> 0x20;
  if (*(char *)(lVar33 + *(long *)local_258._80_8_ * uVar20 + local_258._24_8_) == '\0')
  goto LAB_002fc958;
  lVar28 = uVar20 - 1;
  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + lVar33 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) != '\0') {
LAB_002f4025:
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + (long)(int)lVar29 * 4 + *local_2f0 * uVar20);
    goto LAB_002f4087;
  }
  lVar26 = (lVar29 << 0x20) + 0x400000000;
  piVar36 = (int *)((lVar26 >> 0x1e) + *local_1a8 * lVar28 + local_1e0);
  *piVar36 = *piVar36 + 1;
  lVar26 = lVar26 >> 0x20;
  if (*(char *)(lVar26 + *(long *)local_258._80_8_ * lVar28 + local_258._24_8_) == '\0') {
    piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
    goto joined_r0x002f1432;
  }
  lVar37 = uVar20 - 2;
  piVar36 = (int *)(*local_1a8 * lVar37 + local_1e0 + lVar33 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar37 + local_258._24_8_) != '\0') {
    piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar37);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + lVar37 * *local_2f0);
LAB_002f49a8:
    lVar26 = (long)(int)lVar29;
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    lVar33 = *local_2f0 * uVar20;
LAB_002f49c9:
    uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar33);
    uVar30 = local_268;
    goto LAB_002fd3d3;
  }
  piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)((long)plVar12 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar37);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar37 * *local_2f0);
    lVar33 = *local_290;
    goto LAB_002f7e06;
  }
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * lVar37);
  *piVar36 = *piVar36 + 1;
  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * lVar37);
  piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar37);
  *piVar36 = *piVar36 + 1;
  uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar37 * *local_2f0);
LAB_002f773e:
  uVar30 = local_268;
  uVar6 = TTA::MemMerge(uVar6,uVar8);
  piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  uVar8 = *(uint *)(local_340._24_8_ + (long)(int)lVar29 * 4 + *local_2f0 * uVar20);
  goto LAB_002f777b;
LAB_002f0499:
  piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
  uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + (uVar20 - 2) * *local_2f0);
LAB_002f0e0c:
  piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  uVar30 = local_268;
  goto LAB_002fd5b9;
LAB_002f4e2f:
  piVar36 = (int *)(*local_1a8 * (uVar20 - 1) + local_1e0 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)((long)plVar12 + (uVar20 - 1) * *(long *)local_258._80_8_ + local_258._24_8_);
  uVar30 = local_268;
joined_r0x002f1432:
  local_268 = uVar30;
  if (cVar23 == '\0') {
LAB_002f8e83:
    piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + *local_290 * uVar20);
    *piVar36 = *piVar36 + 1;
    plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
    uVar6 = *(uint *)(local_340._24_8_ + (long)(int)lVar29 * 4 + *local_2f0 * uVar20);
    goto LAB_002f8ecb;
  }
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
  piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                       (long)(int)lVar29 * 4 + *local_2f0 * uVar20));
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  piVar25 = local_278;
  goto LAB_002f27a1;
LAB_002f7dd0:
  piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  uVar6 = *(uint *)(local_340._24_8_ + lVar27 * 4 + (uVar20 - 2) * *local_2f0);
  lVar33 = *local_290;
LAB_002f7e06:
  uVar30 = local_268;
  piVar36 = (int *)((long)local_2c8 + (long)(int)lVar29 * 4 + lVar33 * uVar20);
  *piVar36 = *piVar36 + 1;
  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                       (long)(int)lVar29 * 4 + *local_2f0 * uVar20));
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  lVar33 = lVar32;
  goto LAB_002eb76f;
LAB_002f7636:
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
  uVar30 = local_268;
LAB_002f767e:
  piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  piVar25 = local_278;
  goto LAB_002fb698;
LAB_002f819b:
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * uVar20);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
  uVar30 = local_268;
  piVar25 = local_278;
  goto LAB_002f27a1;
LAB_002f4d78:
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
  uVar6 = *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
  uVar30 = local_268;
LAB_002fd5b5:
  piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
LAB_002fd5b9:
  *(uint *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar6;
  lVar33 = lVar32;
  goto LAB_002eb76f;
LAB_002fdc43:
  piVar36 = (int *)((long)local_2c8 + (long)plVar12 * 4 + *local_290 * (uVar20 - 2));
  *piVar36 = *piVar36 + 1;
  plVar31 = (long *)(*local_290 * uVar20 + (long)local_2c8);
  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + (uVar20 - 2) * *local_2f0);
LAB_002fdc8b:
  piVar36 = (int *)((long)plVar31 + (long)plVar12 * 4);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + (long)plVar12 * 4 + *local_2f0 * uVar20) = uVar15;
  uVar30 = local_268;
  goto LAB_002f27a1;
LAB_003001bd:
  plVar19 = (long *)(lVar33 + lVar29 + 2);
  plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
LAB_003001cf:
  piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * local_148);
  *piVar36 = *piVar36 + 1;
  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * local_148);
  piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar15;
  lVar26 = (long)(int)plVar31;
  plVar19 = (long *)(lVar26 + 2);
  if ((int)plVar19 < (int)local_180) {
    piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
      piVar36 = (int *)(local_1e0 + *local_1a8 * lVar32 + 0xc + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
        plVar31 = (long *)((ulong)plVar19 & 0xffffffff);
        goto LAB_002fea62;
      }
      piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0xc + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) !=
          '\0') {
        plVar31 = (long *)((ulong)plVar19 & 0xffffffff);
        goto LAB_0030086f;
      }
      piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0x10 + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar26 + 4 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) ==
          '\0') {
        uVar6 = TTA::MemNewLabel();
        plVar31 = (long *)((ulong)plVar19 & 0xffffffff);
        plVar34 = local_190;
        goto LAB_002ff6e9;
      }
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * local_140 + 0x10);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * local_140 + 0x10);
      goto LAB_00300800;
    }
    piVar36 = (int *)(local_1e0 + *local_1a8 * (long)plVar34 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) != '\0'
       ) {
      piVar36 = (int *)(local_1e0 + *local_1a8 * (long)plVar12 + 8 + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar26 + 2 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_) ==
          '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar32);
      }
      else {
        piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + 4 + lVar26 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar26 + 1 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_) !=
            '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
          goto LAB_0030063b;
        }
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12 + 8);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12 + 8);
      }
      uVar6 = TTA::MemMerge(uVar6,uVar8);
      plVar12 = local_270;
      plVar34 = local_190;
LAB_0030063b:
      plVar31 = (long *)((ulong)plVar19 & 0xffffffff);
      goto LAB_00301a98;
    }
    piVar36 = (int *)(local_1e0 + *local_1a8 * lVar32 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0')
    goto code_r0x00300423;
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar32);
    plVar35 = (long *)((ulong)plVar19 & 0xffffffff);
    goto LAB_00302806;
  }
  if ((int)local_180 < (int)plVar19) goto LAB_0030313e;
  piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 8 + lVar26 * 4);
  *piVar36 = *piVar36 + 1;
  iVar7 = (int)uVar30;
  if (*(char *)(lVar26 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
    piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32 + 8);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0 + 8) = 0;
      goto LAB_003037a6;
    }
    piVar36 = (int *)(*local_1a8 * (long)(iVar7 + -2) + local_1e0 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + (long)(iVar7 + -2) * *(long *)local_258._80_8_ + local_258._24_8_) !=
        '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)(iVar7 + -3) + 8);
      *piVar36 = *piVar36 + 1;
      lVar33 = *local_290;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar26 * 4 + (long)(iVar7 + -3) * *local_2f0 + 8);
      goto LAB_0030468c;
    }
    uVar6 = TTA::MemNewLabel();
  }
  else {
    piVar36 = (int *)(*local_1a8 * (long)(iVar7 + -2) + local_1e0 + 0xc + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 3 + (long)(iVar7 + -2) * *(long *)local_258._80_8_ + local_258._24_8_) ==
        '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      lVar33 = *local_290;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar32);
LAB_0030468c:
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + lVar33 * lVar32 + 8);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0 + 8) = uVar15;
      goto LAB_003037a6;
    }
    lVar33 = (long)(iVar7 + -3);
    piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 8 + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 2 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar33 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar33 * *local_2f0 + 8);
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar32);
    }
    else {
      piVar36 = (int *)(*local_1a8 * lVar33 + local_1e0 + 4 + lVar26 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar26 + 1 + *(long *)local_258._80_8_ * lVar33 + local_258._24_8_);
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar33);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar33);
      if (cVar23 != '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32 + 8);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0 + 8) = uVar6;
        goto LAB_003037a6;
      }
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar33 + 8);
      *piVar36 = *piVar36 + 1;
      uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar33 * *local_2f0 + 8);
    }
    uVar6 = TTA::MemMerge(uVar6,uVar8);
  }
  piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32 + 8);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + lVar26 * 4 + lVar32 * *local_2f0 + 8) = uVar6;
  goto LAB_003037a6;
code_r0x00300423:
  piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0x10 + lVar26 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar26 + 4 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) == '\0')
  {
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * lVar32);
    plVar31 = (long *)((ulong)plVar19 & 0xffffffff);
LAB_003011c1:
    uVar30 = local_268;
    *piVar36 = *piVar36 + 1;
    uVar15 = *(undefined4 *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar32);
    piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
    *piVar36 = *piVar36 + 1;
    *(undefined4 *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar15;
    iVar7 = (int)plVar31;
    uVar6 = iVar7 + 2;
    local_178 = plVar31;
    if ((int)uVar6 < (int)local_180) {
      lVar29 = *(long *)local_258._80_8_;
      lVar27 = (long)iVar7;
      local_160 = (long *)(lVar27 + 2);
      lVar26 = lVar27 << 0x20;
      lVar28 = lVar27 * 4;
      lVar33 = local_1e0 + lVar27 * 4;
      local_188 = (long *)(local_1e0 + *local_1a8 * lVar32 + lVar27 * 4 + 8);
      lVar18 = local_258._24_8_ + lVar27;
      lVar37 = 0;
      while( true ) {
        piVar36 = (int *)((long)local_188 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        plVar24 = local_270;
        plVar12 = local_270;
        plVar34 = local_190;
        if (*(char *)(lVar29 * lVar32 + lVar27 + local_258._24_8_ + 2 + lVar37) == '\0') {
          plVar31 = (long *)((long)local_160 + lVar37);
          piVar36 = (int *)((lVar26 + 0x300000000 >> 0x1e) + *local_1a8 * lVar32 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar33 = lVar26 + 0x300000000 >> 0x20;
          plVar19 = (long *)(lVar27 + 2 + lVar37);
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0')
          goto LAB_002fea62;
          piVar36 = (int *)(*local_1a8 * (long)local_190 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_) !=
              '\0') goto LAB_0030086f;
          piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) +
                           *local_1a8 * (long)local_190 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar33 = lVar26 + 0x400000000 >> 0x20;
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_) ==
              '\0') goto LAB_002fe993;
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)local_270);
          goto LAB_002ffc5b;
        }
        piVar36 = (int *)(*local_1a8 * local_260 + lVar33 + 0xc + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        lVar22 = lVar26 >> 0x1e;
        lVar11 = lVar26 >> 0x20;
        if (*(char *)(lVar37 + 3 + *(long *)local_258._80_8_ * local_260 + lVar18) != '\0') break;
        piVar36 = (int *)(*local_1a8 * lVar32 + lVar33 + 0xc + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 3 + *(long *)local_258._80_8_ * lVar32 + lVar18) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * lVar32);
          plVar19 = (long *)(lVar27 + lVar37 + 2);
          plVar35 = (long *)(ulong)(uint)((int)local_160 + (int)lVar37);
          goto LAB_00302806;
        }
        piVar36 = (int *)(*local_1a8 * local_260 + lVar33 + 0x10 + lVar37 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar37 + 4 + *(long *)local_258._80_8_ * local_260 + lVar18) != '\0') {
          plVar31 = (long *)((long)local_160 + lVar37);
          piVar36 = (int *)(*local_1a8 * local_128 + local_1e0 + lVar27 * 4 + 0xc + lVar37 * 4);
          *piVar36 = *piVar36 + 1;
          plVar19 = (long *)(lVar27 + 2 + lVar37);
          if (*(char *)(lVar27 + lVar37 + 3 +
                       *(long *)local_258._80_8_ * local_128 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 +
                             lVar37 * 4 + lVar27 * 4 + *local_290 * local_128 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_128 + 0x10);
            piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * lVar32));
            uVar30 = local_268;
            plVar24 = local_270;
            plVar34 = local_190;
            goto LAB_002ffc5b;
          }
          piVar36 = (int *)(*local_1a8 * local_128 + local_1e0 + lVar27 * 4 + 8 + lVar37 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar37 + 2 +
                       *(long *)local_258._80_8_ * local_128 + local_258._24_8_ + lVar27) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar27 * 4 + *local_290 * local_128 + 8
                             );
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_128 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * lVar32);
          }
          else {
            piVar36 = (int *)(lVar22 + *local_1a8 * local_260 + local_1e0);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar11 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) == '\0'
               ) {
              piVar36 = (int *)((long)local_2c8 +
                               lVar37 * 4 + lVar27 * 4 + *local_290 * local_128 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_128 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * lVar32);
            }
            else {
              piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) + *local_1a8 * local_128 + local_1e0)
              ;
              *piVar36 = *piVar36 + 1;
              if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                           *(long *)local_258._80_8_ * local_128 + local_258._24_8_) != '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * local_128);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * local_128);
                goto LAB_002ffc5b;
              }
              piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * local_128);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * local_128);
              piVar36 = (int *)((long)local_2c8 +
                               lVar37 * 4 + lVar27 * 4 + *local_290 * local_128 + 8);
              *piVar36 = *piVar36 + 1;
              uVar8 = *(uint *)(local_340._24_8_ +
                               lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_128 + 8);
            }
          }
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          plVar24 = local_270;
          plVar34 = local_190;
          goto LAB_002ffc5b;
        }
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar32 + lVar28);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + *local_2f0 * lVar32 + lVar28);
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + *local_290 * lVar32 + lVar28 + 8);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar37 * 4 + *local_2f0 * lVar32 + lVar28 + 8) = uVar15;
        lVar26 = lVar26 + 0x200000000;
        lVar22 = lVar27 + lVar37;
        lVar37 = lVar37 + 2;
        if ((long)local_278 <= lVar22 + 4) {
          uVar6 = iVar7 + (int)lVar37 + 2;
          plVar31 = (long *)(ulong)(uint)(iVar7 + (int)lVar37);
          goto LAB_00303131;
        }
      }
      plVar31 = (long *)((long)local_160 + lVar37);
      piVar36 = (int *)(*local_1a8 * local_120 + local_1e0 + lVar27 * 4 + 8 + lVar37 * 4);
      *piVar36 = *piVar36 + 1;
      plVar19 = (long *)(lVar27 + 2 + lVar37);
      if (*(char *)(lVar27 + lVar37 + 2 + *(long *)local_258._80_8_ * local_120 + local_258._24_8_)
          == '\0') {
        piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar27 * 4 + *local_290 * local_120 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_120 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar22 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar22 + *local_2f0 * lVar32));
        uVar30 = local_268;
        plVar12 = local_270;
        plVar34 = local_190;
      }
      else {
        piVar36 = (int *)(lVar22 + *local_1a8 * local_260 + local_1e0);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar11 + *(long *)local_258._80_8_ * local_260 + local_258._24_8_) == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar27 * 4 + *local_290 * local_120 + 8);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_120 + 8)
          ;
          piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * lVar32);
        }
        else {
          piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) + *local_1a8 * local_120 + local_1e0);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                       *(long *)local_258._80_8_ * local_120 + local_258._24_8_) != '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * local_120);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * local_120);
            goto LAB_00301a98;
          }
          piVar36 = (int *)((long)local_2c8 + lVar11 * 4 + *local_290 * local_120);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar11 * 4 + *local_2f0 * local_120);
          piVar36 = (int *)((long)local_2c8 + lVar37 * 4 + lVar27 * 4 + *local_290 * local_120 + 8);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar37 * 4 + lVar27 * 4 + *local_2f0 * local_120 + 8)
          ;
        }
        uVar6 = TTA::MemMerge(uVar6,uVar8);
        plVar12 = local_270;
        plVar34 = local_190;
      }
LAB_00301a98:
      piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar6;
      iVar7 = (int)plVar31;
      iVar9 = iVar7 + 2;
      if (iVar9 < (int)local_180) {
        lVar29 = (long)iVar7;
        local_178 = (long *)(lVar29 + 2);
        lVar37 = lVar29 << 0x20;
        lVar33 = lVar29 * 4;
        lVar28 = 0;
        do {
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 + 8 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          lVar26 = *local_1a8 * lVar32 + local_1e0;
          if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar29)
              == '\0') {
            plVar31 = (long *)((long)local_178 + lVar28);
            piVar36 = (int *)(lVar26 + (lVar37 + 0x300000000 >> 0x1e));
            *piVar36 = *piVar36 + 1;
            lVar33 = lVar37 + 0x300000000 >> 0x20;
            plVar19 = (long *)(lVar29 + 2 + lVar28);
            if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
              plVar31 = (long *)((ulong)plVar31 & 0xffffffff);
              goto LAB_002fea62;
            }
            piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) !=
                '\0') {
              plVar31 = (long *)((ulong)plVar31 & 0xffffffff);
              goto LAB_0030086f;
            }
            lVar26 = lVar37 + 0x400000000 >> 0x20;
            piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                             *local_1a8 * (long)plVar34 + local_1e0);
            *piVar36 = *piVar36 + 1;
            cVar23 = *(char *)(lVar26 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_
                              );
            piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar29 * 4 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            cVar14 = *(char *)(lVar28 + 2 +
                              *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar29)
            ;
            if (cVar23 == '\0') {
              if (cVar14 == '\0') goto LAB_002ff6d8;
              goto LAB_003001cf;
            }
            if (cVar14 == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
            }
            else {
              piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + lVar33 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)((long)local_2c8 +
                                 lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8);
                piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     lVar26 * 4 + *local_2f0 * (long)plVar12));
                plVar12 = local_270;
                plVar34 = local_190;
              }
              else {
                piVar36 = (int *)((long)local_2c8 +
                                 lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8);
              }
            }
            plVar24 = plVar12;
            plVar31 = (long *)((ulong)plVar31 & 0xffffffff);
            goto LAB_002ffc5b;
          }
          piVar36 = (int *)(lVar26 + lVar33 + 4 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          lVar18 = lVar37 >> 0x1e;
          lVar26 = lVar37 >> 0x20;
          plVar24 = plVar12;
          if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar29)
              == '\0') {
            piVar36 = (int *)(local_1e0 + lVar33 + *local_1a8 * (long)local_168 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 3 +
                         *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_ + lVar29) ==
                '\0') goto LAB_0030214b;
            piVar36 = (int *)(*local_1a8 * (long)local_168 + local_1e0 + lVar33 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 2 +
                         *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_ + lVar29) ==
                '\0') {
              piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + lVar33 + 8 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar28 + 2 +
                           *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_ + lVar29) ==
                  '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 + *local_290 * (long)plVar12
                                 );
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar28 * 4 + lVar33 + *local_2f0 * (long)plVar12);
                piVar36 = (int *)((long)local_2c8 +
                                 lVar28 * 4 + lVar33 + *local_290 * (long)plVar12 + 8);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ +
                                 lVar28 * 4 + lVar33 + *local_2f0 * (long)plVar12 + 8);
                goto LAB_00301ec1;
              }
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 + *local_290 * (long)plVar12);
              *piVar36 = *piVar36 + 1;
              lVar26 = *local_2f0 * (long)plVar12;
LAB_00301dd8:
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 + lVar26);
            }
            else {
              piVar36 = (int *)((long)local_2c8 +
                               lVar28 * 4 + lVar33 + *local_290 * (long)plVar12 + 8);
              *piVar36 = *piVar36 + 1;
              lVar26 = *local_2f0 * (long)plVar12;
LAB_00301ce5:
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 + lVar26 + 8);
            }
          }
          else {
            piVar36 = (int *)(local_1e0 + lVar33 + *local_1a8 * (long)plVar34 + 0xc + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 3 +
                         *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar29) ==
                '\0') {
              plVar31 = (long *)((long)local_178 + lVar28);
              piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar29 * 4 + 0xc + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              plVar19 = (long *)(lVar29 + 2 + lVar28);
              if (*(char *)(lVar29 + lVar28 + 3 +
                           *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * lVar32);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * lVar32);
                goto LAB_003027fe;
              }
              piVar36 = (int *)((lVar37 + 0x400000000 >> 0x1e) +
                               *local_1a8 * (long)plVar34 + local_1e0);
              *piVar36 = *piVar36 + 1;
              lVar33 = lVar37 + 0x400000000 >> 0x20;
              if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * lVar32);
                goto LAB_003011c1;
              }
              piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + lVar29 * 4 + 0xc +
                               lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              local_178 = plVar31;
              if (*(char *)(lVar28 + 3 +
                           *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_ + lVar29) ==
                  '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)plVar12);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)plVar12);
                lVar33 = *local_290;
              }
              else {
                piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar29 * 4 + 8 +
                                 lVar28 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar28 + 2 +
                             *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar29)
                    != '\0') {
                  piVar36 = (int *)((long)local_2c8 +
                                   lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ +
                                   lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8);
                  goto LAB_002ffc5b;
                }
                piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + lVar29 * 4 + 8 +
                                 lVar28 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar28 + 2 +
                             *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_ + lVar29)
                    != '\0') {
                  piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * (long)plVar12);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * (long)plVar12);
                  goto LAB_002ffc5b;
                }
                piVar36 = (int *)((long)local_2c8 +
                                 lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8);
                lVar33 = *local_290;
              }
              piVar36 = (int *)((long)local_2c8 + lVar18 + lVar33 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * lVar32)
                                   );
              plVar24 = local_270;
              plVar34 = local_190;
              plVar31 = local_178;
              goto LAB_002ffc5b;
            }
            piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar33 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 2 +
                         *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar29) !=
                '\0') {
              piVar36 = (int *)((long)local_2c8 +
                               lVar28 * 4 + lVar33 + *local_290 * (long)local_150 + 8);
              *piVar36 = *piVar36 + 1;
              lVar26 = *local_2f0 * (long)local_150;
              goto LAB_00301ce5;
            }
            piVar36 = (int *)(*local_1a8 * (long)local_170 + local_1e0 + lVar33 + 8 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + 2 +
                         *(long *)local_258._80_8_ * (long)local_170 + local_258._24_8_ + lVar29) !=
                '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 + *local_290 * (long)local_170
                               );
              *piVar36 = *piVar36 + 1;
              lVar26 = *local_2f0 * (long)local_170;
              goto LAB_00301dd8;
            }
            piVar36 = (int *)((long)local_2c8 +
                             lVar28 * 4 + lVar33 + *local_290 * (long)local_170 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar28 * 4 + lVar33 + *local_2f0 * (long)local_170 + 8);
            piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 + *local_2f0 * lVar32);
LAB_00301ec1:
            uVar6 = TTA::MemMerge(uVar6,uVar8);
            plVar12 = local_270;
            plVar34 = local_190;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar33 + *local_2f0 * lVar32 + 8) = uVar6;
          lVar37 = lVar37 + 0x200000000;
          lVar26 = lVar29 + lVar28;
          lVar28 = lVar28 + 2;
          if ((long)local_278 <= lVar26 + 4) {
            iVar9 = iVar7 + 2 + (int)lVar28;
            iVar7 = iVar7 + (int)lVar28;
            break;
          }
        } while( true );
      }
      lVar33 = (long)iVar9;
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_);
      iVar16 = (int)uVar30;
      if ((int)local_180 < iVar9) {
        if (cVar23 == '\0') goto LAB_00303fe7;
        lVar28 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        if (*(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) != '\0')
        goto LAB_0030363f;
        piVar36 = (int *)(*local_1a8 * (long)(iVar16 + -2) + local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        lVar29 = (long)(iVar16 + -3);
        lVar28 = *local_290 * lVar29;
        cVar14 = *(char *)(lVar33 + (long)(iVar16 + -2) * *(long *)local_258._80_8_ +
                                    local_258._24_8_);
joined_r0x003043b9:
        plVar34 = (long *)(lVar28 + (long)local_2c8);
        lVar28 = (long)iVar7;
        if (cVar14 == '\0') {
LAB_00304408:
          piVar36 = (int *)((long)plVar34 + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          plVar34 = (long *)(lVar29 * *local_2f0 + local_340._24_8_);
          lVar29 = *local_290;
          goto LAB_00303675;
        }
        piVar36 = (int *)((long)plVar34 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
      }
      else {
        lVar29 = *local_1a8 * lVar32 + local_1e0;
        lVar28 = (long)iVar7;
        if (cVar23 == '\0') {
          piVar36 = (int *)(lVar29 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
LAB_00303c96:
          if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0')
          goto LAB_00303fe7;
          lVar29 = (long)((int)uVar30 + -2);
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0')
          goto LAB_00303f83;
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          cVar23 = *(char *)(lVar33 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
          goto joined_r0x00303d2f;
        }
        piVar36 = (int *)(lVar29 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar29 = (long)(iVar16 + -2);
        cVar14 = *(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
        if (cVar14 == '\0') {
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          iVar16 = iVar16 + -3;
          cVar14 = *(char *)(lVar33 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_);
          if (cVar23 == '\0') {
            lVar29 = (long)iVar16;
            lVar28 = *local_290 * lVar29;
            goto joined_r0x003043b9;
          }
          if (cVar14 == '\0') {
            lVar29 = (long)iVar16;
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            plVar34 = (long *)(*local_290 * lVar29 + (long)local_2c8);
            cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
            goto LAB_003044db;
          }
        }
        else {
joined_r0x00302f47:
          if (cVar23 == '\0') goto LAB_0030363f;
          piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          iVar16 = (int)uVar30 + -3;
          if (*(char *)(lVar33 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0') {
            lVar29 = (long)iVar16;
            piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
            *piVar36 = *piVar36 + 1;
            plVar34 = (long *)(*local_290 * lVar29 + (long)local_2c8);
            if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) != '\0')
            goto LAB_00304408;
            goto LAB_0030422c;
          }
        }
        lVar29 = (long)iVar16;
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
        *piVar36 = *piVar36 + 1;
      }
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar29 * *local_2f0);
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = uVar15;
      goto LAB_003037a6;
    }
LAB_00303131:
    plVar19 = (long *)(ulong)uVar6;
    if ((int)local_180 < (int)uVar6) goto LAB_0030313e;
    lVar33 = (long)(int)uVar6;
    piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    iVar7 = (int)plVar31;
    if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
      lVar28 = *local_1a8 * lVar32 + local_1e0;
LAB_00303f1d:
      lVar29 = (long)iVar7;
      piVar36 = (int *)(lVar28 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
LAB_00303fe7:
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = 0;
        goto LAB_003037a6;
      }
      lVar28 = (long)((int)uVar30 + -2);
      piVar36 = (int *)(*local_1a8 * lVar28 + local_1e0 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      cVar23 = *(char *)(lVar29 + 3 + lVar28 * *(long *)local_258._80_8_ + local_258._24_8_);
joined_r0x00303d2f:
      if (cVar23 != '\0') {
LAB_00303f83:
        lVar28 = (long)((int)uVar30 + -3);
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar28);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar28 * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        goto LAB_00303fd0;
      }
      uVar6 = TTA::MemNewLabel();
    }
    else {
      lVar26 = (long)((int)local_268 + -2);
      lVar28 = (long)iVar7;
      piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar26 + local_258._24_8_) == '\0') {
LAB_0030363f:
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        plVar34 = (long *)(*local_2f0 * lVar32 + local_340._24_8_);
        lVar29 = *local_290;
LAB_00303675:
        uVar15 = *(undefined4 *)((long)plVar34 + lVar28 * 4);
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + lVar29 * lVar32);
        *piVar36 = *piVar36 + 1;
LAB_00303fd0:
        *(undefined4 *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = uVar15;
        goto LAB_003037a6;
      }
      lVar29 = (long)((int)local_268 + -3);
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      if ((*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_) == '\0') ||
         (piVar36 = (int *)(*local_1a8 * lVar26 + local_1e0 + lVar28 * 4), *piVar36 = *piVar36 + 1,
         *(char *)(lVar28 + lVar26 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')) {
LAB_0030421d:
        plVar34 = (long *)(*local_290 * lVar29 + (long)local_2c8);
LAB_0030422c:
        piVar36 = (int *)((long)plVar34 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar29 * *local_2f0);
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar32);
      }
      else {
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 4 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        plVar34 = (long *)(*local_290 * lVar29 + (long)local_2c8);
        cVar23 = *(char *)(lVar28 + 1 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
LAB_003044db:
        piVar36 = (int *)((long)plVar34 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + *local_2f0 * lVar29);
        if (cVar23 != '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = uVar6;
          goto LAB_003037a6;
        }
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
        *piVar36 = *piVar36 + 1;
        uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar29 * *local_2f0);
      }
      uVar6 = TTA::MemMerge(uVar6,uVar8);
    }
    piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar32);
    *piVar36 = *piVar36 + 1;
    *(uint *)(local_340._24_8_ + lVar33 * 4 + lVar32 * *local_2f0) = uVar6;
    goto LAB_003037a6;
  }
  piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + 0xc + lVar26 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar26 + 3 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_) == '\0')
  {
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12 + 0x10);
    *piVar36 = *piVar36 + 1;
    lVar33 = *local_290;
    uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12 + 0x10);
LAB_003007ce:
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + lVar33 * lVar32);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * lVar32);
  }
  else {
    piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + 8 + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 2 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_) == '\0'
       ) {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12 + 8);
      *piVar36 = *piVar36 + 1;
      lVar33 = *local_290;
      uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12 + 8);
      goto LAB_003007ce;
    }
    piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + 4 + lVar26 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar26 + 1 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_) != '\0'
       ) {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
      goto LAB_00300800;
    }
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12 + 8);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12 + 8);
  }
  uVar6 = TTA::MemMerge(uVar6,uVar8);
  plVar12 = local_270;
  plVar34 = local_190;
LAB_00300800:
  plVar24 = plVar12;
  plVar31 = (long *)((ulong)plVar19 & 0xffffffff);
  goto LAB_002ffc5b;
LAB_0030214b:
  piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar29 * 4 + 0xc + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  plVar31 = (long *)((long)local_178 + lVar28);
  plVar19 = (long *)(lVar29 + lVar28 + 2);
  lVar33 = *local_1a8 * (long)local_168 + local_1e0;
  local_188 = plVar19;
  if (*(char *)(lVar29 + lVar28 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0'
     ) {
    piVar36 = (int *)(lVar33 + lVar29 * 4 + 8 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 2 +
                 *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_ + lVar29) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * (long)plVar12);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * (long)plVar12);
    }
    else {
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8)
      ;
    }
LAB_003027fe:
    local_178 = (long *)((long)local_178 + lVar28);
    plVar35 = local_178;
    goto LAB_00302806;
  }
  lVar27 = lVar37 + 0x400000000 >> 0x20;
  piVar36 = (int *)(lVar33 + (lVar37 + 0x400000000 >> 0x1e));
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(lVar27 + *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_);
  piVar36 = (int *)(*local_1a8 * (long)local_168 + local_1e0 + lVar29 * 4 + 8 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  cVar14 = *(char *)(lVar28 + 2 +
                    *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_ + lVar29);
  local_178 = plVar31;
  if (cVar23 == '\0') {
    if (cVar14 == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * (long)plVar12);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * (long)plVar12);
LAB_002ff6e9:
      piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
      *piVar36 = *piVar36 + 1;
      *(uint *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar6;
      iVar7 = (int)plVar31;
      uVar6 = iVar7 + 2;
      if ((int)uVar6 < (int)local_180) {
        lVar33 = (long)iVar7;
        local_178 = (long *)(lVar33 + 2);
        lVar26 = lVar33 << 0x20;
        lVar28 = lVar33 * 4;
        lVar29 = 0;
        while( true ) {
          plVar12 = local_270;
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 + 8 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 2 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar33)
              != '\0') {
            plVar31 = (long *)((long)local_178 + lVar29);
            piVar36 = (int *)((lVar26 + 0x300000000 >> 0x1e) +
                             local_1e0 + *local_1a8 * (long)plVar34);
            *piVar36 = *piVar36 + 1;
            lVar28 = lVar26 + 0x300000000 >> 0x20;
            plVar19 = (long *)(lVar33 + 2 + lVar29);
            lVar37 = lVar26 >> 0x1e;
            if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) !=
                '\0') {
              piVar36 = (int *)((long)local_2c8 +
                               lVar29 * 4 + lVar33 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar29 * 4 + lVar33 * 4 + *local_2f0 * (long)local_270 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              local_188 = plVar19;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * lVar32)
                                   );
              plVar19 = local_188;
              plVar34 = local_190;
              goto LAB_00301a98;
            }
            piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * lVar32);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * lVar32);
              plVar35 = plVar31;
              goto LAB_00302806;
            }
            piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) +
                             *local_1a8 * (long)plVar34 + local_1e0);
            *piVar36 = *piVar36 + 1;
            lVar18 = lVar26 + 0x400000000 >> 0x20;
            if (*(char *)(lVar18 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) ==
                '\0') {
              lVar26 = lVar26 >> 0x20;
              piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * lVar32);
              goto LAB_003011c1;
            }
            piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_)
                == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar18 * 4 + *local_290 * (long)local_270);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar18 * 4 + *local_2f0 * (long)local_270);
              lVar33 = *local_290;
            }
            else {
              piVar36 = (int *)((long)local_2c8 +
                               lVar29 * 4 + lVar33 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar29 * 4 + lVar33 * 4 + *local_2f0 * (long)local_270 + 8);
              lVar33 = *local_290;
            }
            piVar36 = (int *)((long)local_2c8 + lVar37 + lVar33 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * lVar32));
            plVar24 = local_270;
            plVar34 = local_190;
            goto LAB_002ffc5b;
          }
          piVar36 = (int *)(local_1e0 + lVar28 + *local_1a8 * lVar32 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          iVar16 = (int)lVar29;
          iVar9 = (int)local_178;
          if (*(char *)(lVar29 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + lVar33)
              == '\0') {
            plVar19 = (long *)(lVar33 + lVar29 + 2);
            plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
            goto LAB_002fea62;
          }
          piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 + 0xc + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 3 +
                       *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar33) !=
              '\0') break;
          piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 + 0x10 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar29 + 4 +
                       *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_ + lVar33) !=
              '\0') {
            plVar31 = (long *)(ulong)(uint)(iVar9 + iVar16);
            piVar36 = (int *)((long)local_2c8 +
                             lVar29 * 4 + lVar33 * 4 + *local_290 * (long)local_270 + 0x10);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar29 * 4 + lVar33 * 4 + *local_2f0 * (long)local_270 + 0x10);
            plVar19 = (long *)(lVar33 + lVar29 + 2);
            plVar24 = local_270;
            goto LAB_002ffc5b;
          }
          uVar6 = TTA::MemNewLabel();
          piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + lVar28 + *local_290 * lVar32 + 8);
          *piVar36 = *piVar36 + 1;
          *(uint *)(local_340._24_8_ + lVar29 * 4 + lVar28 + *local_2f0 * lVar32 + 8) = uVar6;
          lVar26 = lVar26 + 0x200000000;
          lVar37 = lVar33 + lVar29;
          lVar29 = lVar29 + 2;
          plVar34 = local_190;
          if ((long)local_278 <= lVar37 + 4) {
            uVar6 = iVar7 + (int)lVar29 + 2;
            iVar7 = iVar7 + (int)lVar29;
            goto LAB_0030306f;
          }
        }
        lVar33 = lVar33 + lVar29;
        uVar6 = iVar9 + iVar16;
LAB_003001b8:
        plVar19 = (long *)(lVar33 + 2);
        plVar31 = (long *)(ulong)uVar6;
LAB_0030086f:
        uVar30 = local_268;
        piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * local_158);
        *piVar36 = *piVar36 + 1;
        uVar15 = *(undefined4 *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * local_158);
        piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        *(undefined4 *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = uVar15;
        iVar7 = (int)plVar31;
        uVar6 = iVar7 + 2;
        if ((int)uVar6 < (int)local_180) {
          lVar33 = *local_1a8;
          lVar28 = *(long *)local_258._80_8_;
          local_188 = (long *)(long)iVar7;
          lVar26 = (long)local_188 << 0x20;
          lVar27 = local_1e0 + (long)local_188 * 4 + 0xc;
          lVar29 = (long)local_188 * 4 + 8;
          lVar37 = (long)local_188 * 4 + 8;
          lVar18 = 0;
          while (piVar36 = (int *)(lVar33 * lVar32 + (long)local_188 * 4 + local_1e0 + 8 +
                                  lVar18 * 4), *piVar36 = *piVar36 + 1, plVar24 = local_270,
                plVar12 = local_270, plVar34 = local_190, local_160 = plVar31,
                *(char *)((long)local_188 + lVar18 + local_258._24_8_ + lVar28 * lVar32 + 2) == '\0'
                ) {
            piVar36 = (int *)(*local_1a8 * lVar32 + lVar27 + lVar18 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)local_188 +
                         lVar18 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + 3) == '\0'
               ) goto LAB_00300b67;
            piVar36 = (int *)(*local_1a8 * (long)local_190 + lVar27 + lVar18 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)local_188 +
                         lVar18 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_ + 3
                         ) == '\0') {
              piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) +
                               *local_1a8 * (long)local_190 + local_1e0);
              *piVar36 = *piVar36 + 1;
              lVar33 = lVar26 + 0x400000000 >> 0x20;
              cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * (long)local_190 +
                                          local_258._24_8_);
              piVar36 = (int *)(*local_1a8 * (long)local_190 + local_1e0 + (long)local_188 * 4 + 8 +
                               lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              plVar31 = (long *)(((ulong)plVar31 & 0xffffffff) + lVar18 + 2);
              cVar14 = *(char *)((long)local_188 +
                                *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_ +
                                lVar18 + 2);
              plVar19 = (long *)((long)local_188 + lVar18 + 2);
              if (cVar23 == '\0') {
                if (cVar14 != '\0') goto LAB_003001cf;
                uVar6 = TTA::MemNewLabel();
                plVar34 = local_190;
                goto LAB_002ff6e9;
              }
              if (cVar14 == '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * local_138);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * local_138);
                goto LAB_002ffc5b;
              }
              piVar36 = (int *)(*local_1a8 * local_130 + local_1e0 + (long)local_188 * 4 + 0xc +
                               lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)local_188 +
                           lVar18 + 3 + *(long *)local_258._80_8_ * local_130 + local_258._24_8_) ==
                  '\0') {
                piVar36 = (int *)((long)local_2c8 +
                                 lVar18 * 4 + (long)local_188 * 4 + *local_290 * local_130 + 8);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar18 * 4 + (long)local_188 * 4 + *local_2f0 * local_130 + 8);
                piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * local_130);
                *piVar36 = *piVar36 + 1;
                uVar8 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * local_130);
                goto LAB_003010e2;
              }
              piVar36 = (int *)((long)local_2c8 +
                               lVar18 * 4 + (long)local_188 * 4 + *local_290 * local_130 + 8);
              *piVar36 = *piVar36 + 1;
              lVar33 = *local_2f0 * local_130;
LAB_00300cd9:
              uVar6 = *(uint *)(local_340._24_8_ + lVar18 * 4 + (long)local_188 * 4 + lVar33 + 8);
              goto LAB_002ffc5b;
            }
            piVar36 = (int *)((long)local_2c8 + lVar18 * 4 + *local_290 * (long)local_270 + lVar37);
            *piVar36 = *piVar36 + 1;
            uVar15 = *(undefined4 *)
                      (local_340._24_8_ + lVar18 * 4 + *local_2f0 * (long)local_270 + lVar29);
            piVar36 = (int *)((long)local_2c8 + lVar18 * 4 + *local_290 * lVar32 + lVar37);
            *piVar36 = *piVar36 + 1;
            *(undefined4 *)(local_340._24_8_ + lVar18 * 4 + *local_2f0 * lVar32 + lVar29) = uVar15;
            lVar26 = lVar26 + 0x200000000;
            lVar22 = lVar18 + 4;
            lVar18 = lVar18 + 2;
            if ((long)local_278 <= (long)local_188 + lVar22) {
              uVar6 = iVar7 + (int)lVar18 + 2;
              plVar31 = (long *)(ulong)(uint)(iVar7 + (int)lVar18);
              goto LAB_00302eba;
            }
          }
          plVar31 = (long *)(((ulong)plVar31 & 0xffffffff) + lVar18 + 2);
          piVar36 = (int *)((lVar26 + 0x300000000 >> 0x1e) +
                           *local_1a8 * (long)local_190 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar33 = lVar26 + 0x300000000 >> 0x20;
          plVar19 = (long *)((long)local_188 + lVar18 + 2);
          lVar28 = lVar26 >> 0x1e;
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_) !=
              '\0') {
            piVar36 = (int *)(local_1e0 + *local_1a8 * (long)local_190 + (long)local_188 * 4 + 8 +
                             lVar18 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)local_188 +
                         lVar18 + 2 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_
                         ) == '\0') {
              piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + (long)local_188 * 4 + 8 +
                               lVar18 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)((long)local_188 +
                           lVar18 + 2 +
                           *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_) == '\0')
              {
                piVar36 = (int *)((long)local_2c8 +
                                 lVar18 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8
                                 );
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ +
                                 lVar18 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8
                                 );
                piVar36 = (int *)((long)local_2c8 + lVar28 + *local_290 * lVar32);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     lVar28 + *local_2f0 * lVar32));
                plVar12 = local_270;
                plVar34 = local_190;
              }
              else {
                piVar36 = (int *)((long)local_2c8 + lVar28 + *local_290 * (long)local_270);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar28 + *local_2f0 * (long)local_270);
              }
            }
            else {
              piVar36 = (int *)((long)local_2c8 +
                               lVar18 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar18 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
            }
            goto LAB_00301a98;
          }
          piVar36 = (int *)(local_1e0 + *local_1a8 * lVar32 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar28 + *local_290 * lVar32);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar28 + *local_2f0 * lVar32);
            plVar35 = (long *)((ulong)plVar31 & 0xffffffff);
            goto LAB_00302806;
          }
          piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) +
                           *local_1a8 * (long)local_190 + local_1e0);
          *piVar36 = *piVar36 + 1;
          lVar29 = lVar26 + 0x400000000 >> 0x20;
          if (*(char *)(lVar29 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_) ==
              '\0') {
            lVar26 = lVar26 >> 0x20;
            piVar36 = (int *)((long)local_2c8 + lVar28 + *local_290 * lVar32);
            plVar31 = (long *)((ulong)plVar31 & 0xffffffff);
            goto LAB_003011c1;
          }
          piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar33 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)(lVar33 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_) ==
              '\0') {
            piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * (long)local_270);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * (long)local_270);
            lVar33 = *local_290;
          }
          else {
            piVar36 = (int *)(*local_1a8 * (long)local_190 + local_1e0 + (long)local_188 * 4 + 8 +
                             lVar18 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)local_188 +
                         lVar18 + 2 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_
                         ) != '\0') {
              piVar36 = (int *)((long)local_2c8 +
                               lVar18 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              lVar33 = *local_2f0 * (long)local_270;
              goto LAB_00300cd9;
            }
            piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + (long)local_188 * 4 + 8 +
                             lVar18 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)local_188 +
                         lVar18 + 2 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_
                         ) != '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar28 + *local_290 * (long)local_270);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar28 + *local_2f0 * (long)local_270);
              goto LAB_002ffc5b;
            }
            piVar36 = (int *)((long)local_2c8 +
                             lVar18 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar18 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
            lVar33 = *local_290;
          }
          piVar36 = (int *)((long)local_2c8 + lVar28 + lVar33 * lVar32);
          *piVar36 = *piVar36 + 1;
          uVar8 = *(uint *)(local_340._24_8_ + lVar28 + *local_2f0 * lVar32);
LAB_003010e2:
          uVar6 = TTA::MemMerge(uVar6,uVar8);
          plVar24 = local_270;
          plVar34 = local_190;
          goto LAB_002ffc5b;
        }
LAB_00302eba:
        plVar19 = (long *)(ulong)uVar6;
        if ((int)local_180 < (int)uVar6) goto LAB_0030313e;
        lVar33 = (long)(int)uVar6;
        piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4);
        *piVar36 = *piVar36 + 1;
        lVar28 = (long)(int)plVar31;
        if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
          piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar28 * 4);
          *piVar36 = *piVar36 + 1;
          goto LAB_00303c96;
        }
        lVar29 = (long)((int)local_268 + -2);
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
        goto joined_r0x00302f47;
      }
LAB_0030306f:
      plVar19 = (long *)(ulong)uVar6;
      if ((int)local_180 < (int)uVar6) goto LAB_0030313e;
      lVar33 = (long)(int)uVar6;
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar33 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
        lVar28 = *local_1a8 * lVar32 + local_1e0;
        goto LAB_00303f1d;
      }
      lVar29 = (long)((int)uVar30 + -2);
      lVar28 = (long)iVar7;
      piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + 0xc + lVar28 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)(lVar28 + 3 + lVar29 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
      goto LAB_0030363f;
      lVar29 = (long)((int)uVar30 + -3);
      goto LAB_0030421d;
    }
    goto LAB_003001cf;
  }
  lVar33 = local_1e0 + *local_1a8 * (long)plVar12 + lVar29 * 4;
  if (cVar14 != '\0') {
    piVar36 = (int *)(lVar33 + 0xc + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_ + lVar29
                 ) == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8)
      ;
      piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * (long)plVar12);
      *piVar36 = *piVar36 + 1;
      uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                           lVar27 * 4 + *local_2f0 * (long)plVar12));
      plVar19 = local_188;
      plVar24 = local_270;
      plVar34 = local_190;
      plVar31 = local_178;
    }
    else {
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8)
      ;
    }
    goto LAB_002ffc5b;
  }
  piVar36 = (int *)(lVar33 + 0xc + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  if (*(char *)(lVar28 + 3 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_ + lVar29)
      == '\0') {
    piVar36 = (int *)((long)local_2c8 + lVar18 + *local_290 * (long)plVar12);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar18 + *local_2f0 * (long)plVar12);
    piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * (long)plVar12);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar27 * 4 + *local_2f0 * (long)plVar12);
  }
  else {
    piVar36 = (int *)(*local_1a8 * (long)plVar12 + local_1e0 + lVar29 * 4 + 8 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + 2 + *(long *)local_258._80_8_ * (long)plVar12 + local_258._24_8_ + lVar29
                 ) != '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
      plVar34 = local_190;
      goto LAB_002ffc5b;
    }
    piVar36 = (int *)((long)local_2c8 + lVar26 * 4 + *local_290 * (long)plVar12);
    *piVar36 = *piVar36 + 1;
    uVar6 = *(uint *)(local_340._24_8_ + lVar26 * 4 + *local_2f0 * (long)plVar12);
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar29 * 4 + *local_290 * (long)plVar12 + 8);
    *piVar36 = *piVar36 + 1;
    uVar8 = *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * 4 + *local_2f0 * (long)plVar12 + 8);
  }
  uVar6 = TTA::MemMerge(uVar6,uVar8);
  plVar19 = local_188;
  plVar24 = local_270;
  plVar34 = local_190;
  plVar31 = local_178;
  goto LAB_002ffc5b;
LAB_00300b67:
  plVar19 = (long *)((long)local_188 + lVar18 + 2);
  plVar31 = (long *)(ulong)(iVar7 + (int)lVar18 + 2);
LAB_002fea62:
  plVar24 = local_270;
  piVar36 = (int *)((long)local_2c8 + (long)plVar19 * 4 + *local_290 * lVar32);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + (long)plVar19 * 4 + *local_2f0 * lVar32) = 0;
  iVar7 = (int)plVar31;
  iVar9 = iVar7 + 2;
  if (iVar9 < (int)local_180) {
    lVar33 = *local_1a8;
    lVar28 = *(long *)local_258._80_8_;
    local_188 = (long *)(long)iVar7;
    local_178 = (long *)((long)local_188 + 2);
    lVar26 = (long)local_188 << 0x20;
    lVar29 = 0;
    while( true ) {
      piVar36 = (int *)(lVar33 * lVar32 + (long)local_188 * 4 + local_1e0 + 8 + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      plVar12 = local_270;
      plVar34 = local_190;
      local_160 = plVar31;
      if (*(char *)((long)local_188 + lVar29 + local_258._24_8_ + lVar28 * lVar32 + 2) != '\0') {
        plVar35 = (long *)((long)local_178 + lVar29);
        piVar36 = (int *)((lVar26 + 0x300000000 >> 0x1e) + *local_1a8 * (long)local_168 + local_1e0)
        ;
        *piVar36 = *piVar36 + 1;
        lVar28 = lVar26 + 0x300000000 >> 0x20;
        plVar19 = (long *)((long)local_188 + lVar29 + 2);
        lVar33 = lVar26 >> 0x20;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_) !=
            '\0') {
          piVar36 = (int *)(local_1e0 + *local_1a8 * (long)local_168 + (long)local_188 * 4 + 8 +
                           lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if ((*(char *)((long)local_188 +
                        lVar29 + 2 + *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_)
               == '\0') &&
             (piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) +
                               *local_1a8 * (long)local_168 + local_1e0), *piVar36 = *piVar36 + 1,
             *(char *)((lVar26 + 0x100000000 >> 0x20) +
                      *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_) != '\0')) {
            piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + (long)local_188 * 4 + 8 +
                             lVar29 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((long)local_188 +
                         lVar29 + 2 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_
                         ) == '\0') {
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)local_270);
              piVar36 = (int *)((long)local_2c8 +
                               lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                   lVar29 * 4 +
                                                   (long)local_188 * 4 +
                                                   *local_2f0 * (long)local_270 + 8));
            }
            else {
              piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)local_270);
            }
          }
          else {
            piVar36 = (int *)((long)local_2c8 +
                             lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar29 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
          }
          plVar12 = local_270;
          plVar34 = local_190;
          plVar31 = (long *)((ulong)plVar35 & 0xffffffff);
          goto LAB_00301a98;
        }
        piVar36 = (int *)(local_1e0 + *local_1a8 * lVar32 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        lVar18 = *local_1a8 * (long)local_168 + local_1e0;
        lVar37 = lVar26 >> 0x1e;
        if (*(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0') {
          piVar36 = (int *)(lVar18 + (long)local_188 * 4 + 8 + lVar29 * 4);
          *piVar36 = *piVar36 + 1;
          if (*(char *)((long)local_188 +
                       lVar29 + 2 + *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_)
              == '\0') {
            piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) +
                             *local_1a8 * (long)local_168 + local_1e0);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                         *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_) == '\0') {
              uVar6 = TTA::MemNewLabel();
              plVar12 = local_270;
              plVar34 = local_190;
            }
            else {
              piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * (long)local_270);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * (long)local_270);
            }
          }
          else {
            piVar36 = (int *)((long)local_2c8 +
                             lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ +
                             lVar29 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
          }
          goto LAB_00302806;
        }
        lVar27 = lVar26 + 0x400000000 >> 0x20;
        piVar36 = (int *)(lVar18 + (lVar26 + 0x400000000 >> 0x1e));
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar27 + *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_);
        piVar36 = (int *)(*local_1a8 * (long)local_168 + local_1e0 + (long)local_188 * 4 + 8 +
                         lVar29 * 4);
        *piVar36 = *piVar36 + 1;
        cVar14 = *(char *)((long)local_188 +
                          lVar29 + 2 +
                          *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_);
        if (cVar23 != '\0') {
          if (cVar14 == '\0') {
            piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) +
                             local_1e0 + *local_1a8 * (long)local_168);
            *piVar36 = *piVar36 + 1;
            if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                         *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_) != '\0') {
              piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + lVar28 * 4);
              *piVar36 = *piVar36 + 1;
              plVar31 = plVar35;
              if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_)
                  == '\0') {
                piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * (long)local_270);
                *piVar36 = *piVar36 + 1;
                uVar6 = *(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * (long)local_270);
                piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * (long)local_270);
                *piVar36 = *piVar36 + 1;
                uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                     lVar27 * 4 + *local_2f0 * (long)local_270));
                plVar34 = local_190;
              }
              else {
                piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + (long)local_188 * 4 + 8
                                 + lVar29 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)((long)local_188 +
                             lVar29 + 2 +
                             *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_) == '\0'
                   ) {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)local_270);
                  piVar36 = (int *)((long)local_2c8 +
                                   lVar29 * 4 +
                                   (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                       lVar29 * 4 +
                                                       (long)local_188 * 4 +
                                                       *local_2f0 * (long)local_270 + 8));
                  plVar24 = local_270;
                  plVar34 = local_190;
                }
                else {
                  piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
                  *piVar36 = *piVar36 + 1;
                  uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)local_270);
                }
              }
              goto LAB_002ffc5b;
            }
            piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * (long)local_270);
            *piVar36 = *piVar36 + 1;
            uVar6 = *(uint *)(local_340._24_8_ + lVar27 * 4 + *local_2f0 * (long)local_270);
          }
          else {
            piVar36 = (int *)(local_1e0 + *local_1a8 * (long)local_270 + lVar28 * 4);
            *piVar36 = *piVar36 + 1;
            if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_)
                == '\0') {
              piVar36 = (int *)((long)local_2c8 +
                               lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar29 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
              piVar36 = (int *)((long)local_2c8 + lVar27 * 4 + *local_290 * (long)local_270);
              *piVar36 = *piVar36 + 1;
              uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                                   lVar27 * 4 + *local_2f0 * (long)local_270));
            }
            else {
              piVar36 = (int *)((long)local_2c8 +
                               lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
              *piVar36 = *piVar36 + 1;
              uVar6 = *(uint *)(local_340._24_8_ +
                               lVar29 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
            }
          }
          plVar24 = local_270;
          plVar34 = local_190;
          plVar31 = (long *)((ulong)plVar35 & 0xffffffff);
          goto LAB_002ffc5b;
        }
        if (cVar14 != '\0') {
          plVar31 = (long *)((ulong)plVar35 & 0xffffffff);
          goto LAB_003001cf;
        }
        piVar36 = (int *)((lVar26 + 0x100000000 >> 0x1e) + *local_1a8 * (long)local_168 + local_1e0)
        ;
        *piVar36 = *piVar36 + 1;
        if (*(char *)((lVar26 + 0x100000000 >> 0x20) +
                     *(long *)local_258._80_8_ * (long)local_168 + local_258._24_8_) == '\0') {
          uVar6 = TTA::MemNewLabel();
        }
        else {
          piVar36 = (int *)((long)local_2c8 + lVar37 + *local_290 * (long)local_270);
          *piVar36 = *piVar36 + 1;
          uVar6 = *(uint *)(local_340._24_8_ + lVar37 + *local_2f0 * (long)local_270);
        }
        plVar31 = (long *)((ulong)plVar35 & 0xffffffff);
        plVar34 = local_190;
        goto LAB_002ff6e9;
      }
      piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + (long)local_188 * 4 + 0xc + lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((long)local_188 +
                   lVar29 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_ + 3) != '\0')
      break;
      piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar32 + (long)local_188 * 4 + 8
                       );
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + *local_2f0 * lVar32 + (long)local_188 * 4 + 8)
           = 0;
      lVar26 = lVar26 + 0x200000000;
      lVar37 = lVar29 + 4;
      lVar29 = lVar29 + 2;
      if ((long)local_278 <= (long)local_188 + lVar37) {
        iVar9 = iVar7 + (int)lVar29 + 2;
        plVar31 = (long *)(ulong)(uint)(iVar7 + (int)lVar29);
        goto LAB_00302ca4;
      }
    }
    plVar31 = (long *)((long)local_178 + lVar29);
    piVar36 = (int *)(*local_1a8 * (long)local_190 + local_1e0 + (long)local_188 * 4 + 0xc +
                     lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    plVar19 = (long *)((long)local_188 + lVar29 + 2);
    if (*(char *)((long)local_188 +
                 *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_ + lVar29 + 3) ==
        '\0') goto LAB_002feea4;
    goto LAB_0030086f;
  }
LAB_00302ca4:
  lVar28 = (long)iVar9;
  piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + lVar28 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_);
  if ((int)local_180 < iVar9) {
    if (cVar23 == '\0') goto LAB_00303772;
    piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) != '\0')
    goto LAB_00303711;
    lVar33 = *local_1a8;
LAB_00303e08:
    lVar29 = (long)(int)plVar31;
    piVar36 = (int *)(lVar33 * (long)plVar34 + local_1e0 + 4 + lVar29 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar29 + 1 + (long)plVar34 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0'
       ) goto LAB_00302c43;
    lVar33 = (long)((int)uVar30 + -3);
    piVar36 = (int *)((long)local_2c8 + lVar29 * 4 + *local_290 * lVar33);
    *piVar36 = *piVar36 + 1;
    uVar15 = *(undefined4 *)(local_340._24_8_ + lVar29 * 4 + lVar33 * *local_2f0);
    piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
    *piVar36 = *piVar36 + 1;
    goto LAB_0030375e;
  }
  lVar33 = (long)(int)plVar31;
  if (cVar23 == '\0') {
    piVar36 = (int *)(*local_1a8 * lVar32 + local_1e0 + 0xc + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * lVar32 + local_258._24_8_) == '\0')
    goto LAB_00303772;
    piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0xc + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_) != '\0'
       ) goto LAB_00303711;
    piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    if (*(char *)(lVar28 + (long)plVar34 * *(long *)local_258._80_8_ + local_258._24_8_) == '\0')
    goto LAB_00302c43;
  }
  else {
    piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 0xc + lVar33 * 4);
    *piVar36 = *piVar36 + 1;
    cVar23 = *(char *)(lVar33 + 3 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_);
    piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + lVar28 * 4);
    *piVar36 = *piVar36 + 1;
    cVar14 = *(char *)(lVar28 + *(long *)local_258._80_8_ * (long)plVar34 + local_258._24_8_);
    if (cVar23 != '\0') {
      if (cVar14 != '\0') goto LAB_00303711;
      piVar36 = (int *)(*local_1a8 * (long)plVar34 + local_1e0 + 4 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      iVar7 = (int)uVar30 + -3;
      if (*(char *)(lVar33 + 1 + (long)plVar34 * *(long *)local_258._80_8_ + local_258._24_8_) !=
          '\0') {
        lVar29 = (long)iVar7;
        piVar36 = (int *)(*local_1a8 * lVar29 + local_1e0 + lVar28 * 4);
        *piVar36 = *piVar36 + 1;
        cVar23 = *(char *)(lVar28 + *(long *)local_258._80_8_ * lVar29 + local_258._24_8_);
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * lVar29);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * lVar29);
        if (cVar23 == '\0') {
          piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar29);
          *piVar36 = *piVar36 + 1;
          uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ + lVar28 * 4 + lVar29 * *local_2f0)
                               );
          goto LAB_00302c4b;
        }
        piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * lVar32);
        *piVar36 = *piVar36 + 1;
        *(uint *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0) = uVar6;
        goto LAB_003037a6;
      }
      piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (long)iVar7);
      *piVar36 = *piVar36 + 1;
      lVar33 = *local_290;
      uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (long)iVar7 * *local_2f0);
      goto LAB_00304470;
    }
    if (cVar14 == '\0') {
      lVar33 = *local_1a8;
      goto LAB_00303e08;
    }
  }
  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + *local_290 * (long)plVar12);
  *piVar36 = *piVar36 + 1;
  lVar33 = *local_290;
  uVar15 = *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + (long)plVar12 * *local_2f0);
LAB_00304470:
  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + lVar33 * lVar32);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + lVar32 * *local_2f0) = uVar15;
  goto LAB_003037a6;
LAB_002feea4:
  lVar33 = lVar26 + 0x400000000 >> 0x20;
  piVar36 = (int *)((lVar26 + 0x400000000 >> 0x1e) + *local_1a8 * (long)local_190 + local_1e0);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(lVar33 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_);
  piVar36 = (int *)(*local_1a8 * (long)local_190 + local_1e0 + (long)local_188 * 4 + 8 + lVar29 * 4)
  ;
  *piVar36 = *piVar36 + 1;
  cVar14 = *(char *)((long)local_188 +
                    lVar29 + 2 + *(long *)local_258._80_8_ * (long)local_190 + local_258._24_8_);
  if (cVar23 != '\0') {
    if (cVar14 == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
      *piVar36 = *piVar36 + 1;
      uVar6 = *(uint *)(local_340._24_8_ + lVar33 * 4 + *local_2f0 * (long)local_270);
    }
    else {
      piVar36 = (int *)(*local_1a8 * (long)local_270 + local_1e0 + (long)local_188 * 4 + 0xc +
                       lVar29 * 4);
      *piVar36 = *piVar36 + 1;
      if (*(char *)((long)local_188 +
                   lVar29 + 3 + *(long *)local_258._80_8_ * (long)local_270 + local_258._24_8_) ==
          '\0') {
        piVar36 = (int *)((long)local_2c8 +
                         lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ +
                         lVar29 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
        piVar36 = (int *)((long)local_2c8 + lVar33 * 4 + *local_290 * (long)local_270);
        *piVar36 = *piVar36 + 1;
        uVar6 = TTA::MemMerge(uVar6,*(uint *)(local_340._24_8_ +
                                             lVar33 * 4 + *local_2f0 * (long)local_270));
        plVar24 = local_270;
        plVar34 = local_190;
      }
      else {
        piVar36 = (int *)((long)local_2c8 +
                         lVar29 * 4 + (long)local_188 * 4 + *local_290 * (long)local_270 + 8);
        *piVar36 = *piVar36 + 1;
        uVar6 = *(uint *)(local_340._24_8_ +
                         lVar29 * 4 + (long)local_188 * 4 + *local_2f0 * (long)local_270 + 8);
      }
    }
    goto LAB_002ffc5b;
  }
  if (cVar14 != '\0') goto LAB_003001cf;
LAB_002ff6d8:
  uVar6 = TTA::MemNewLabel();
  plVar34 = local_190;
  goto LAB_002ff6e9;
LAB_002e98ab:
  piVar36 = (int *)((long)local_2c8 + (long)(iVar7 + iVar16) * 4);
  *piVar36 = *piVar36 + 1;
  uVar15 = *(undefined4 *)(local_340._24_8_ + (long)(iVar7 + iVar16) * 4);
  piVar36 = (int *)((long)local_2c8 + lVar28 * 4 + uVar20 * 4);
  *piVar36 = *piVar36 + 1;
  *(undefined4 *)(local_340._24_8_ + lVar28 * 4 + uVar20 * 4) = uVar15;
LAB_002e991f:
  iVar9 = iVar7 + iVar16 + 2;
LAB_002e9924:
  iVar7 = iVar9 + 2;
  if ((int)local_180 <= iVar7) goto code_r0x002e9934;
  goto LAB_002e9781;
code_r0x002e9934:
  lVar32 = (long)(iVar9 + 3);
LAB_002e9ec8:
  lVar33 = (long)iVar7;
  piVar36 = (int *)(local_1e0 + lVar33 * 4);
  *piVar36 = *piVar36 + 1;
  cVar23 = *(char *)(local_258._24_8_ + lVar33);
  if ((int)local_180 < iVar7) {
joined_r0x002e9fe7:
    if (cVar23 == '\0') {
      piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
      *piVar36 = *piVar36 + 1;
      *(undefined4 *)(local_340._24_8_ + lVar33 * 4) = 0;
      uVar30 = local_268;
      goto LAB_003037a6;
    }
  }
  else {
    piVar36 = (int *)(local_1e0 + lVar32 * 4);
    *piVar36 = *piVar36 + 1;
    if (cVar23 == '\0') {
      cVar23 = *(char *)(local_258._24_8_ + lVar32);
      goto joined_r0x002e9fe7;
    }
  }
  uVar6 = TTA::MemNewLabel();
  piVar36 = (int *)((long)local_2c8 + lVar33 * 4);
  *piVar36 = *piVar36 + 1;
  *(uint *)(local_340._24_8_ + lVar33 * 4) = uVar6;
  uVar30 = local_268;
LAB_003037a6:
  uVar6 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  if (0 < (int)uVar30) {
    local_188 = local_2c8;
    local_178 = local_290;
    local_168 = (long *)local_340._24_8_;
    local_150 = local_2f0;
    local_260 = 1;
    uVar20 = 0;
    do {
      piVar25 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar4 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar2) {
        uVar13 = uVar20 | 1;
        local_278 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start;
        local_190 = local_1a8;
        local_180 = (long *)local_258._80_8_;
        local_270 = (long *)(*local_290 * local_260 + (long)local_2c8);
        lVar33 = *local_2f0 * local_260;
        lVar29 = *local_2f0 * uVar20;
        lVar28 = *local_290 * uVar20;
        lVar32 = 1;
        do {
          iVar7 = *(int *)((long)local_2c8 + lVar32 * 4 + lVar28 + -4);
          *(int *)((long)local_2c8 + lVar32 * 4 + lVar28 + -4) = iVar7 + 1;
          lVar26 = (long)*(int *)(local_340._24_8_ + lVar32 * 4 + lVar29 + -4);
          if (lVar26 < 1) {
            *(int *)((long)local_2c8 + lVar32 * 4 + lVar28 + -4) = iVar7 + 2;
            *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar29 + -4) = 0;
            if (lVar32 < lVar21) {
              piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + lVar28);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar29) = 0;
              if (uVar13 < uVar30) {
                piVar36 = (int *)((long)local_270 + lVar32 * 4 + -4);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar33 + -4) = 0;
                piVar36 = (int *)((long)local_270 + lVar32 * 4);
                *piVar36 = *piVar36 + 1;
                *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar33) = 0;
              }
            }
            else if (uVar13 < uVar30) {
LAB_00303a5f:
              piVar36 = (int *)((long)local_270 + lVar32 * 4 + -4);
              *piVar36 = *piVar36 + 1;
              *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar33 + -4) = 0;
            }
          }
          else {
            piVar25[lVar26] = piVar25[lVar26] + 1;
            uVar6 = puVar4[lVar26];
            lVar26 = *local_1a8;
            lVar27 = uVar20 * lVar26 + local_1e0;
            piVar36 = (int *)(lVar27 + -4 + lVar32 * 4);
            *piVar36 = *piVar36 + 1;
            lVar37 = *(long *)local_258._80_8_;
            lVar18 = uVar20 * lVar37 + local_258._24_8_;
            uVar8 = uVar6;
            if (*(char *)(lVar32 + -1 + lVar18) == '\0') {
              uVar8 = 0;
            }
            piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + lVar28 + -4);
            *piVar36 = *piVar36 + 1;
            *(uint *)(local_340._24_8_ + lVar32 * 4 + lVar29 + -4) = uVar8;
            uVar30 = local_268;
            if (lVar32 < lVar21) {
              piVar36 = (int *)(lVar27 + lVar32 * 4);
              *piVar36 = *piVar36 + 1;
              uVar8 = uVar6;
              if (*(char *)(lVar32 + lVar18) == '\0') {
                uVar8 = 0;
              }
              piVar36 = (int *)((long)local_2c8 + lVar32 * 4 + lVar28);
              *piVar36 = *piVar36 + 1;
              *(uint *)(local_340._24_8_ + lVar32 * 4 + lVar29) = uVar8;
              if (uVar13 < local_268) {
                lVar26 = lVar26 * local_260 + local_1e0;
                piVar36 = (int *)(lVar26 + -4 + lVar32 * 4);
                *piVar36 = *piVar36 + 1;
                lVar37 = lVar37 * local_260 + local_258._24_8_;
                uVar8 = uVar6;
                if (*(char *)(lVar32 + -1 + lVar37) == '\0') {
                  uVar8 = 0;
                }
                piVar36 = (int *)((long)local_270 + lVar32 * 4 + -4);
                *piVar36 = *piVar36 + 1;
                *(uint *)(local_340._24_8_ + lVar32 * 4 + lVar33 + -4) = uVar8;
                piVar36 = (int *)(lVar26 + lVar32 * 4);
                *piVar36 = *piVar36 + 1;
                if (*(char *)(lVar32 + lVar37) == '\0') {
                  piVar36 = (int *)((long)local_270 + lVar32 * 4);
                  *piVar36 = *piVar36 + 1;
                  *(undefined4 *)(local_340._24_8_ + lVar32 * 4 + lVar33) = 0;
                }
                else {
                  piVar36 = (int *)((long)local_270 + lVar32 * 4);
                  *piVar36 = *piVar36 + 1;
                  *(uint *)(local_340._24_8_ + lVar32 * 4 + lVar33) = uVar6;
                }
              }
            }
            else if (uVar13 < local_268) {
              piVar36 = (int *)(lVar26 * local_260 + local_1e0 + -4 + lVar32 * 4);
              *piVar36 = *piVar36 + 1;
              if (*(char *)(lVar32 + -1 + lVar37 * local_260 + local_258._24_8_) == '\0')
              goto LAB_00303a5f;
              piVar36 = (int *)((long)local_270 + lVar32 * 4 + -4);
              *piVar36 = *piVar36 + 1;
              *(uint *)(local_340._24_8_ + lVar32 * 4 + lVar33 + -4) = uVar6;
            }
          }
          lVar26 = lVar32 + 1;
          lVar32 = lVar32 + 2;
        } while (lVar26 < lVar21);
      }
      uVar20 = uVar20 + 2;
      local_260 = local_260 + 2;
    } while (uVar20 < uVar30);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar5 = local_118;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_118,local_108);
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_1f0;
  cv::sum((_InputArray *)local_108);
  *(pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_2d8;
  cv::sum((_InputArray *)local_108);
  (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)(double)local_108 >> 0x3f & (long)((double)local_108 - 9.223372036854776e+18) |
       (long)(double)local_108;
  dVar38 = TTA::MemTotalAccesses();
  (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar38 >> 0x3f & (long)(dVar38 - 9.223372036854776e+18) | (long)dVar38;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_340);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_2d8);
  cv::Mat::~Mat((Mat *)(local_340 + 8));
  cv::Mat::~Mat(local_1f0);
  cv::Mat::~Mat((Mat *)(local_258 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }